

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O2

lzham_decompress_status_t
lzham::lzham_lib_decompress
          (lzham_decompress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_bool no_more_input_bytes_flag)

{
  uint *puVar1;
  unsigned_short *puVar2;
  byte bVar3;
  ushort uVar4;
  size_t sVar5;
  byte *pbVar6;
  long lVar7;
  bool bVar8;
  char cVar9;
  lzham_decompress_status_t lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong *puVar16;
  uint64 uVar17;
  ushort *puVar18;
  long *plVar19;
  uint *puVar20;
  byte bVar21;
  uint uVar22;
  int iVar23;
  byte *pbVar24;
  decoder_tables *pdVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  void *pvVar29;
  uint *puVar30;
  undefined4 uVar31;
  lzham_decompressor *pState;
  raw_quasi_adaptive_huffman_data_model *prVar32;
  undefined4 uVar33;
  ulong uVar34;
  undefined4 uVar35;
  uint uVar36;
  uint uVar37;
  byte *pbVar38;
  undefined4 uVar39;
  long lVar40;
  size_t sVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  int iStack_ac;
  int iStack_a8;
  int iStack_a4;
  int iStack_a0;
  uint uStack_9c;
  int iStack_98;
  int iStack_94;
  undefined8 uStack_90;
  undefined8 uStack_88;
  uint uStack_80;
  uint uStack_7c;
  uint *puStack_78;
  undefined8 uStack_70;
  ulong uStack_60;
  ulong uStack_58;
  
  if (((((p == (lzham_decompress_state_ptr)0x0) || (pOut_buf_size == (size_t *)0x0)) ||
       (pIn_buf_size == (size_t *)0x0)) || (*(int *)((long)p + 0x58c) == 0)) ||
     (((pIn_buf == (lzham_uint8 *)0x0 && (*pIn_buf_size != 0)) ||
      (sVar5 = *pOut_buf_size, pOut_buf == (lzham_uint8 *)0x0 && sVar5 != 0)))) {
    return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  *(lzham_uint8 **)((long)p + 0x550) = pIn_buf;
  *(size_t **)((long)p + 0x558) = pIn_buf_size;
  *(lzham_uint8 **)((long)p + 0x560) = pOut_buf;
  *(size_t **)((long)p + 0x568) = pOut_buf_size;
  *(bool *)((long)p + 0x570) = no_more_input_bytes_flag != 0;
  if (*(int *)((long)p + 0x590) != 0) {
    if (*(lzham_uint8 **)((long)p + 0x578) == (lzham_uint8 *)0x0) {
      *(lzham_uint8 **)((long)p + 0x578) = pOut_buf;
      *(size_t *)((long)p + 0x580) = sVar5;
      lVar10 = lzham_decompressor::decompress<true>((lzham_decompressor *)p);
      return lVar10;
    }
    if (*(lzham_uint8 **)((long)p + 0x578) != pOut_buf) {
      return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
    }
    if (*(size_t *)((long)p + 0x580) != sVar5) {
      return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
    }
    puVar16 = *(ulong **)((long)p + 0x568);
    uVar27 = *puVar16;
    pbVar6 = *(byte **)((long)p + 0x560);
    iVar44 = *p;
    switch(iVar44) {
    case 0x18d:
      puVar20 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar40 = *plVar19;
      *(uint **)((long)p + 0x490) = puVar20;
      *(uint **)((long)p + 0x498) = puVar20;
      *(long *)((long)p + 0x4a8) = lVar40;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puStack_78 = puVar20;
      if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uVar33 = *(undefined4 *)((long)p + 0x4f2c);
        iStack_98 = *(undefined4 *)((long)p + 0x4f30);
        uStack_9c = *(undefined4 *)((long)p + 0x4f34);
        iStack_94 = *(undefined4 *)((long)p + 0x4f38);
        uVar39 = *(undefined4 *)((long)p + 0x4f3c);
        uVar31 = *(undefined4 *)((long)p + 0x4f44);
        uVar35 = *(undefined4 *)((long)p + 0x4f48);
        uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
        uStack_7c = *(uint *)((long)p + 0x514);
        uVar26 = *(ulong *)((long)p + 0x4c8);
        iVar42 = *(int *)((long)p + 0x4d0);
        if (lVar40 < 1) {
          uVar28 = 0;
          iVar44 = iVar42;
          goto LAB_00110b6e;
        }
        do {
          uVar28 = (ulong)(byte)*puStack_78;
          puStack_78 = (uint *)((long)puStack_78 + 1);
          iVar44 = iVar42;
LAB_00110b6e:
          while( true ) {
            iVar42 = iVar44 + 8;
            uVar26 = uVar26 | uVar28 << (0x38U - (char)iVar44 & 0x3f);
            if (7 < iVar42) {
              uVar28 = uVar26 << 8;
              uVar22 = (uint)(uVar26 >> 0x20) & 0xff000000;
              goto LAB_001110cc;
            }
            if (puStack_78 != *(uint **)((long)p + 0x4a0)) break;
            uVar28 = 0;
            iVar44 = iVar42;
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(undefined4 *)((long)p + 0x510) = *(undefined4 *)((long)p + 0x510);
              *(uint *)((long)p + 0x514) = uStack_7c;
              *(ulong *)((long)p + 0x4c8) = uVar26;
              *(int *)((long)p + 0x4d0) = iVar42;
              *(uint **)((long)p + 0x498) = puStack_78;
              *(undefined4 *)((long)p + 0x4f2c) = uVar33;
              *(int *)((long)p + 0x4f30) = iStack_98;
              *(uint *)((long)p + 0x4f34) = uStack_9c;
              *(int *)((long)p + 0x4f38) = iStack_94;
              *(undefined4 *)((long)p + 0x4f3c) = uVar39;
              *(undefined4 *)((long)p + 0x4f44) = uVar31;
              *(undefined4 *)((long)p + 0x4f48) = uVar35;
              *(uint *)((long)p + 0x4f18) = *(uint *)((long)p + 0x4f18);
              puVar20 = *(uint **)((long)p + 0x490);
              plVar19 = *(long **)((long)p + 0x558);
              puVar16 = *(ulong **)((long)p + 0x568);
              goto LAB_00112b20;
            }
          }
        } while( true );
      }
LAB_00112b20:
      *plVar19 = (long)puStack_78 - (long)puVar20;
      *puVar16 = 0;
      *(undefined4 *)p = 0x18d;
      break;
    case 0x18e:
      puVar20 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar40 = *plVar19;
      *(uint **)((long)p + 0x490) = puVar20;
      *(uint **)((long)p + 0x498) = puVar20;
      *(long *)((long)p + 0x4a8) = lVar40;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puStack_78 = puVar20;
      if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uVar33 = *(undefined4 *)((long)p + 0x4f2c);
        iStack_98 = *(undefined4 *)((long)p + 0x4f30);
        uStack_9c = *(undefined4 *)((long)p + 0x4f34);
        iStack_94 = *(undefined4 *)((long)p + 0x4f38);
        uVar39 = *(undefined4 *)((long)p + 0x4f3c);
        uVar31 = *(undefined4 *)((long)p + 0x4f44);
        uVar35 = *(undefined4 *)((long)p + 0x4f48);
        uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar22 = *(uint *)((long)p + 0x510);
        uStack_7c = *(uint *)((long)p + 0x514);
        uVar28 = *(ulong *)((long)p + 0x4c8);
        iVar44 = *(int *)((long)p + 0x4d0);
        if (0 < lVar40) goto LAB_001110b1;
        uVar26 = 0;
        goto LAB_001110b7;
      }
LAB_00112b39:
      *plVar19 = (long)puStack_78 - (long)puVar20;
      *puVar16 = 0;
      *(undefined4 *)p = 0x18e;
      break;
    case 399:
      puVar20 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar40 = *plVar19;
      *(uint **)((long)p + 0x490) = puVar20;
      *(uint **)((long)p + 0x498) = puVar20;
      *(long *)((long)p + 0x4a8) = lVar40;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puStack_78 = puVar20;
      if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uVar33 = *(undefined4 *)((long)p + 0x4f2c);
        iStack_98 = *(undefined4 *)((long)p + 0x4f30);
        uStack_9c = *(undefined4 *)((long)p + 0x4f34);
        iStack_94 = *(undefined4 *)((long)p + 0x4f38);
        uVar39 = *(undefined4 *)((long)p + 0x4f3c);
        uVar31 = *(undefined4 *)((long)p + 0x4f44);
        uVar35 = *(undefined4 *)((long)p + 0x4f48);
        uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar22 = *(uint *)((long)p + 0x510);
        uStack_7c = *(uint *)((long)p + 0x514);
        uVar26 = *(ulong *)((long)p + 0x4c8);
        iVar44 = *(int *)((long)p + 0x4d0);
        if (0 < lVar40) goto LAB_00110f0c;
        uVar28 = 0;
        goto LAB_00110f12;
      }
LAB_00112aee:
      *plVar19 = (long)puStack_78 - (long)puVar20;
      *puVar16 = 0;
      *(undefined4 *)p = 399;
      break;
    case 400:
      puStack_78 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar40 = *plVar19;
      *(uint **)((long)p + 0x490) = puStack_78;
      *(uint **)((long)p + 0x498) = puStack_78;
      *(long *)((long)p + 0x4a8) = lVar40;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)puStack_78 + lVar40);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puVar20 = puStack_78;
      if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uVar33 = *(undefined4 *)((long)p + 0x4f2c);
        iStack_98 = *(undefined4 *)((long)p + 0x4f30);
        uStack_9c = *(undefined4 *)((long)p + 0x4f34);
        iStack_94 = *(undefined4 *)((long)p + 0x4f38);
        uVar39 = *(undefined4 *)((long)p + 0x4f3c);
        uVar31 = *(undefined4 *)((long)p + 0x4f44);
        uVar35 = *(undefined4 *)((long)p + 0x4f48);
        uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar22 = *(uint *)((long)p + 0x510);
        uStack_7c = *(uint *)((long)p + 0x514);
        uVar28 = *(ulong *)((long)p + 0x4c8);
        iVar44 = *(int *)((long)p + 0x4d0);
        if (0 < lVar40) goto LAB_00113c49;
        uVar26 = 0;
        goto LAB_00113c53;
      }
LAB_00112b07:
      *plVar19 = (long)puStack_78 - (long)puVar20;
      *puVar16 = 0;
      *(undefined4 *)p = 400;
      break;
    default:
      switch(iVar44) {
      case 0x337:
        puStack_78 = *(uint **)((long)p + 0x550);
        lVar40 = **(long **)((long)p + 0x558);
        *(uint **)((long)p + 0x490) = puStack_78;
        *(uint **)((long)p + 0x498) = puStack_78;
        *(long *)((long)p + 0x4a8) = lVar40;
        *(byte **)((long)p + 0x4a0) = (byte *)(lVar40 + (long)puStack_78);
        *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
        pvVar29 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
        *(void **)((long)p + 0x4f50) = pvVar29;
        uVar27 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
        *(ulong *)((long)p + 0x4f58) = uVar27;
        if (uVar27 != 0) {
          uVar26 = *puVar16;
          if (uVar27 < *puVar16) {
            uVar26 = uVar27;
          }
          *(ulong *)((long)p + 0x4f60) = uVar26;
          if (*(int *)((long)p + 0x594) == 0) {
            memcpy(pbVar6,pvVar29,uVar26);
          }
          else {
            for (uVar27 = 0; sVar41 = uVar26 - uVar27, uVar27 <= uVar26 && sVar41 != 0;
                uVar27 = uVar27 + sVar41) {
              if (0x1fff < sVar41) {
                sVar41 = 0x2000;
              }
              memcpy((void *)(*(long *)((long)p + 0x560) + uVar27),
                     (void *)(*(long *)((long)p + 0x4f50) + uVar27),sVar41);
              uVar12 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar27),sVar41,
                               *(uint *)((long)p + 0x548));
              *(uint *)((long)p + 0x548) = uVar12;
              uVar26 = *(ulong *)((long)p + 0x4f60);
            }
          }
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
          *(undefined4 *)p = 0x337;
          return LZHAM_DECOMP_STATUS_NOT_FINISHED;
        }
        iVar42 = *(int *)((long)p + 0x4f2c);
        iStack_98 = *(int *)((long)p + 0x4f30);
        uStack_9c = *(int *)((long)p + 0x4f34);
        iStack_94 = *(int *)((long)p + 0x4f38);
        uVar11 = *(uint *)((long)p + 0x4f3c);
        uVar37 = *(uint *)((long)p + 0x4f44);
        uStack_80 = *(undefined4 *)((long)p + 0x4f48);
        uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar22 = *(uint *)((long)p + 0x510);
        uStack_7c = *(uint *)((long)p + 0x514);
        uVar26 = *(ulong *)((long)p + 0x4c8);
        uVar43 = *(uint *)((long)p + 0x4d0);
        iVar44 = *(int *)((long)p + 0x598);
        goto LAB_00113fcf;
      case 0x338:
      case 0x339:
      case 0x33a:
      case 0x33b:
      case 0x33c:
      case 0x33e:
        goto switchD_001109bd_caseD_338;
      case 0x33d:
        puStack_78 = *(uint **)((long)p + 0x550);
        plVar19 = *(long **)((long)p + 0x558);
        lVar40 = *plVar19;
        *(uint **)((long)p + 0x490) = puStack_78;
        *(uint **)((long)p + 0x498) = puStack_78;
        *(long *)((long)p + 0x4a8) = lVar40;
        *(byte **)((long)p + 0x4a0) = (byte *)((long)puStack_78 + lVar40);
        *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
        puVar20 = puStack_78;
        if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
          iVar42 = *(int *)((long)p + 0x4f2c);
          iStack_98 = *(int *)((long)p + 0x4f30);
          uStack_9c = *(int *)((long)p + 0x4f34);
          iStack_94 = *(int *)((long)p + 0x4f38);
          uVar11 = *(uint *)((long)p + 0x4f3c);
          uVar37 = *(uint *)((long)p + 0x4f44);
          uStack_80 = *(undefined4 *)((long)p + 0x4f48);
          uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar22 = *(uint *)((long)p + 0x510);
          uStack_7c = *(uint *)((long)p + 0x514);
          uVar26 = *(ulong *)((long)p + 0x4c8);
          uVar43 = *(uint *)((long)p + 0x4d0);
          if (0 < lVar40) goto LAB_00110c63;
          uVar27 = 0;
          goto LAB_00110c6d;
        }
LAB_00112a16:
        *plVar19 = (long)puStack_78 - (long)puVar20;
        *puVar16 = 0;
        *(undefined4 *)p = 0x33d;
        break;
      case 0x33f:
        puStack_78 = *(uint **)((long)p + 0x550);
        plVar19 = *(long **)((long)p + 0x558);
        lVar40 = *plVar19;
        *(uint **)((long)p + 0x490) = puStack_78;
        *(uint **)((long)p + 0x498) = puStack_78;
        *(long *)((long)p + 0x4a8) = lVar40;
        *(byte **)((long)p + 0x4a0) = (byte *)((long)puStack_78 + lVar40);
        *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
        puVar20 = puStack_78;
        if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
          iVar42 = *(int *)((long)p + 0x4f2c);
          iStack_98 = *(int *)((long)p + 0x4f30);
          uStack_9c = *(int *)((long)p + 0x4f34);
          iStack_94 = *(int *)((long)p + 0x4f38);
          uVar11 = *(uint *)((long)p + 0x4f3c);
          uVar37 = *(uint *)((long)p + 0x4f44);
          uStack_80 = *(undefined4 *)((long)p + 0x4f48);
          uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar22 = *(uint *)((long)p + 0x510);
          uStack_7c = *(uint *)((long)p + 0x514);
          uVar26 = *(ulong *)((long)p + 0x4c8);
          uVar43 = *(uint *)((long)p + 0x4d0);
          if (0 < lVar40) goto LAB_00110d46;
          uVar27 = 0;
          goto LAB_00110d50;
        }
LAB_00112a2f:
        *plVar19 = (long)puStack_78 - (long)puVar20;
        *puVar16 = 0;
        *(undefined4 *)p = 0x33f;
        break;
      case 0x340:
        puStack_78 = *(uint **)((long)p + 0x550);
        plVar19 = *(long **)((long)p + 0x558);
        lVar40 = *plVar19;
        *(uint **)((long)p + 0x490) = puStack_78;
        *(uint **)((long)p + 0x498) = puStack_78;
        *(long *)((long)p + 0x4a8) = lVar40;
        *(byte **)((long)p + 0x4a0) = (byte *)((long)puStack_78 + lVar40);
        *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
        puVar20 = puStack_78;
        if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
          iVar42 = *(int *)((long)p + 0x4f2c);
          iStack_98 = *(int *)((long)p + 0x4f30);
          uStack_9c = *(int *)((long)p + 0x4f34);
          iStack_94 = *(int *)((long)p + 0x4f38);
          uVar11 = *(uint *)((long)p + 0x4f3c);
          uVar37 = *(uint *)((long)p + 0x4f44);
          uStack_80 = *(undefined4 *)((long)p + 0x4f48);
          uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar22 = *(uint *)((long)p + 0x510);
          uStack_7c = *(uint *)((long)p + 0x514);
          uVar27 = *(ulong *)((long)p + 0x4c8);
          iVar44 = *(int *)((long)p + 0x4d0);
          if (0 < lVar40) goto LAB_00110e29;
          uVar26 = 0;
          goto LAB_00110e33;
        }
LAB_00112ad5:
        *plVar19 = (long)puStack_78 - (long)puVar20;
        *puVar16 = 0;
        *(undefined4 *)p = 0x340;
        break;
      default:
        if (iVar44 != 0x35c) {
          if (iVar44 == 0xff) {
            puStack_78 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar40 = *plVar19;
            *(uint **)((long)p + 0x490) = puStack_78;
            *(uint **)((long)p + 0x498) = puStack_78;
            *(long *)((long)p + 0x4a8) = lVar40;
            *(byte **)((long)p + 0x4a0) = (byte *)((long)puStack_78 + lVar40);
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            puVar20 = puStack_78;
            if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
              iVar42 = *(int *)((long)p + 0x4f2c);
              iStack_98 = *(int *)((long)p + 0x4f30);
              uStack_9c = *(int *)((long)p + 0x4f34);
              iStack_94 = *(int *)((long)p + 0x4f38);
              uVar11 = *(uint *)((long)p + 0x4f3c);
              uVar37 = *(uint *)((long)p + 0x4f44);
              uStack_80 = *(undefined4 *)((long)p + 0x4f48);
              uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar22 = *(uint *)((long)p + 0x510);
              uStack_7c = *(uint *)((long)p + 0x514);
              uVar26 = *(ulong *)((long)p + 0x4c8);
              iVar44 = *(int *)((long)p + 0x4d0);
              if (0 < lVar40) goto LAB_00112023;
              uVar27 = 0;
              goto LAB_0011202e;
            }
LAB_00112d53:
            *plVar19 = (long)puStack_78 - (long)puVar20;
            *puVar16 = 0;
            *(undefined4 *)p = 0xff;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar44 == 0x11a) {
            puVar20 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar40 = *plVar19;
            *(uint **)((long)p + 0x490) = puVar20;
            *(uint **)((long)p + 0x498) = puVar20;
            *(long *)((long)p + 0x4a8) = lVar40;
            *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            puStack_78 = puVar20;
            if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
              iVar42 = *(int *)((long)p + 0x4f2c);
              iStack_98 = *(int *)((long)p + 0x4f30);
              uStack_9c = *(int *)((long)p + 0x4f34);
              iStack_94 = *(int *)((long)p + 0x4f38);
              uVar11 = *(uint *)((long)p + 0x4f3c);
              uVar37 = *(uint *)((long)p + 0x4f44);
              uStack_80 = *(undefined4 *)((long)p + 0x4f48);
              uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar22 = *(uint *)((long)p + 0x510);
              uStack_7c = *(uint *)((long)p + 0x514);
              uVar26 = *(ulong *)((long)p + 0x4c8);
              uVar43 = *(uint *)((long)p + 0x4d0);
              if (0 < lVar40) goto LAB_00112469;
              uVar27 = 0;
              goto LAB_00112473;
            }
LAB_00112da6:
            *plVar19 = (long)puStack_78 - (long)puVar20;
            *puVar16 = 0;
            *(undefined4 *)p = 0x11a;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar44 == 0x126) {
            puVar20 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar40 = *plVar19;
            *(uint **)((long)p + 0x490) = puVar20;
            *(uint **)((long)p + 0x498) = puVar20;
            *(long *)((long)p + 0x4a8) = lVar40;
            *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            puStack_78 = puVar20;
            if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) != 1) {
LAB_00112efa:
              *plVar19 = (long)puStack_78 - (long)puVar20;
              *puVar16 = 0;
              *(undefined4 *)p = 0x126;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            iVar42 = *(int *)((long)p + 0x4f2c);
            iStack_98 = *(int *)((long)p + 0x4f30);
            uStack_9c = *(int *)((long)p + 0x4f34);
            iStack_94 = *(int *)((long)p + 0x4f38);
            uVar11 = *(uint *)((long)p + 0x4f3c);
            uVar37 = *(uint *)((long)p + 0x4f44);
            uStack_80 = *(undefined4 *)((long)p + 0x4f48);
            uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar33 = *(undefined4 *)((long)p + 0x510);
            uVar39 = *(undefined4 *)((long)p + 0x514);
            uVar26 = *(ulong *)((long)p + 0x4c8);
            uVar22 = *(uint *)((long)p + 0x4d0);
            if (lVar40 < 1) {
              uVar28 = 0;
              uVar43 = uVar22;
              goto LAB_001128af;
            }
            do {
              uVar28 = (ulong)(byte)*puStack_78;
              puStack_78 = (uint *)((long)puStack_78 + 1);
              uVar43 = uVar22;
LAB_001128af:
              while( true ) {
                uVar22 = uVar43 + 8;
                uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar43 & 0x3f);
                if (0x17 < (int)uVar22) {
                  uVar28 = uVar26 << 0x18;
                  uVar43 = uVar43 - 0x10;
                  uVar14 = (uint)(uVar26 >> 0x28) + 1;
                  if ((uVar22 & 7) != 0) goto LAB_001128f7;
                  goto LAB_00113e9d;
                }
                if (puStack_78 != *(uint **)((long)p + 0x4a0)) break;
                uVar28 = 0;
                uVar43 = uVar22;
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(undefined4 *)((long)p + 0x510) = uVar33;
                  *(undefined4 *)((long)p + 0x514) = uVar39;
                  *(ulong *)((long)p + 0x4c8) = uVar26;
                  *(uint *)((long)p + 0x4d0) = uVar22;
                  *(uint **)((long)p + 0x498) = puStack_78;
                  *(undefined4 *)((long)p + 0x4f90) = *(undefined4 *)((long)p + 0x4f90);
                  *(int *)((long)p + 0x4f2c) = iVar42;
                  *(int *)((long)p + 0x4f30) = iStack_98;
                  *(uint *)((long)p + 0x4f34) = uStack_9c;
                  *(int *)((long)p + 0x4f38) = iStack_94;
                  *(uint *)((long)p + 0x4f3c) = uVar11;
                  *(uint *)((long)p + 0x4f44) = uVar37;
                  *(uint *)((long)p + 0x4f48) = uStack_80;
                  *(uint *)((long)p + 0x4f18) = *(uint *)((long)p + 0x4f18);
                  puVar20 = *(uint **)((long)p + 0x490);
                  plVar19 = *(long **)((long)p + 0x558);
                  puVar16 = *(ulong **)((long)p + 0x568);
                  goto LAB_00112efa;
                }
              }
            } while( true );
          }
          if (iVar44 == 0x129) {
            puVar20 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar40 = *plVar19;
            *(uint **)((long)p + 0x490) = puVar20;
            *(uint **)((long)p + 0x498) = puVar20;
            *(long *)((long)p + 0x4a8) = lVar40;
            *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            puStack_78 = puVar20;
            if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) != 1) {
LAB_00112ee1:
              *plVar19 = (long)puStack_78 - (long)puVar20;
              *puVar16 = 0;
              *(undefined4 *)p = 0x129;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            uVar14 = *(uint *)((long)p + 0x4f90);
            iVar42 = *(int *)((long)p + 0x4f2c);
            iStack_98 = *(int *)((long)p + 0x4f30);
            uStack_9c = *(int *)((long)p + 0x4f34);
            iStack_94 = *(int *)((long)p + 0x4f38);
            uVar11 = *(uint *)((long)p + 0x4f3c);
            uVar37 = *(uint *)((long)p + 0x4f44);
            uStack_80 = *(undefined4 *)((long)p + 0x4f48);
            uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar33 = *(undefined4 *)((long)p + 0x510);
            uVar39 = *(undefined4 *)((long)p + 0x514);
            uVar28 = *(ulong *)((long)p + 0x4c8);
            uVar43 = *(uint *)((long)p + 0x4d0);
            if (lVar40 < 1) {
              uVar26 = 0;
              goto LAB_001127cd;
            }
            do {
              uVar26 = (ulong)(byte)*puStack_78;
              puStack_78 = (uint *)((long)puStack_78 + 1);
LAB_001127cd:
              while( true ) {
                cVar9 = (char)uVar43;
                uVar43 = uVar43 + 8;
                uVar28 = uVar28 | uVar26 << (0x38U - cVar9 & 0x3f);
LAB_001128f7:
                if (-1 < (int)uVar43) {
                  bVar21 = (byte)uVar43;
                  uVar43 = uVar43 & 0x7ffffff8;
                  uVar28 = uVar28 << (bVar21 & 7);
                  goto LAB_00113e9d;
                }
                if (puStack_78 != *(uint **)((long)p + 0x4a0)) break;
                uVar26 = 0;
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(undefined4 *)((long)p + 0x510) = uVar33;
                  *(undefined4 *)((long)p + 0x514) = uVar39;
                  *(ulong *)((long)p + 0x4c8) = uVar28;
                  *(uint *)((long)p + 0x4d0) = uVar43;
                  *(uint **)((long)p + 0x498) = puStack_78;
                  *(uint *)((long)p + 0x4f90) = uVar14;
                  *(int *)((long)p + 0x4f2c) = iVar42;
                  *(int *)((long)p + 0x4f30) = iStack_98;
                  *(uint *)((long)p + 0x4f34) = uStack_9c;
                  *(int *)((long)p + 0x4f38) = iStack_94;
                  *(uint *)((long)p + 0x4f3c) = uVar11;
                  *(uint *)((long)p + 0x4f44) = uVar37;
                  *(uint *)((long)p + 0x4f48) = uStack_80;
                  *(int *)((long)p + 0x4f18) = (int)uStack_58;
                  puVar20 = *(uint **)((long)p + 0x490);
                  plVar19 = *(long **)((long)p + 0x558);
                  puVar16 = *(ulong **)((long)p + 0x568);
                  goto LAB_00112ee1;
                }
              }
            } while( true );
          }
          if (iVar44 == 0x137) {
LAB_00113f53:
            *(undefined4 *)p = 0x137;
            return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
          }
          if (iVar44 == 0x13f) {
            puStack_78 = *(uint **)((long)p + 0x550);
            lVar40 = **(long **)((long)p + 0x558);
            *(uint **)((long)p + 0x490) = puStack_78;
            *(uint **)((long)p + 0x498) = puStack_78;
            *(long *)((long)p + 0x4a8) = lVar40;
            *(byte **)((long)p + 0x4a0) = (byte *)(lVar40 + (long)puStack_78);
            *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
            pvVar29 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
            *(void **)((long)p + 0x4f50) = pvVar29;
            uVar26 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
            *(ulong *)((long)p + 0x4f58) = uVar26;
            if (uVar26 != 0) {
              uVar27 = *puVar16;
              if (uVar26 < *puVar16) {
                uVar27 = uVar26;
              }
              *(ulong *)((long)p + 0x4f60) = uVar27;
              if (*(int *)((long)p + 0x594) == 0) {
                memcpy(pbVar6,pvVar29,uVar27);
              }
              else {
                for (uVar26 = 0; sVar41 = uVar27 - uVar26, uVar26 <= uVar27 && sVar41 != 0;
                    uVar26 = uVar26 + sVar41) {
                  if (0x1fff < sVar41) {
                    sVar41 = 0x2000;
                  }
                  memcpy((void *)(*(long *)((long)p + 0x560) + uVar26),
                         (void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41);
                  uVar12 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41,
                                   *(uint *)((long)p + 0x548));
                  *(uint *)((long)p + 0x548) = uVar12;
                  uVar27 = *(ulong *)((long)p + 0x4f60);
                }
              }
              **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490)
              ;
              **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
              *(undefined4 *)p = 0x13f;
              return LZHAM_DECOMP_STATUS_NOT_FINISHED;
            }
            uVar14 = *(uint *)((long)p + 0x4f90);
            iVar42 = *(int *)((long)p + 0x4f2c);
            iStack_98 = *(int *)((long)p + 0x4f30);
            uStack_9c = *(int *)((long)p + 0x4f34);
            iStack_94 = *(int *)((long)p + 0x4f38);
            uVar11 = *(uint *)((long)p + 0x4f3c);
            uVar37 = *(uint *)((long)p + 0x4f44);
            uStack_80 = *(undefined4 *)((long)p + 0x4f48);
            uVar33 = *(undefined4 *)((long)p + 0x510);
            uVar39 = *(undefined4 *)((long)p + 0x514);
            uVar26 = *(ulong *)((long)p + 0x4c8);
            uVar43 = *(uint *)((long)p + 0x4d0);
            uVar34 = 0;
            while (uVar14 = uVar14 - 1, uVar28 = uVar26, uStack_58 = uVar34, uVar14 != 0) {
LAB_00113e9d:
              if ((int)uVar43 < 8) goto LAB_00113ee9;
              uVar26 = uVar28 << 8;
              uVar43 = uVar43 - 8;
              if (uVar27 <= uStack_58) {
                *(undefined4 *)((long)p + 0x510) = uVar33;
                *(undefined4 *)((long)p + 0x514) = uVar39;
                *(ulong *)((long)p + 0x4c8) = uVar26;
                *(uint *)((long)p + 0x4d0) = uVar43;
                *(uint **)((long)p + 0x498) = puStack_78;
                **(long **)((long)p + 0x558) = (long)puStack_78 - *(long *)((long)p + 0x490);
                **(undefined8 **)((long)p + 0x568) = 0;
                goto LAB_00113f53;
              }
              uVar34 = (ulong)((int)uStack_58 + 1);
              pbVar6[uStack_58] = (byte)(uVar28 >> 0x38);
            }
            uVar14 = 0;
LAB_00113ee9:
            *(undefined4 *)((long)p + 0x510) = uVar33;
            *(undefined4 *)((long)p + 0x514) = uVar39;
            *(ulong *)((long)p + 0x4c8) = uVar28;
            *(uint *)((long)p + 0x4d0) = uVar43;
            *(uint **)((long)p + 0x498) = puStack_78;
          }
          else {
            if (iVar44 == 0x156) {
LAB_00113dc5:
              *(undefined4 *)p = 0x156;
              return LZHAM_DECOMP_STATUS_FAILED;
            }
            if (iVar44 == 0x15a) {
              uVar14 = *(uint *)((long)p + 0x4f90);
              iVar42 = *(int *)((long)p + 0x4f2c);
              iStack_98 = *(int *)((long)p + 0x4f30);
              uStack_9c = *(int *)((long)p + 0x4f34);
              iStack_94 = *(int *)((long)p + 0x4f38);
              uVar11 = *(uint *)((long)p + 0x4f3c);
              uVar37 = *(uint *)((long)p + 0x4f44);
              uStack_80 = *(undefined4 *)((long)p + 0x4f48);
              uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
              lVar40 = *(long *)((long)p + 0x550);
              puVar16 = *(ulong **)((long)p + 0x558);
              uVar26 = *puVar16;
              *(long *)((long)p + 0x490) = lVar40;
              *(long *)((long)p + 0x498) = lVar40;
              *(ulong *)((long)p + 0x4a8) = uVar26;
              *(ulong *)((long)p + 0x4a0) = lVar40 + uVar26;
              *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
              uVar28 = 0;
              goto LAB_00113d10;
            }
            if (iVar44 == 0x16c) {
LAB_00113de1:
              *(undefined4 *)p = 0x16c;
              return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
            }
            if (iVar44 != 0x17c) {
              if (iVar44 == 0x1c9) {
                puStack_78 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puStack_78;
                *(uint **)((long)p + 0x498) = puStack_78;
                *(long *)((long)p + 0x4a8) = lVar40;
                *(byte **)((long)p + 0x4a0) = (byte *)((long)puStack_78 + lVar40);
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puVar20 = puStack_78;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uVar37 = *(uint *)((long)p + 0x4f44);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar14 = *(uint *)((long)p + 0x510);
                  uStack_7c = *(uint *)((long)p + 0x514);
                  uVar28 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  if (0 < lVar40) goto LAB_00112360;
                  goto LAB_00113b12;
                }
LAB_00112d8d:
                *plVar19 = (long)puStack_78 - (long)puVar20;
                *puVar16 = 0;
                *(undefined4 *)p = 0x1c9;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x1dd) {
LAB_00114769:
                *(undefined4 *)p = 0x1dd;
                return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
              }
              if (iVar44 == 0x1e6) {
                puStack_78 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puStack_78;
                *(uint **)((long)p + 0x498) = puStack_78;
                *(long *)((long)p + 0x4a8) = lVar40;
                puVar20 = (uint *)((long)puStack_78 + lVar40);
                *(uint **)((long)p + 0x4a0) = puVar20;
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puVar30 = puStack_78;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f44);
                  uVar22 = *(uint *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar14 = *(uint *)((long)p + 0x510);
                  uVar36 = *(uint *)((long)p + 0x514);
                  uVar26 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                  pdVar25 = prVar32->m_pDecode_tables;
                  goto LAB_0011492c;
                }
LAB_00114a49:
                *plVar19 = (long)puStack_78 - (long)puVar30;
                *puVar16 = 0;
                *(undefined4 *)p = 0x1e6;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x206) {
                puStack_78 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puStack_78;
                *(uint **)((long)p + 0x498) = puStack_78;
                *(long *)((long)p + 0x4a8) = lVar40;
                puVar20 = (uint *)((long)puStack_78 + lVar40);
                *(uint **)((long)p + 0x4a0) = puVar20;
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puVar30 = puStack_78;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  uVar22 = *(uint *)((long)p + 0x4f6c);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f44);
                  uVar13 = *(uint *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar14 = *(uint *)((long)p + 0x510);
                  uVar36 = *(uint *)((long)p + 0x514);
                  uVar26 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                  pdVar25 = prVar32->m_pDecode_tables;
                  goto LAB_00114b09;
                }
LAB_00114c55:
                *plVar19 = (long)puStack_78 - (long)puVar30;
                *puVar16 = 0;
                *(undefined4 *)p = 0x206;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x21c) {
                puStack_78 = *(uint **)((long)p + 0x550);
                lVar40 = **(long **)((long)p + 0x558);
                *(uint **)((long)p + 0x490) = puStack_78;
                *(uint **)((long)p + 0x498) = puStack_78;
                *(long *)((long)p + 0x4a8) = lVar40;
                *(byte **)((long)p + 0x4a0) = (byte *)(lVar40 + (long)puStack_78);
                *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
                pvVar29 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
                *(void **)((long)p + 0x4f50) = pvVar29;
                uVar26 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
                *(ulong *)((long)p + 0x4f58) = uVar26;
                if (uVar26 != 0) {
                  uVar27 = *puVar16;
                  if (uVar26 < *puVar16) {
                    uVar27 = uVar26;
                  }
                  *(ulong *)((long)p + 0x4f60) = uVar27;
                  if (*(int *)((long)p + 0x594) == 0) {
                    memcpy(pbVar6,pvVar29,uVar27);
                  }
                  else {
                    for (uVar26 = 0; sVar41 = uVar27 - uVar26, uVar26 <= uVar27 && sVar41 != 0;
                        uVar26 = uVar26 + sVar41) {
                      if (0x1fff < sVar41) {
                        sVar41 = 0x2000;
                      }
                      memcpy((void *)(*(long *)((long)p + 0x560) + uVar26),
                             (void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41);
                      uVar12 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41,
                                       *(uint *)((long)p + 0x548));
                      *(uint *)((long)p + 0x548) = uVar12;
                      uVar27 = *(ulong *)((long)p + 0x4f60);
                    }
                  }
                  **(long **)((long)p + 0x558) =
                       *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
                  **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
                  *(undefined4 *)p = 0x21c;
                  return LZHAM_DECOMP_STATUS_NOT_FINISHED;
                }
                iVar42 = *(int *)((long)p + 0x4f2c);
                iStack_98 = *(int *)((long)p + 0x4f30);
                uStack_9c = *(int *)((long)p + 0x4f34);
                iStack_94 = *(int *)((long)p + 0x4f38);
                uVar11 = *(uint *)((long)p + 0x4f3c);
                uVar37 = *(uint *)((long)p + 0x4f44);
                uStack_88._4_4_ = *(uint *)((long)p + 0x4f48);
                uVar14 = *(uint *)((long)p + 0x510);
                uStack_7c = *(uint *)((long)p + 0x514);
                uVar26 = *(ulong *)((long)p + 0x4c8);
                uVar43 = *(uint *)((long)p + 0x4d0);
                uStack_58 = 0;
                goto LAB_00114439;
              }
              if (iVar44 == 0x22b) {
                puVar20 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puVar20;
                *(uint **)((long)p + 0x498) = puVar20;
                *(long *)((long)p + 0x4a8) = lVar40;
                *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puStack_78 = puVar20;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  uStack_88._0_4_ = *(uint *)((long)p + 0x4f70);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uVar37 = *(uint *)((long)p + 0x4f44);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar22 = *(uint *)((long)p + 0x510);
                  uVar36 = *(uint *)((long)p + 0x514);
                  uVar28 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  if (0 < lVar40) goto LAB_0011152e;
                  uVar26 = 0;
                  goto LAB_00111534;
                }
LAB_00112bf7:
                *plVar19 = (long)puStack_78 - (long)puVar20;
                *puVar16 = 0;
                *(undefined4 *)p = 0x22b;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x22e) {
                puVar20 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puVar20;
                *(uint **)((long)p + 0x498) = puVar20;
                *(long *)((long)p + 0x4a8) = lVar40;
                *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                uStack_70 = puVar20;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  uStack_88._0_4_ = *(uint *)((long)p + 0x4f70);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f44);
                  uVar14 = *(uint *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar13 = *(uint *)((long)p + 0x510);
                  uVar36 = *(uint *)((long)p + 0x514);
                  uVar28 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  if (0 < lVar40) goto LAB_00112254;
                  uVar26 = 0;
                  goto LAB_0011225a;
                }
LAB_00112d74:
                *plVar19 = (long)uStack_70 - (long)puVar20;
                *puVar16 = 0;
                *(undefined4 *)p = 0x22e;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x231) {
                uStack_70 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = uStack_70;
                *(uint **)((long)p + 0x498) = uStack_70;
                *(long *)((long)p + 0x4a8) = lVar40;
                *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_70 + lVar40);
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puVar20 = uStack_70;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  uStack_88._0_4_ = *(uint *)((long)p + 0x4f70);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f44);
                  uVar14 = *(uint *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar37 = *(uint *)((long)p + 0x510);
                  uVar36 = *(uint *)((long)p + 0x514);
                  uVar28 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  if (0 < lVar40) goto LAB_00111843;
                  uVar26 = 0;
                  goto LAB_00111849;
                }
LAB_00112c31:
                *plVar19 = (long)uStack_70 - (long)puVar20;
                *puVar16 = 0;
                *(undefined4 *)p = 0x231;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x238) {
                uStack_70 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = uStack_70;
                *(uint **)((long)p + 0x498) = uStack_70;
                *(long *)((long)p + 0x4a8) = lVar40;
                puVar20 = (uint *)((long)uStack_70 + lVar40);
                *(uint **)((long)p + 0x4a0) = puVar20;
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puVar30 = uStack_70;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  uStack_88._0_4_ = *(uint *)((long)p + 0x4f70);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f44);
                  uVar14 = *(uint *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar37 = *(uint *)((long)p + 0x510);
                  uStack_7c = *(uint *)((long)p + 0x514);
                  uVar26 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                  pdVar25 = prVar32->m_pDecode_tables;
                  goto LAB_00114d0e;
                }
LAB_00114e58:
                *plVar19 = (long)uStack_70 - (long)puVar30;
                *puVar16 = 0;
                *(undefined4 *)p = 0x238;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x240) {
                uStack_70 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = uStack_70;
                *(uint **)((long)p + 0x498) = uStack_70;
                *(long *)((long)p + 0x4a8) = lVar40;
                puVar20 = (uint *)((long)uStack_70 + lVar40);
                *(uint **)((long)p + 0x4a0) = puVar20;
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puVar30 = uStack_70;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  uStack_88._0_4_ = *(uint *)((long)p + 0x4f70);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f44);
                  uVar14 = *(uint *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar13 = *(uint *)((long)p + 0x510);
                  uStack_7c = *(uint *)((long)p + 0x514);
                  uVar26 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                  pdVar25 = prVar32->m_pDecode_tables;
                  goto LAB_00114f06;
                }
LAB_0011514a:
                *plVar19 = (long)uStack_70 - (long)puVar30;
                *puVar16 = 0;
                *(undefined4 *)p = 0x240;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x243) {
                puVar20 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puVar20;
                *(uint **)((long)p + 0x498) = puVar20;
                *(long *)((long)p + 0x4a8) = lVar40;
                *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                uStack_70 = puVar20;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  uStack_88._0_4_ = *(uint *)((long)p + 0x4f70);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f44);
                  uVar14 = *(uint *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar13 = *(uint *)((long)p + 0x510);
                  uStack_7c = *(uint *)((long)p + 0x514);
                  uVar28 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  if (0 < lVar40) goto LAB_00111e7f;
                  uVar26 = 0;
                  goto LAB_00111e85;
                }
LAB_00112d3a:
                *plVar19 = (long)uStack_70 - (long)puVar20;
                *puVar16 = 0;
                *(undefined4 *)p = 0x243;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x24c) {
                puStack_78 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puStack_78;
                *(uint **)((long)p + 0x498) = puStack_78;
                *(long *)((long)p + 0x4a8) = lVar40;
                *(byte **)((long)p + 0x4a0) = (byte *)((long)puStack_78 + lVar40);
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puVar20 = puStack_78;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  uStack_88._0_4_ = *(uint *)((long)p + 0x4f70);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f44);
                  uVar14 = *(uint *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar13 = *(uint *)((long)p + 0x510);
                  uVar37 = *(uint *)((long)p + 0x514);
                  uVar28 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  if (0 < lVar40) goto LAB_0011172f;
                  uVar26 = 0;
                  goto LAB_00111736;
                }
LAB_00112c18:
                *plVar19 = (long)puStack_78 - (long)puVar20;
                *puVar16 = 0;
                *(undefined4 *)p = 0x24c;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x266) {
                puVar30 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puVar30;
                *(uint **)((long)p + 0x498) = puVar30;
                *(long *)((long)p + 0x4a8) = lVar40;
                puVar20 = (uint *)((long)puVar30 + lVar40);
                *(uint **)((long)p + 0x4a0) = puVar20;
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puStack_78 = puVar30;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  uStack_88._0_4_ = *(uint *)((long)p + 0x4f70);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uVar37 = *(uint *)((long)p + 0x4f44);
                  uStack_80 = *(uint *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar22 = *(uint *)((long)p + 0x510);
                  uStack_7c = *(uint *)((long)p + 0x514);
                  uVar26 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                  pdVar25 = prVar32->m_pDecode_tables;
                  goto LAB_00115220;
                }
LAB_0011537e:
                *plVar19 = (long)puStack_78 - (long)puVar30;
                *puVar16 = 0;
                *(undefined4 *)p = 0x266;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x285) {
                puVar30 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puVar30;
                *(uint **)((long)p + 0x498) = puVar30;
                *(long *)((long)p + 0x4a8) = lVar40;
                puVar20 = (uint *)((long)puVar30 + lVar40);
                *(uint **)((long)p + 0x4a0) = puVar20;
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puStack_78 = puVar30;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  iVar44 = *(int *)((long)p + 0x4f70);
                  uVar14 = *(uint *)((long)p + 0x4f74);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f44);
                  uStack_80 = *(undefined4 *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar22 = *(uint *)((long)p + 0x510);
                  uStack_7c = *(uint *)((long)p + 0x514);
                  uVar26 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                  pdVar25 = prVar32->m_pDecode_tables;
                  goto LAB_001154db;
                }
LAB_00115772:
                *plVar19 = (long)puStack_78 - (long)puVar30;
                *puVar16 = 0;
                *(undefined4 *)p = 0x285;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x295) {
                puVar20 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puVar20;
                *(uint **)((long)p + 0x498) = puVar20;
                *(long *)((long)p + 0x4a8) = lVar40;
                *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puStack_78 = puVar20;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  uStack_88._0_4_ = *(uint *)((long)p + 0x4f70);
                  uVar14 = *(uint *)((long)p + 0x4f74);
                  uVar37 = *(uint *)((long)p + 0x4f7c);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f44);
                  uStack_80 = *(undefined4 *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar22 = *(uint *)((long)p + 0x510);
                  uStack_7c = *(uint *)((long)p + 0x514);
                  uVar26 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  if (0 < lVar40) goto LAB_00111c82;
                  uVar28 = 0;
                  goto LAB_00111c88;
                }
LAB_00112d19:
                *plVar19 = (long)puStack_78 - (long)puVar20;
                *puVar16 = 0;
                *(undefined4 *)p = 0x295;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x29c) {
                puVar20 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puVar20;
                *(uint **)((long)p + 0x498) = puVar20;
                *(long *)((long)p + 0x4a8) = lVar40;
                *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puStack_78 = puVar20;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  uStack_88._0_4_ = *(uint *)((long)p + 0x4f70);
                  uVar14 = *(uint *)((long)p + 0x4f74);
                  uVar37 = *(uint *)((long)p + 0x4f7c);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f44);
                  uStack_80 = *(undefined4 *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar22 = *(uint *)((long)p + 0x510);
                  uStack_7c = *(uint *)((long)p + 0x514);
                  uVar26 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  if (0 < lVar40) goto LAB_00111970;
                  uVar28 = 0;
                  goto LAB_0011197a;
                }
LAB_00112c4a:
                *plVar19 = (long)puStack_78 - (long)puVar20;
                *puVar16 = 0;
                *(undefined4 *)p = 0x29c;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x2a5) {
                puStack_78 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puStack_78;
                *(uint **)((long)p + 0x498) = puStack_78;
                *(long *)((long)p + 0x4a8) = lVar40;
                puVar20 = (uint *)((long)puStack_78 + lVar40);
                *(uint **)((long)p + 0x4a0) = puVar20;
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puVar30 = puStack_78;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  uStack_88._0_4_ = *(uint *)((long)p + 0x4f70);
                  uVar14 = *(uint *)((long)p + 0x4f74);
                  iVar44 = *(int *)((long)p + 0x4f78);
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uStack_88._4_4_ = *(uint *)((long)p + 0x4f44);
                  uStack_80 = *(undefined4 *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar22 = *(uint *)((long)p + 0x510);
                  uStack_7c = *(uint *)((long)p + 0x514);
                  uVar26 = *(ulong *)((long)p + 0x4c8);
                  uVar36 = *(uint *)((long)p + 0x4d0);
                  prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                  pdVar25 = prVar32->m_pDecode_tables;
                  goto LAB_00115b4f;
                }
LAB_00115c28:
                *plVar19 = (long)puStack_78 - (long)puVar30;
                *puVar16 = 0;
                *(undefined4 *)p = 0x2a5;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0x2c2) {
LAB_001157c7:
                *(undefined4 *)p = 0x2c2;
                return LZHAM_DECOMP_STATUS_FAILED_BAD_CODE;
              }
              if (iVar44 == 0x2df) {
                puStack_78 = *(uint **)((long)p + 0x550);
                lVar40 = **(long **)((long)p + 0x558);
                *(uint **)((long)p + 0x490) = puStack_78;
                *(uint **)((long)p + 0x498) = puStack_78;
                *(long *)((long)p + 0x4a8) = lVar40;
                *(byte **)((long)p + 0x4a0) = (byte *)(lVar40 + (long)puStack_78);
                *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
                pvVar29 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
                *(void **)((long)p + 0x4f50) = pvVar29;
                uVar26 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
                *(ulong *)((long)p + 0x4f58) = uVar26;
                if (uVar26 != 0) {
                  uVar27 = *puVar16;
                  if (uVar26 < *puVar16) {
                    uVar27 = uVar26;
                  }
                  *(ulong *)((long)p + 0x4f60) = uVar27;
                  if (*(int *)((long)p + 0x594) == 0) {
                    memcpy(pbVar6,pvVar29,uVar27);
                  }
                  else {
                    for (uVar26 = 0; sVar41 = uVar27 - uVar26, uVar26 <= uVar27 && sVar41 != 0;
                        uVar26 = uVar26 + sVar41) {
                      if (0x1fff < sVar41) {
                        sVar41 = 0x2000;
                      }
                      memcpy((void *)(*(long *)((long)p + 0x560) + uVar26),
                             (void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41);
                      uVar12 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41,
                                       *(uint *)((long)p + 0x548));
                      *(uint *)((long)p + 0x548) = uVar12;
                      uVar27 = *(ulong *)((long)p + 0x4f60);
                    }
                  }
                  **(long **)((long)p + 0x558) =
                       *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
                  **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
                  *(undefined4 *)p = 0x2df;
                  return LZHAM_DECOMP_STATUS_NOT_FINISHED;
                }
                iVar44 = *(int *)((long)p + 0x4f70);
                pbVar24 = *(byte **)((long)p + 0x4f88);
                iVar42 = *(int *)((long)p + 0x4f2c);
                iStack_98 = *(int *)((long)p + 0x4f30);
                uStack_9c = *(int *)((long)p + 0x4f34);
                iStack_94 = *(int *)((long)p + 0x4f38);
                uVar11 = *(uint *)((long)p + 0x4f3c);
                uVar14 = *(uint *)((long)p + 0x510);
                uStack_7c = *(uint *)((long)p + 0x514);
                uVar26 = *(ulong *)((long)p + 0x4c8);
                uVar43 = *(uint *)((long)p + 0x4d0);
                uStack_58 = 0;
                uStack_88._4_4_ = *(uint *)((long)p + 0x4f48);
                uVar37 = *(uint *)((long)p + 0x4f44);
                do {
                  if (iVar44 + -1 == (int)uStack_58) goto LAB_00114439;
                  bVar21 = *pbVar24;
                  pbVar24 = pbVar24 + 1;
                  pbVar6[uStack_58] = bVar21;
                  if (pbVar24 == pbVar6 + uVar27) {
                    pbVar24 = pbVar6;
                  }
                  uStack_58 = uStack_58 + 1;
                  uStack_88._4_4_ = uVar37;
                  uVar37 = (uint)bVar21;
                } while( true );
              }
              if (iVar44 == 0x325) {
                puVar20 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = puVar20;
                *(uint **)((long)p + 0x498) = puVar20;
                *(long *)((long)p + 0x4a8) = lVar40;
                *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puStack_78 = puVar20;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  iVar42 = *(int *)((long)p + 0x4f2c);
                  iStack_98 = *(int *)((long)p + 0x4f30);
                  uStack_9c = *(int *)((long)p + 0x4f34);
                  iStack_94 = *(int *)((long)p + 0x4f38);
                  uVar11 = *(uint *)((long)p + 0x4f3c);
                  uVar37 = *(uint *)((long)p + 0x4f44);
                  uStack_80 = *(undefined4 *)((long)p + 0x4f48);
                  uStack_58 = (ulong)*(uint *)((long)p + 0x4f18);
                  uVar22 = *(uint *)((long)p + 0x510);
                  uStack_7c = *(uint *)((long)p + 0x514);
                  uVar26 = *(ulong *)((long)p + 0x4c8);
                  uVar43 = *(uint *)((long)p + 0x4d0);
                  if (0 < lVar40) goto LAB_00111a50;
                  uVar27 = 0;
                  goto LAB_00111a5a;
                }
LAB_00112c63:
                *plVar19 = (long)puStack_78 - (long)puVar20;
                *puVar16 = 0;
                *(undefined4 *)p = 0x325;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 != 0) goto switchD_001109bd_caseD_338;
              uStack_58 = 0;
              bVar8 = symbol_codec::start_decoding
                                ((symbol_codec *)((long)p + 0x490),*(uint8 **)((long)p + 0x550),
                                 **(size_t **)((long)p + 0x558),*(bool *)((long)p + 0x570),
                                 (need_bytes_func_ptr)0x0,(void *)0x0);
              if (!bVar8) {
                return LZHAM_DECOMP_STATUS_FAILED;
              }
              uVar22 = *(uint *)((long)p + 0x510);
              uStack_7c = *(uint *)((long)p + 0x514);
              puStack_78 = *(uint **)((long)p + 0x498);
              uVar26 = *(ulong *)((long)p + 0x4c8);
              iVar44 = *(int *)((long)p + 0x4d0);
              uStack_80 = 0;
              uVar37 = 0;
              uVar11 = 0;
              iStack_94 = 0;
              uStack_9c = 0;
              iStack_98 = 0;
              iVar42 = 0;
              for (; iVar44 < 2; iVar44 = iVar44 + 8) {
                if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
                  uVar27 = 0;
                  if (*(char *)((long)p + 0x4b0) == '\0') {
                    *(uint *)((long)p + 0x510) = uVar22;
                    *(uint *)((long)p + 0x514) = uStack_7c;
                    *(ulong *)((long)p + 0x4c8) = uVar26;
                    *(int *)((long)p + 0x4d0) = iVar44;
                    *(uint **)((long)p + 0x498) = puStack_78;
                    *(int *)((long)p + 0x4f2c) = iVar42;
                    *(int *)((long)p + 0x4f30) = iStack_98;
                    *(uint *)((long)p + 0x4f34) = uStack_9c;
                    *(int *)((long)p + 0x4f38) = iStack_94;
                    *(uint *)((long)p + 0x4f3c) = uVar11;
                    *(uint *)((long)p + 0x4f44) = uVar37;
                    *(uint *)((long)p + 0x4f48) = uStack_80;
                    *(int *)((long)p + 0x4f18) = (int)uStack_58;
                    plVar19 = *(long **)((long)p + 0x558);
                    puVar16 = *(ulong **)((long)p + 0x568);
                    puVar20 = *(uint **)((long)p + 0x490);
                    goto LAB_00112d53;
                  }
                }
                else {
LAB_00112023:
                  uVar27 = (ulong)(byte)*puStack_78;
                  puStack_78 = (uint *)((long)puStack_78 + 1);
                }
LAB_0011202e:
                uVar26 = uVar26 | uVar27 << (0x38U - (char)iVar44 & 0x3f);
              }
              uVar26 = uVar26 * 4;
              for (lVar40 = 0; lVar40 != 0x2000; lVar40 = lVar40 + 0x80) {
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)((long)p + lVar40 + 0x5a0),
                           (EVP_PKEY_CTX *)0x0);
              }
              for (lVar40 = 0; lVar40 != 0x2000; lVar40 = lVar40 + 0x80) {
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)((long)p + lVar40 + 0x25a0),
                           (EVP_PKEY_CTX *)0x0);
              }
              raw_quasi_adaptive_huffman_data_model::init
                        ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x45a0),
                         (EVP_PKEY_CTX *)0x0);
              prVar32 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4620);
              lVar40 = 2;
              while (bVar8 = lVar40 != 0, lVar40 = lVar40 + -1, bVar8) {
                raw_quasi_adaptive_huffman_data_model::init(prVar32,(EVP_PKEY_CTX *)0x0);
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)&prVar32[3].m_codes,
                           (EVP_PKEY_CTX *)0x0);
                prVar32 = (raw_quasi_adaptive_huffman_data_model *)&prVar32[1].m_pDecode_tables;
              }
              uVar43 = iVar44 - 2;
              raw_quasi_adaptive_huffman_data_model::init
                        ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4820),
                         (EVP_PKEY_CTX *)0x0);
              goto LAB_00113f67;
            }
            puStack_78 = *(uint **)((long)p + 0x550);
            lVar40 = **(long **)((long)p + 0x558);
            *(uint **)((long)p + 0x490) = puStack_78;
            *(uint **)((long)p + 0x498) = puStack_78;
            *(long *)((long)p + 0x4a8) = lVar40;
            *(byte **)((long)p + 0x4a0) = (byte *)(lVar40 + (long)puStack_78);
            *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
            pvVar29 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
            *(void **)((long)p + 0x4f50) = pvVar29;
            uVar26 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
            *(ulong *)((long)p + 0x4f58) = uVar26;
            if (uVar26 != 0) {
              uVar27 = *puVar16;
              if (uVar26 < *puVar16) {
                uVar27 = uVar26;
              }
              *(ulong *)((long)p + 0x4f60) = uVar27;
              if (*(int *)((long)p + 0x594) == 0) {
                memcpy(pbVar6,pvVar29,uVar27);
              }
              else {
                for (uVar26 = 0; sVar41 = uVar27 - uVar26, uVar26 <= uVar27 && sVar41 != 0;
                    uVar26 = uVar26 + sVar41) {
                  if (0x1fff < sVar41) {
                    sVar41 = 0x2000;
                  }
                  memcpy((void *)(*(long *)((long)p + 0x560) + uVar26),
                         (void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41);
                  uVar12 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41,
                                   *(uint *)((long)p + 0x548));
                  *(uint *)((long)p + 0x548) = uVar12;
                  uVar27 = *(ulong *)((long)p + 0x4f60);
                }
              }
              **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490)
              ;
              **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
              *(undefined4 *)p = 0x17c;
              return LZHAM_DECOMP_STATUS_NOT_FINISHED;
            }
            uVar14 = *(uint *)((long)p + 0x4f90);
            iVar42 = *(int *)((long)p + 0x4f2c);
            iStack_98 = *(int *)((long)p + 0x4f30);
            uStack_9c = *(int *)((long)p + 0x4f34);
            iStack_94 = *(int *)((long)p + 0x4f38);
            uVar11 = *(uint *)((long)p + 0x4f3c);
            uVar37 = *(uint *)((long)p + 0x4f44);
            uStack_80 = *(undefined4 *)((long)p + 0x4f48);
            uStack_58 = 0;
          }
          for (; uVar14 != 0; uVar14 = uVar14 - (int)uVar34) {
            uVar28 = (long)puStack_78 - *(long *)((long)p + 0x490);
            puVar16 = *(ulong **)((long)p + 0x558);
            uVar26 = *puVar16 - uVar28;
LAB_00113d10:
            if (uVar26 == 0) {
              *puVar16 = uVar28;
              **(undefined8 **)((long)p + 0x568) = 0;
              if (*(char *)((long)p + 0x570) != '\x01') {
                *(uint *)((long)p + 0x4f90) = uVar14;
                *(int *)((long)p + 0x4f2c) = iVar42;
                *(int *)((long)p + 0x4f30) = iStack_98;
                *(uint *)((long)p + 0x4f34) = uStack_9c;
                *(int *)((long)p + 0x4f38) = iStack_94;
                *(uint *)((long)p + 0x4f3c) = uVar11;
                *(uint *)((long)p + 0x4f44) = uVar37;
                *(uint *)((long)p + 0x4f48) = uStack_80;
                *(int *)((long)p + 0x4f18) = (int)uStack_58;
                *(undefined4 *)p = 0x15a;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              goto LAB_00113dc5;
            }
            uVar34 = (ulong)uVar14;
            if (uVar26 < uVar14) {
              uVar34 = uVar26;
            }
            uVar22 = (int)uStack_58 + (int)uVar34;
            if (uVar27 < uVar22) {
              *puVar16 = uVar28;
              **(undefined8 **)((long)p + 0x568) = 0;
              goto LAB_00113de1;
            }
            memcpy(pbVar6 + uStack_58,(void *)(*(long *)((long)p + 0x550) + uVar28),uVar34);
            lVar40 = *(long *)((long)p + 0x550);
            lVar7 = **(long **)((long)p + 0x558);
            puStack_78 = (uint *)(uVar28 + lVar40 + uVar34);
            *(long *)((long)p + 0x490) = lVar40;
            *(uint **)((long)p + 0x498) = puStack_78;
            *(long *)((long)p + 0x4a8) = lVar7;
            *(long *)((long)p + 0x4a0) = lVar40 + lVar7;
            *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
            uStack_58 = (ulong)uVar22;
          }
          uVar22 = *(uint *)((long)p + 0x510);
          uStack_7c = *(uint *)((long)p + 0x514);
          uVar26 = *(ulong *)((long)p + 0x4c8);
          uVar43 = *(uint *)((long)p + 0x4d0);
          goto LAB_00113fba;
        }
        goto LAB_001140f5;
      }
    }
    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
  }
  uVar27 = 1L << (*(byte *)((long)p + 0x58c) & 0x3f);
  uVar22 = (int)uVar27 - 1;
  pbVar6 = *(byte **)((long)p + 0x540);
  iVar44 = *p;
  switch(iVar44) {
  case 0x18d:
    uStack_88 = *(uint **)((long)p + 0x550);
    plVar19 = *(long **)((long)p + 0x558);
    lVar40 = *plVar19;
    *(uint **)((long)p + 0x490) = uStack_88;
    *(uint **)((long)p + 0x498) = uStack_88;
    *(long *)((long)p + 0x4a8) = lVar40;
    *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
    *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
    puVar20 = uStack_88;
    if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
      uVar33 = *(undefined4 *)((long)p + 0x4f2c);
      iStack_a0 = *(undefined4 *)((long)p + 0x4f30);
      iStack_a8 = *(undefined4 *)((long)p + 0x4f34);
      iStack_a4 = *(undefined4 *)((long)p + 0x4f38);
      uVar39 = *(undefined4 *)((long)p + 0x4f3c);
      uStack_9c = *(undefined4 *)((long)p + 0x4f44);
      uVar31 = *(undefined4 *)((long)p + 0x4f48);
      puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
      uStack_90._4_4_ = *(uint *)((long)p + 0x514);
      uVar28 = *(ulong *)((long)p + 0x4c8);
      iVar42 = *(int *)((long)p + 0x4d0);
      if (lVar40 < 1) goto LAB_0011903a;
      do {
        uVar26 = (ulong)(byte)*uStack_88;
        uStack_88 = (uint *)((long)uStack_88 + 1);
        iVar44 = iVar42;
        while( true ) {
          iVar42 = iVar44 + 8;
          uVar28 = uVar28 | uVar26 << (0x38U - (char)iVar44 & 0x3f);
          if (7 < iVar42) {
            uVar26 = uVar28 << 8;
            uVar11 = (uint)(uVar28 >> 0x20) & 0xff000000;
            goto LAB_00116632;
          }
          if (uStack_88 != *(uint **)((long)p + 0x4a0)) break;
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(undefined4 *)((long)p + 0x510) = *(undefined4 *)((long)p + 0x510);
            *(uint *)((long)p + 0x514) = uStack_90._4_4_;
            *(ulong *)((long)p + 0x4c8) = uVar28;
            *(int *)((long)p + 0x4d0) = iVar42;
            *(uint **)((long)p + 0x498) = uStack_88;
            *(undefined4 *)((long)p + 0x4f2c) = uVar33;
            *(int *)((long)p + 0x4f30) = iStack_a0;
            *(int *)((long)p + 0x4f34) = iStack_a8;
            *(int *)((long)p + 0x4f38) = iStack_a4;
            *(undefined4 *)((long)p + 0x4f3c) = uVar39;
            *(uint *)((long)p + 0x4f44) = uStack_9c;
            *(undefined4 *)((long)p + 0x4f48) = uVar31;
            *(uint *)((long)p + 0x4f18) = *(uint *)((long)p + 0x4f18);
            plVar19 = *(long **)((long)p + 0x558);
            puVar20 = *(uint **)((long)p + 0x490);
            goto LAB_001180f9;
          }
LAB_0011903a:
          uVar26 = 0;
          iVar44 = iVar42;
        }
      } while( true );
    }
LAB_001180f9:
    *plVar19 = (long)uStack_88 - (long)puVar20;
    **(undefined8 **)((long)p + 0x568) = 0;
    *(undefined4 *)p = 0x18d;
    break;
  case 0x18e:
    uStack_88 = *(uint **)((long)p + 0x550);
    plVar19 = *(long **)((long)p + 0x558);
    lVar40 = *plVar19;
    *(uint **)((long)p + 0x490) = uStack_88;
    *(uint **)((long)p + 0x498) = uStack_88;
    *(long *)((long)p + 0x4a8) = lVar40;
    *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
    *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
    puVar20 = uStack_88;
    if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
      uVar33 = *(undefined4 *)((long)p + 0x4f2c);
      iStack_a0 = *(undefined4 *)((long)p + 0x4f30);
      iStack_a8 = *(undefined4 *)((long)p + 0x4f34);
      iStack_a4 = *(undefined4 *)((long)p + 0x4f38);
      uVar39 = *(undefined4 *)((long)p + 0x4f3c);
      uStack_9c = *(undefined4 *)((long)p + 0x4f44);
      uVar31 = *(undefined4 *)((long)p + 0x4f48);
      puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
      uVar11 = *(uint *)((long)p + 0x510);
      uStack_90._4_4_ = *(uint *)((long)p + 0x514);
      uVar26 = *(ulong *)((long)p + 0x4c8);
      iVar44 = *(int *)((long)p + 0x4d0);
      if (0 < lVar40) goto LAB_0011660c;
      goto LAB_00119014;
    }
LAB_00118119:
    *plVar19 = (long)uStack_88 - (long)puVar20;
    **(undefined8 **)((long)p + 0x568) = 0;
    *(undefined4 *)p = 0x18e;
    break;
  case 399:
    uStack_88 = *(uint **)((long)p + 0x550);
    plVar19 = *(long **)((long)p + 0x558);
    lVar40 = *plVar19;
    *(uint **)((long)p + 0x490) = uStack_88;
    *(uint **)((long)p + 0x498) = uStack_88;
    *(long *)((long)p + 0x4a8) = lVar40;
    *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
    *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
    puVar20 = uStack_88;
    if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
      uVar33 = *(undefined4 *)((long)p + 0x4f2c);
      iStack_a0 = *(undefined4 *)((long)p + 0x4f30);
      iStack_a8 = *(undefined4 *)((long)p + 0x4f34);
      iStack_a4 = *(undefined4 *)((long)p + 0x4f38);
      uVar39 = *(undefined4 *)((long)p + 0x4f3c);
      uStack_9c = *(undefined4 *)((long)p + 0x4f44);
      uVar31 = *(undefined4 *)((long)p + 0x4f48);
      puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
      uVar11 = *(uint *)((long)p + 0x510);
      uStack_90._4_4_ = *(uint *)((long)p + 0x514);
      uVar28 = *(ulong *)((long)p + 0x4c8);
      iVar44 = *(int *)((long)p + 0x4d0);
      if (0 < lVar40) goto LAB_00116431;
      goto LAB_00119000;
    }
LAB_001180b9:
    *plVar19 = (long)uStack_88 - (long)puVar20;
    **(undefined8 **)((long)p + 0x568) = 0;
    *(undefined4 *)p = 399;
    break;
  case 400:
    uStack_88 = *(uint **)((long)p + 0x550);
    plVar19 = *(long **)((long)p + 0x558);
    lVar40 = *plVar19;
    *(uint **)((long)p + 0x490) = uStack_88;
    *(uint **)((long)p + 0x498) = uStack_88;
    *(long *)((long)p + 0x4a8) = lVar40;
    *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
    *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
    puVar20 = uStack_88;
    if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
      uVar33 = *(undefined4 *)((long)p + 0x4f2c);
      iStack_a0 = *(undefined4 *)((long)p + 0x4f30);
      iStack_a8 = *(undefined4 *)((long)p + 0x4f34);
      iStack_a4 = *(undefined4 *)((long)p + 0x4f38);
      uVar39 = *(undefined4 *)((long)p + 0x4f3c);
      uStack_9c = *(undefined4 *)((long)p + 0x4f44);
      uVar31 = *(undefined4 *)((long)p + 0x4f48);
      puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
      uVar11 = *(uint *)((long)p + 0x510);
      uStack_90._4_4_ = *(uint *)((long)p + 0x514);
      uVar26 = *(ulong *)((long)p + 0x4c8);
      iVar44 = *(int *)((long)p + 0x4d0);
      if (0 < lVar40) goto LAB_00116524;
      uVar28 = 0;
      goto LAB_0011652a;
    }
LAB_001180d9:
    *plVar19 = (long)uStack_88 - (long)puVar20;
    **(undefined8 **)((long)p + 0x568) = 0;
    *(undefined4 *)p = 400;
    break;
  default:
    switch(iVar44) {
    case 0x337:
      uStack_88 = *(uint **)((long)p + 0x550);
      lVar40 = **(long **)((long)p + 0x558);
      *(uint **)((long)p + 0x490) = uStack_88;
      *(uint **)((long)p + 0x498) = uStack_88;
      *(long *)((long)p + 0x4a8) = lVar40;
      *(byte **)((long)p + 0x4a0) = (byte *)(lVar40 + (long)uStack_88);
      *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
      pvVar29 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
      *(void **)((long)p + 0x4f50) = pvVar29;
      puStack_78 = (uint *)(*(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60));
      *(uint **)((long)p + 0x4f58) = puStack_78;
      if (puStack_78 == (uint *)0x0) {
        iStack_ac = *(int *)((long)p + 0x4f2c);
        iStack_a0 = *(int *)((long)p + 0x4f30);
        iStack_a8 = *(int *)((long)p + 0x4f34);
        iStack_a4 = *(int *)((long)p + 0x4f38);
        uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
        uStack_9c = *(uint *)((long)p + 0x4f44);
        uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
        uVar33 = *(undefined4 *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uStack_90._4_4_ = *(uint *)((long)p + 0x514);
        uStack_60 = *(ulong *)((long)p + 0x4c8);
        uVar37 = *(uint *)((long)p + 0x4d0);
        iVar44 = *(int *)((long)p + 0x598);
        goto LAB_0011981a;
      }
      break;
    case 0x338:
    case 0x339:
    case 0x33a:
    case 0x33b:
    case 0x33c:
    case 0x33e:
      goto switchD_00115eb3_caseD_338;
    case 0x33d:
      uStack_88 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar40 = *plVar19;
      *(uint **)((long)p + 0x490) = uStack_88;
      *(uint **)((long)p + 0x498) = uStack_88;
      *(long *)((long)p + 0x4a8) = lVar40;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puVar20 = uStack_88;
      if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        iStack_ac = *(int *)((long)p + 0x4f2c);
        iStack_a0 = *(int *)((long)p + 0x4f30);
        iStack_a8 = *(int *)((long)p + 0x4f34);
        iStack_a4 = *(int *)((long)p + 0x4f38);
        uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
        uStack_9c = *(uint *)((long)p + 0x4f44);
        uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
        uVar33 = *(undefined4 *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uStack_90._4_4_ = *(uint *)((long)p + 0x514);
        uStack_60 = *(ulong *)((long)p + 0x4c8);
        uVar37 = *(uint *)((long)p + 0x4d0);
        if (0 < lVar40) goto LAB_00116174;
        uVar27 = 0;
        goto LAB_0011617a;
      }
LAB_00118050:
      *plVar19 = (long)uStack_88 - (long)puVar20;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x33d;
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    case 0x33f:
      uStack_88 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar40 = *plVar19;
      *(uint **)((long)p + 0x490) = uStack_88;
      *(uint **)((long)p + 0x498) = uStack_88;
      *(long *)((long)p + 0x4a8) = lVar40;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puVar20 = uStack_88;
      if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        iStack_ac = *(int *)((long)p + 0x4f2c);
        iStack_a0 = *(int *)((long)p + 0x4f30);
        iStack_a8 = *(int *)((long)p + 0x4f34);
        iStack_a4 = *(int *)((long)p + 0x4f38);
        uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
        uStack_9c = *(uint *)((long)p + 0x4f44);
        uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
        uVar33 = *(undefined4 *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uStack_90._4_4_ = *(uint *)((long)p + 0x514);
        uStack_60 = *(ulong *)((long)p + 0x4c8);
        uVar37 = *(uint *)((long)p + 0x4d0);
        if (0 < lVar40) goto LAB_0011625c;
        uVar27 = 0;
        goto LAB_00116262;
      }
LAB_00118073:
      *plVar19 = (long)uStack_88 - (long)puVar20;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x33f;
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    case 0x340:
      uStack_88 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar40 = *plVar19;
      *(uint **)((long)p + 0x490) = uStack_88;
      *(uint **)((long)p + 0x498) = uStack_88;
      *(long *)((long)p + 0x4a8) = lVar40;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puVar20 = uStack_88;
      if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        iStack_ac = *(int *)((long)p + 0x4f2c);
        iStack_a0 = *(int *)((long)p + 0x4f30);
        iStack_a8 = *(int *)((long)p + 0x4f34);
        iStack_a4 = *(int *)((long)p + 0x4f38);
        uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
        uStack_9c = *(uint *)((long)p + 0x4f44);
        uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
        uVar33 = *(undefined4 *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uStack_90._4_4_ = *(uint *)((long)p + 0x514);
        uVar27 = *(ulong *)((long)p + 0x4c8);
        iVar44 = *(int *)((long)p + 0x4d0);
        if (0 < lVar40) goto LAB_00116344;
        uVar26 = 0;
        goto LAB_0011634a;
      }
LAB_00118096:
      *plVar19 = (long)uStack_88 - (long)puVar20;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x340;
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    default:
      if (iVar44 != 0x35c) {
        if (iVar44 == 0xff) {
          uStack_88 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar40 = *plVar19;
          *(uint **)((long)p + 0x490) = uStack_88;
          *(uint **)((long)p + 0x498) = uStack_88;
          *(long *)((long)p + 0x4a8) = lVar40;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          puVar20 = uStack_88;
          if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            iStack_ac = *(int *)((long)p + 0x4f2c);
            iStack_a0 = *(int *)((long)p + 0x4f30);
            iStack_a8 = *(int *)((long)p + 0x4f34);
            iStack_a4 = *(int *)((long)p + 0x4f38);
            uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
            uStack_9c = *(uint *)((long)p + 0x4f44);
            uStack_90 = (ulong)*(uint *)((long)p + 0x4f48);
            puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
            uVar11 = *(uint *)((long)p + 0x510);
            uStack_60 = *(ulong *)((long)p + 0x4c8);
            iVar44 = *(int *)((long)p + 0x4d0);
            uVar22 = *(uint *)((long)p + 0x514);
            if (0 < lVar40) goto LAB_00117603;
            uStack_90 = CONCAT44(*(uint *)((long)p + 0x514),*(uint *)((long)p + 0x4f48));
            uVar27 = 0;
            goto LAB_0011760d;
          }
LAB_00118257:
          *plVar19 = (long)uStack_88 - (long)puVar20;
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0xff;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar44 == 0x11a) {
          puVar20 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar40 = *plVar19;
          *(uint **)((long)p + 0x490) = puVar20;
          *(uint **)((long)p + 0x498) = puVar20;
          *(long *)((long)p + 0x4a8) = lVar40;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          uStack_88 = puVar20;
          if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            iStack_ac = *(int *)((long)p + 0x4f2c);
            iStack_a0 = *(int *)((long)p + 0x4f30);
            iStack_a8 = *(int *)((long)p + 0x4f34);
            iStack_a4 = *(int *)((long)p + 0x4f38);
            uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
            uStack_9c = *(uint *)((long)p + 0x4f44);
            uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
            puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
            uVar11 = *(uint *)((long)p + 0x510);
            uStack_90._4_4_ = *(uint *)((long)p + 0x514);
            uStack_60 = *(ulong *)((long)p + 0x4c8);
            uVar37 = *(uint *)((long)p + 0x4d0);
            if (0 < lVar40) goto LAB_00117a6e;
            uVar27 = 0;
            goto LAB_00117a74;
          }
LAB_001182c8:
          *plVar19 = (long)uStack_88 - (long)puVar20;
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x11a;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar44 == 0x126) {
          uStack_88 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar40 = *plVar19;
          *(uint **)((long)p + 0x490) = uStack_88;
          *(uint **)((long)p + 0x498) = uStack_88;
          *(long *)((long)p + 0x4a8) = lVar40;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          puVar20 = uStack_88;
          if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) != 1) {
LAB_00118316:
            *plVar19 = (long)uStack_88 - (long)puVar20;
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x126;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          iStack_ac = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iStack_a8 = *(int *)((long)p + 0x4f34);
          iStack_a4 = *(int *)((long)p + 0x4f38);
          uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
          uStack_9c = *(uint *)((long)p + 0x4f44);
          uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
          uVar28 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar33 = *(undefined4 *)((long)p + 0x510);
          uVar39 = *(undefined4 *)((long)p + 0x514);
          uVar26 = *(ulong *)((long)p + 0x4c8);
          uVar11 = *(uint *)((long)p + 0x4d0);
          if (lVar40 < 1) {
            uVar34 = 0;
            uVar37 = uVar11;
            goto LAB_00117eed;
          }
          do {
            uVar34 = (ulong)(byte)*uStack_88;
            uStack_88 = (uint *)((long)uStack_88 + 1);
            uVar37 = uVar11;
LAB_00117eed:
            while( true ) {
              uVar11 = uVar37 + 8;
              uVar26 = uVar26 | uVar34 << (0x38U - (char)uVar37 & 0x3f);
              if (0x17 < (int)uVar11) {
                uVar34 = uVar26 << 0x18;
                uVar37 = uVar37 - 0x10;
                uVar43 = (uint)(uVar26 >> 0x28) + 1;
                if ((uVar11 & 7) == 0) goto LAB_001191ee;
                goto LAB_00117f31;
              }
              if (uStack_88 != *(uint **)((long)p + 0x4a0)) break;
              uVar34 = 0;
              uVar37 = uVar11;
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(undefined4 *)((long)p + 0x510) = uVar33;
                *(undefined4 *)((long)p + 0x514) = uVar39;
                *(ulong *)((long)p + 0x4c8) = uVar26;
                *(uint *)((long)p + 0x4d0) = uVar11;
                *(uint **)((long)p + 0x498) = uStack_88;
                *(undefined4 *)((long)p + 0x4f90) = *(undefined4 *)((long)p + 0x4f90);
                *(int *)((long)p + 0x4f2c) = iStack_ac;
                *(int *)((long)p + 0x4f30) = iStack_a0;
                *(int *)((long)p + 0x4f34) = iStack_a8;
                *(int *)((long)p + 0x4f38) = iStack_a4;
                *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                *(uint *)((long)p + 0x4f44) = uStack_9c;
                *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                *(uint *)((long)p + 0x4f18) = *(uint *)((long)p + 0x4f18);
                plVar19 = *(long **)((long)p + 0x558);
                puVar20 = *(uint **)((long)p + 0x490);
                goto LAB_00118316;
              }
            }
          } while( true );
        }
        if (iVar44 == 0x129) {
          uStack_88 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar40 = *plVar19;
          *(uint **)((long)p + 0x490) = uStack_88;
          *(uint **)((long)p + 0x498) = uStack_88;
          *(long *)((long)p + 0x4a8) = lVar40;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          puVar20 = uStack_88;
          if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) != 1) {
LAB_001182f3:
            *plVar19 = (long)uStack_88 - (long)puVar20;
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x129;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          uVar43 = *(uint *)((long)p + 0x4f90);
          iStack_ac = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iStack_a8 = *(int *)((long)p + 0x4f34);
          iStack_a4 = *(int *)((long)p + 0x4f38);
          uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
          uStack_9c = *(uint *)((long)p + 0x4f44);
          uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
          uVar28 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar33 = *(undefined4 *)((long)p + 0x510);
          uVar39 = *(undefined4 *)((long)p + 0x514);
          uVar34 = *(ulong *)((long)p + 0x4c8);
          uVar37 = *(uint *)((long)p + 0x4d0);
          if (lVar40 < 1) goto LAB_00119026;
          do {
            uVar26 = (ulong)(byte)*uStack_88;
            uStack_88 = (uint *)((long)uStack_88 + 1);
            while( true ) {
              cVar9 = (char)uVar37;
              uVar37 = uVar37 + 8;
              uVar34 = uVar34 | uVar26 << (0x38U - cVar9 & 0x3f);
LAB_00117f31:
              if (-1 < (int)uVar37) {
                uVar34 = uVar34 << ((byte)uVar37 & 7);
                uVar37 = uVar37 & 0x7ffffff8;
                goto LAB_001191ee;
              }
              if (uStack_88 != *(uint **)((long)p + 0x4a0)) break;
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(undefined4 *)((long)p + 0x510) = uVar33;
                *(undefined4 *)((long)p + 0x514) = uVar39;
                *(ulong *)((long)p + 0x4c8) = uVar34;
                *(uint *)((long)p + 0x4d0) = uVar37;
                *(uint **)((long)p + 0x498) = uStack_88;
                *(uint *)((long)p + 0x4f90) = uVar43;
                *(int *)((long)p + 0x4f2c) = iStack_ac;
                *(int *)((long)p + 0x4f30) = iStack_a0;
                *(int *)((long)p + 0x4f34) = iStack_a8;
                *(int *)((long)p + 0x4f38) = iStack_a4;
                *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                *(uint *)((long)p + 0x4f44) = uStack_9c;
                *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                *(int *)((long)p + 0x4f18) = (int)uVar28;
                plVar19 = *(long **)((long)p + 0x558);
                puVar20 = *(uint **)((long)p + 0x490);
                goto LAB_001182f3;
              }
LAB_00119026:
              uVar26 = 0;
            }
          } while( true );
        }
        if (iVar44 == 0x137) {
          *(undefined4 *)p = 0x137;
          return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
        }
        if (iVar44 == 0x13f) {
          uStack_88 = *(uint **)((long)p + 0x550);
          lVar40 = **(long **)((long)p + 0x558);
          *(uint **)((long)p + 0x490) = uStack_88;
          *(uint **)((long)p + 0x498) = uStack_88;
          *(long *)((long)p + 0x4a8) = lVar40;
          *(byte **)((long)p + 0x4a0) = (byte *)(lVar40 + (long)uStack_88);
          *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
          pvVar29 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
          *(void **)((long)p + 0x4f50) = pvVar29;
          uVar26 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
          *(ulong *)((long)p + 0x4f58) = uVar26;
          if (uVar26 == 0) {
            uVar43 = *(uint *)((long)p + 0x4f90);
            iStack_ac = *(int *)((long)p + 0x4f2c);
            iStack_a0 = *(int *)((long)p + 0x4f30);
            iStack_a8 = *(int *)((long)p + 0x4f34);
            iStack_a4 = *(int *)((long)p + 0x4f38);
            uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
            uStack_9c = *(uint *)((long)p + 0x4f44);
            uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
            uVar33 = *(undefined4 *)((long)p + 0x510);
            uVar39 = *(undefined4 *)((long)p + 0x514);
            uVar26 = *(ulong *)((long)p + 0x4c8);
            uVar37 = *(uint *)((long)p + 0x4d0);
            puStack_78 = (uint *)0x0;
            do {
              uVar43 = uVar43 - 1;
              uVar28 = (ulong)puStack_78;
              uVar34 = uVar26;
              if (uVar43 == 0) {
                uVar43 = 0;
LAB_00119217:
                *(undefined4 *)((long)p + 0x510) = uVar33;
                *(undefined4 *)((long)p + 0x514) = uVar39;
                *(ulong *)((long)p + 0x4c8) = uVar26;
                *(uint *)((long)p + 0x4d0) = uVar37;
                *(uint **)((long)p + 0x498) = uStack_88;
                goto LAB_00119461;
              }
LAB_001191ee:
              puStack_78 = (uint *)uVar28;
              uVar26 = uVar34;
              if ((int)uVar37 < 8) goto LAB_00119217;
              uVar26 = uVar34 << 8;
              uVar37 = uVar37 - 8;
              uVar11 = (int)uVar28 + 1;
              puStack_78 = (uint *)(ulong)uVar11;
              pbVar6[uVar28] = (byte)(uVar34 >> 0x38);
            } while (uVar11 <= uVar22);
            *(undefined4 *)((long)p + 0x510) = uVar33;
            *(undefined4 *)((long)p + 0x514) = uVar39;
            *(ulong *)((long)p + 0x4c8) = uVar26;
            *(uint *)((long)p + 0x4d0) = uVar37;
            *(uint **)((long)p + 0x498) = uStack_88;
            *(uint *)((long)p + 0x4f90) = uVar43;
            *(int *)((long)p + 0x4f2c) = iStack_ac;
            *(int *)((long)p + 0x4f30) = iStack_a0;
            *(int *)((long)p + 0x4f34) = iStack_a8;
            *(int *)((long)p + 0x4f38) = iStack_a4;
            *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
            *(uint *)((long)p + 0x4f44) = uStack_9c;
            *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
            *(uint *)((long)p + 0x4f18) = uVar11;
            pvVar29 = *(void **)((long)p + 0x540);
            *(void **)((long)p + 0x4f50) = pvVar29;
            *(ulong *)((long)p + 0x4f58) = uVar27;
            uVar26 = uVar27;
          }
          uVar27 = **(ulong **)((long)p + 0x568);
          if (uVar26 < **(ulong **)((long)p + 0x568)) {
            uVar27 = uVar26;
          }
          *(ulong *)((long)p + 0x4f60) = uVar27;
          if (*(int *)((long)p + 0x594) == 0) {
            memcpy(*(void **)((long)p + 0x560),pvVar29,uVar27);
          }
          else {
            for (uVar26 = 0; sVar41 = uVar27 - uVar26, uVar26 <= uVar27 && sVar41 != 0;
                uVar26 = uVar26 + sVar41) {
              if (0x1fff < sVar41) {
                sVar41 = 0x2000;
              }
              memcpy((void *)(*(long *)((long)p + 0x560) + uVar26),
                     (void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41);
              uVar12 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41,
                               *(uint *)((long)p + 0x548));
              *(uint *)((long)p + 0x548) = uVar12;
              uVar27 = *(ulong *)((long)p + 0x4f60);
            }
          }
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
          *(undefined4 *)p = 0x13f;
        }
        else {
          if (iVar44 == 0x156) {
LAB_001194c6:
            *(undefined4 *)p = 0x156;
            return LZHAM_DECOMP_STATUS_FAILED;
          }
          if (iVar44 == 0x15a) {
            uVar43 = *(uint *)((long)p + 0x4f90);
            iStack_ac = *(int *)((long)p + 0x4f2c);
            iStack_a0 = *(int *)((long)p + 0x4f30);
            iStack_a8 = *(int *)((long)p + 0x4f34);
            iStack_a4 = *(int *)((long)p + 0x4f38);
            uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
            uStack_9c = *(uint *)((long)p + 0x4f44);
            uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
            puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
            lVar40 = *(long *)((long)p + 0x550);
            puVar16 = *(ulong **)((long)p + 0x558);
            uVar26 = *puVar16;
            *(long *)((long)p + 0x490) = lVar40;
            *(long *)((long)p + 0x498) = lVar40;
            *(ulong *)((long)p + 0x4a8) = uVar26;
            *(ulong *)((long)p + 0x4a0) = lVar40 + uVar26;
            *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
            uVar28 = 0;
            goto LAB_001193ab;
          }
          if (iVar44 == 0x16c) {
            *(undefined4 *)p = 0x16c;
            return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
          }
          if (iVar44 == 0x17c) {
            uStack_88 = *(uint **)((long)p + 0x550);
            lVar40 = **(long **)((long)p + 0x558);
            *(uint **)((long)p + 0x490) = uStack_88;
            *(uint **)((long)p + 0x498) = uStack_88;
            *(long *)((long)p + 0x4a8) = lVar40;
            *(byte **)((long)p + 0x4a0) = (byte *)(lVar40 + (long)uStack_88);
            *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
            pvVar29 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
            *(void **)((long)p + 0x4f50) = pvVar29;
            uVar26 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
            *(ulong *)((long)p + 0x4f58) = uVar26;
            if (uVar26 == 0) {
              uVar43 = *(uint *)((long)p + 0x4f90);
              iStack_ac = *(int *)((long)p + 0x4f2c);
              iStack_a0 = *(int *)((long)p + 0x4f30);
              iStack_a8 = *(int *)((long)p + 0x4f34);
              iStack_a4 = *(int *)((long)p + 0x4f38);
              uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
              uStack_9c = *(uint *)((long)p + 0x4f44);
              uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
              puStack_78 = (uint *)0x0;
LAB_00119461:
              do {
                if (uVar43 == 0) goto LAB_0011947f;
                uVar28 = (long)uStack_88 - *(long *)((long)p + 0x490);
                puVar16 = *(ulong **)((long)p + 0x558);
                uVar26 = *puVar16 - uVar28;
LAB_001193ab:
                iVar44 = (int)puStack_78;
                if (uVar26 == 0) {
                  *puVar16 = uVar28;
                  **(undefined8 **)((long)p + 0x568) = 0;
                  if (*(char *)((long)p + 0x570) != '\x01') {
                    *(uint *)((long)p + 0x4f90) = uVar43;
                    *(int *)((long)p + 0x4f2c) = iStack_ac;
                    *(int *)((long)p + 0x4f30) = iStack_a0;
                    *(int *)((long)p + 0x4f34) = iStack_a8;
                    *(int *)((long)p + 0x4f38) = iStack_a4;
                    *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                    *(uint *)((long)p + 0x4f44) = uStack_9c;
                    *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                    *(int *)((long)p + 0x4f18) = iVar44;
                    *(undefined4 *)p = 0x15a;
                    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                  }
                  goto LAB_001194c6;
                }
                uVar11 = uVar43;
                if (uVar26 < uVar43) {
                  uVar11 = (uint)uVar26;
                }
                uVar37 = (int)uVar27 - iVar44;
                if (uVar11 <= uVar37) {
                  uVar37 = uVar11;
                }
                memcpy(pbVar6 + (long)puStack_78,(void *)(*(long *)((long)p + 0x550) + uVar28),
                       (ulong)uVar37);
                uVar43 = uVar43 - uVar37;
                lVar40 = *(long *)((long)p + 0x550);
                lVar7 = **(long **)((long)p + 0x558);
                uStack_88 = (uint *)(uVar28 + lVar40 + (ulong)uVar37);
                *(long *)((long)p + 0x490) = lVar40;
                *(uint **)((long)p + 0x498) = uStack_88;
                *(long *)((long)p + 0x4a8) = lVar7;
                *(long *)((long)p + 0x4a0) = lVar40 + lVar7;
                *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
                uVar37 = uVar37 + iVar44;
                if (uVar22 < uVar37) {
                  *(uint *)((long)p + 0x4f90) = uVar43;
                  *(int *)((long)p + 0x4f2c) = iStack_ac;
                  *(int *)((long)p + 0x4f30) = iStack_a0;
                  *(int *)((long)p + 0x4f34) = iStack_a8;
                  *(int *)((long)p + 0x4f38) = iStack_a4;
                  *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                  *(uint *)((long)p + 0x4f44) = uStack_9c;
                  *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                  *(uint *)((long)p + 0x4f18) = uVar37;
                  pvVar29 = *(void **)((long)p + 0x540);
                  *(void **)((long)p + 0x4f50) = pvVar29;
                  *(ulong *)((long)p + 0x4f58) = uVar27;
                  uVar26 = uVar27;
                  break;
                }
                puStack_78 = (uint *)(ulong)uVar37;
              } while( true );
            }
            uVar27 = **(ulong **)((long)p + 0x568);
            if (uVar26 < **(ulong **)((long)p + 0x568)) {
              uVar27 = uVar26;
            }
            *(ulong *)((long)p + 0x4f60) = uVar27;
            if (*(int *)((long)p + 0x594) == 0) {
              memcpy(*(void **)((long)p + 0x560),pvVar29,uVar27);
            }
            else {
              for (uVar26 = 0; sVar41 = uVar27 - uVar26, uVar26 <= uVar27 && sVar41 != 0;
                  uVar26 = uVar26 + sVar41) {
                if (0x1fff < sVar41) {
                  sVar41 = 0x2000;
                }
                memcpy((void *)(*(long *)((long)p + 0x560) + uVar26),
                       (void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41);
                uVar12 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41,
                                 *(uint *)((long)p + 0x548));
                *(uint *)((long)p + 0x548) = uVar12;
                uVar27 = *(ulong *)((long)p + 0x4f60);
              }
            }
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
            *(undefined4 *)p = 0x17c;
          }
          else {
            if (iVar44 == 0x1c9) {
              uStack_88 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = uStack_88;
              *(uint **)((long)p + 0x498) = uStack_88;
              *(long *)((long)p + 0x4a8) = lVar40;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              puVar20 = uStack_88;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar11 = *(uint *)((long)p + 0x510);
                uStack_90._4_4_ = *(uint *)((long)p + 0x514);
                uVar26 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                if (0 < lVar40) goto LAB_00117958;
                goto LAB_001190d4;
              }
LAB_001182a5:
              *plVar19 = (long)uStack_88 - (long)puVar20;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x1c9;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x1dd) {
              *(undefined4 *)p = 0x1dd;
              return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
            }
            if (iVar44 == 0x1e6) {
              puVar30 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar30;
              *(uint **)((long)p + 0x498) = puVar30;
              *(long *)((long)p + 0x4a8) = lVar40;
              puVar20 = (uint *)((long)puVar30 + lVar40);
              *(uint **)((long)p + 0x4a0) = puVar20;
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              uStack_88 = puVar30;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar11 = *(uint *)((long)p + 0x510);
                uVar43 = *(uint *)((long)p + 0x514);
                uStack_60 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                pdVar25 = prVar32->m_pDecode_tables;
                goto LAB_0011a1c0;
              }
LAB_0011a2e4:
              *plVar19 = (long)uStack_88 - (long)puVar30;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x1e6;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x206) {
              puVar30 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar30;
              *(uint **)((long)p + 0x498) = puVar30;
              *(long *)((long)p + 0x4a8) = lVar40;
              puVar20 = (uint *)((long)puVar30 + lVar40);
              *(uint **)((long)p + 0x4a0) = puVar20;
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              uStack_88 = puVar30;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                uVar14 = *(uint *)((long)p + 0x4f6c);
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar11 = *(uint *)((long)p + 0x510);
                uVar43 = *(uint *)((long)p + 0x514);
                uStack_60 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                pdVar25 = prVar32->m_pDecode_tables;
                goto LAB_0011a365;
              }
LAB_0011a4ad:
              *plVar19 = (long)uStack_88 - (long)puVar30;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x206;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x21c) {
              uStack_88 = *(uint **)((long)p + 0x550);
              lVar40 = **(long **)((long)p + 0x558);
              *(uint **)((long)p + 0x490) = uStack_88;
              *(uint **)((long)p + 0x498) = uStack_88;
              *(long *)((long)p + 0x4a8) = lVar40;
              *(byte **)((long)p + 0x4a0) = (byte *)(lVar40 + (long)uStack_88);
              *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
              pvVar29 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
              *(void **)((long)p + 0x4f50) = pvVar29;
              uVar26 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
              *(ulong *)((long)p + 0x4f58) = uVar26;
              if (uVar26 == 0) {
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                uVar11 = *(uint *)((long)p + 0x510);
                uStack_90._4_4_ = *(uint *)((long)p + 0x514);
                uStack_60 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                puStack_78 = (uint *)0x0;
                goto LAB_00119c93;
              }
              goto LAB_00117afa;
            }
            if (iVar44 == 0x22b) {
              uStack_88 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = uStack_88;
              *(uint **)((long)p + 0x498) = uStack_88;
              *(long *)((long)p + 0x4a8) = lVar40;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              puVar20 = uStack_88;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                uVar14 = *(uint *)((long)p + 0x4f70);
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar11 = *(uint *)((long)p + 0x510);
                uVar36 = *(uint *)((long)p + 0x514);
                uVar26 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                if (0 < lVar40) goto LAB_00116adf;
                uVar28 = 0;
                goto LAB_00116ae8;
              }
LAB_00118151:
              *plVar19 = (long)uStack_88 - (long)puVar20;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x22b;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x22e) {
              uStack_88 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = uStack_88;
              *(uint **)((long)p + 0x498) = uStack_88;
              *(long *)((long)p + 0x4a8) = lVar40;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              puVar20 = uStack_88;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                uVar14 = *(uint *)((long)p + 0x4f70);
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar43 = *(uint *)((long)p + 0x510);
                uVar36 = *(uint *)((long)p + 0x514);
                uVar26 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                uVar11 = (uint)uStack_90;
                if (0 < lVar40) goto LAB_0011783f;
                uVar28 = 0;
                goto LAB_00117848;
              }
LAB_00118282:
              *plVar19 = (long)uStack_88 - (long)puVar20;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x22e;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x231) {
              uStack_88 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = uStack_88;
              *(uint **)((long)p + 0x498) = uStack_88;
              *(long *)((long)p + 0x4a8) = lVar40;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              puVar20 = uStack_88;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                uVar14 = *(uint *)((long)p + 0x4f70);
                iVar44 = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar13 = *(uint *)((long)p + 0x510);
                uVar36 = *(uint *)((long)p + 0x514);
                uVar26 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                if (0 < lVar40) goto LAB_00116e19;
                uVar28 = 0;
                goto LAB_00116e1f;
              }
LAB_0011819c:
              *plVar19 = (long)uStack_88 - (long)puVar20;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x231;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x238) {
              uStack_88 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = uStack_88;
              *(uint **)((long)p + 0x498) = uStack_88;
              *(long *)((long)p + 0x4a8) = lVar40;
              puVar20 = (uint *)((long)uStack_88 + lVar40);
              *(uint **)((long)p + 0x4a0) = puVar20;
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              puVar30 = uStack_88;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                uVar14 = *(uint *)((long)p + 0x4f70);
                iVar44 = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar13 = *(uint *)((long)p + 0x510);
                uStack_90._4_4_ = *(uint *)((long)p + 0x514);
                uStack_60 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                pdVar25 = prVar32->m_pDecode_tables;
                goto LAB_0011a5e9;
              }
LAB_0011a6ab:
              *plVar19 = (long)uStack_88 - (long)puVar30;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x238;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x240) {
              puVar30 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar30;
              *(uint **)((long)p + 0x498) = puVar30;
              *(long *)((long)p + 0x4a8) = lVar40;
              puVar20 = (uint *)((long)puVar30 + lVar40);
              *(uint **)((long)p + 0x4a0) = puVar20;
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              uStack_88 = puVar30;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                uVar14 = *(uint *)((long)p + 0x4f70);
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar43 = *(uint *)((long)p + 0x510);
                uStack_90._4_4_ = *(uint *)((long)p + 0x514);
                uStack_60 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                pdVar25 = prVar32->m_pDecode_tables;
                uVar11 = (uint)uStack_90;
                goto LAB_0011a6e1;
              }
LAB_0011a933:
              *plVar19 = (long)uStack_88 - (long)puVar30;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x240;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x243) {
              puVar20 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar20;
              *(uint **)((long)p + 0x498) = puVar20;
              *(long *)((long)p + 0x4a8) = lVar40;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              uStack_88 = puVar20;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                uVar14 = *(uint *)((long)p + 0x4f70);
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar43 = *(uint *)((long)p + 0x510);
                uStack_90._4_4_ = *(uint *)((long)p + 0x514);
                uVar26 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                if (0 < lVar40) goto LAB_00117464;
                uVar28 = 0;
                goto LAB_0011746a;
              }
LAB_00118234:
              *plVar19 = (long)uStack_88 - (long)puVar20;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x243;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x24c) {
              puVar20 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar20;
              *(uint **)((long)p + 0x498) = puVar20;
              *(long *)((long)p + 0x4a8) = lVar40;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              uStack_88 = puVar20;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                uVar14 = *(uint *)((long)p + 0x4f70);
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iVar42 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar43 = *(uint *)((long)p + 0x510);
                uVar36 = *(uint *)((long)p + 0x514);
                uStack_60 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                if (0 < lVar40) goto LAB_00116ceb;
                uVar26 = 0;
                goto LAB_00116cf5;
              }
LAB_0011817c:
              *plVar19 = (long)uStack_88 - (long)puVar20;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x24c;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x266) {
              puVar30 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar30;
              *(uint **)((long)p + 0x498) = puVar30;
              *(long *)((long)p + 0x4a8) = lVar40;
              puVar20 = (uint *)((long)puVar30 + lVar40);
              *(uint **)((long)p + 0x4a0) = puVar20;
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              uStack_88 = puVar30;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                uVar14 = *(uint *)((long)p + 0x4f70);
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar11 = *(uint *)((long)p + 0x510);
                uStack_90._4_4_ = *(uint *)((long)p + 0x514);
                uStack_60 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                pdVar25 = prVar32->m_pDecode_tables;
                goto LAB_0011aa0f;
              }
LAB_0011ab67:
              *plVar19 = (long)uStack_88 - (long)puVar30;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x266;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x285) {
              puVar30 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar30;
              *(uint **)((long)p + 0x498) = puVar30;
              *(long *)((long)p + 0x4a8) = lVar40;
              puVar20 = (uint *)((long)puVar30 + lVar40);
              *(uint **)((long)p + 0x4a0) = puVar20;
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              uStack_88 = puVar30;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                iVar44 = *(int *)((long)p + 0x4f70);
                uVar43 = *(uint *)((long)p + 0x4f74);
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar11 = *(uint *)((long)p + 0x510);
                uStack_90._4_4_ = *(uint *)((long)p + 0x514);
                uStack_60 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                pdVar25 = prVar32->m_pDecode_tables;
                goto LAB_0011aced;
              }
LAB_0011af90:
              *plVar19 = (long)uStack_88 - (long)puVar30;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x285;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x295) {
              puVar20 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar20;
              *(uint **)((long)p + 0x498) = puVar20;
              *(long *)((long)p + 0x4a8) = lVar40;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              uStack_88 = puVar20;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                uVar14 = *(uint *)((long)p + 0x4f70);
                uVar43 = *(uint *)((long)p + 0x4f74);
                uVar36 = *(uint *)((long)p + 0x4f7c);
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar11 = *(uint *)((long)p + 0x510);
                uStack_90._4_4_ = *(uint *)((long)p + 0x514);
                uStack_60 = *(ulong *)((long)p + 0x4c8);
                uVar13 = *(uint *)((long)p + 0x4d0);
                if (0 < lVar40) goto LAB_0011725c;
                uVar26 = 0;
                goto LAB_0011726a;
              }
LAB_00118209:
              *plVar19 = (long)uStack_88 - (long)puVar20;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x295;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x29c) {
              puVar20 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar20;
              *(uint **)((long)p + 0x498) = puVar20;
              *(long *)((long)p + 0x4a8) = lVar40;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar20 + lVar40);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              uStack_88 = puVar20;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                uVar14 = *(uint *)((long)p + 0x4f70);
                uVar43 = *(uint *)((long)p + 0x4f74);
                uVar36 = *(uint *)((long)p + 0x4f7c);
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar11 = *(uint *)((long)p + 0x510);
                uStack_90._4_4_ = *(uint *)((long)p + 0x514);
                uStack_60 = *(ulong *)((long)p + 0x4c8);
                uVar37 = *(uint *)((long)p + 0x4d0);
                if (0 < lVar40) goto LAB_00116f43;
                uVar26 = 0;
                goto LAB_00116f4d;
              }
LAB_001181bc:
              *plVar19 = (long)uStack_88 - (long)puVar20;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x29c;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x2a5) {
              puVar20 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar40 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar20;
              *(uint **)((long)p + 0x498) = puVar20;
              *(long *)((long)p + 0x4a8) = lVar40;
              uStack_88 = (uint *)((long)puVar20 + lVar40);
              *(uint **)((long)p + 0x4a0) = uStack_88;
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              puVar30 = puVar20;
              if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                uVar14 = *(uint *)((long)p + 0x4f70);
                uVar43 = *(uint *)((long)p + 0x4f74);
                iVar44 = *(int *)((long)p + 0x4f78);
                iStack_ac = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iStack_a8 = *(int *)((long)p + 0x4f34);
                iStack_a4 = *(int *)((long)p + 0x4f38);
                uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                uStack_9c = *(uint *)((long)p + 0x4f44);
                uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                uVar11 = *(uint *)((long)p + 0x510);
                uStack_90._4_4_ = *(uint *)((long)p + 0x514);
                uStack_60 = *(ulong *)((long)p + 0x4c8);
                uVar13 = *(uint *)((long)p + 0x4d0);
                prVar32 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
                pdVar25 = prVar32->m_pDecode_tables;
                goto LAB_0011b320;
              }
LAB_0011b412:
              *plVar19 = (long)puVar30 - (long)puVar20;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x2a5;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar44 == 0x2c2) {
              *(undefined4 *)p = 0x2c2;
              return LZHAM_DECOMP_STATUS_FAILED_BAD_CODE;
            }
            if (iVar44 != 0x2df) {
              if (iVar44 == 0x325) {
                uStack_88 = *(uint **)((long)p + 0x550);
                plVar19 = *(long **)((long)p + 0x558);
                lVar40 = *plVar19;
                *(uint **)((long)p + 0x490) = uStack_88;
                *(uint **)((long)p + 0x498) = uStack_88;
                *(long *)((long)p + 0x4a8) = lVar40;
                *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_88 + lVar40);
                *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
                puVar20 = uStack_88;
                if ((lVar40 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                  iStack_ac = *(int *)((long)p + 0x4f2c);
                  iStack_a0 = *(int *)((long)p + 0x4f30);
                  iStack_a8 = *(int *)((long)p + 0x4f34);
                  iStack_a4 = *(int *)((long)p + 0x4f38);
                  uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
                  uStack_9c = *(uint *)((long)p + 0x4f44);
                  uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
                  puStack_78 = (uint *)(ulong)*(uint *)((long)p + 0x4f18);
                  uVar11 = *(uint *)((long)p + 0x510);
                  uStack_90._4_4_ = *(uint *)((long)p + 0x514);
                  uStack_60 = *(ulong *)((long)p + 0x4c8);
                  uVar37 = *(uint *)((long)p + 0x4d0);
                  if (0 < lVar40) goto LAB_0011702d;
                  uVar27 = 0;
                  goto LAB_00117033;
                }
LAB_001181e6:
                *plVar19 = (long)uStack_88 - (long)puVar20;
                **(undefined8 **)((long)p + 0x568) = 0;
                *(undefined4 *)p = 0x325;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              if (iVar44 == 0) {
                puStack_78 = (uint *)0x0;
                bVar8 = symbol_codec::start_decoding
                                  ((symbol_codec *)((long)p + 0x490),*(uint8 **)((long)p + 0x550),
                                   **(size_t **)((long)p + 0x558),*(bool *)((long)p + 0x570),
                                   (need_bytes_func_ptr)0x0,(void *)0x0);
                if (!bVar8) {
                  return LZHAM_DECOMP_STATUS_FAILED;
                }
                uVar11 = *(uint *)((long)p + 0x510);
                uStack_88 = *(uint **)((long)p + 0x498);
                uStack_60 = *(ulong *)((long)p + 0x4c8);
                iVar44 = *(int *)((long)p + 0x4d0);
                uStack_90 = (ulong)*(uint *)((long)p + 0x514) << 0x20;
                uStack_9c = 0;
                uStack_70._4_4_ = 0;
                iStack_a4 = 0;
                iStack_a8 = 0;
                iStack_a0 = 0;
                iStack_ac = 0;
                while( true ) {
                  if (1 < iVar44) break;
                  uVar22 = uStack_90._4_4_;
                  if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
                    uVar27 = 0;
                    if (*(char *)((long)p + 0x4b0) == '\0') {
                      *(uint *)((long)p + 0x510) = uVar11;
                      *(uint *)((long)p + 0x514) = uStack_90._4_4_;
                      *(ulong *)((long)p + 0x4c8) = uStack_60;
                      *(int *)((long)p + 0x4d0) = iVar44;
                      *(uint **)((long)p + 0x498) = uStack_88;
                      *(int *)((long)p + 0x4f2c) = iStack_ac;
                      *(int *)((long)p + 0x4f30) = iStack_a0;
                      *(int *)((long)p + 0x4f34) = iStack_a8;
                      *(int *)((long)p + 0x4f38) = iStack_a4;
                      *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                      *(uint *)((long)p + 0x4f44) = uStack_9c;
                      *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                      *(int *)((long)p + 0x4f18) = (int)puStack_78;
                      plVar19 = *(long **)((long)p + 0x558);
                      puVar20 = *(uint **)((long)p + 0x490);
                      goto LAB_00118257;
                    }
                  }
                  else {
LAB_00117603:
                    uStack_90 = CONCAT44(uVar22,(uint)uStack_90);
                    uVar27 = (ulong)(byte)*uStack_88;
                    uStack_88 = (uint *)((long)uStack_88 + 1);
                  }
LAB_0011760d:
                  cVar9 = (char)iVar44;
                  iVar44 = iVar44 + 8;
                  uStack_60 = uStack_60 | uVar27 << (0x38U - cVar9 & 0x3f);
                }
                uStack_60 = uStack_60 * 4;
                for (lVar40 = 0; lVar40 != 0x2000; lVar40 = lVar40 + 0x80) {
                  raw_quasi_adaptive_huffman_data_model::init
                            ((raw_quasi_adaptive_huffman_data_model *)((long)p + lVar40 + 0x5a0),
                             (EVP_PKEY_CTX *)0x0);
                }
                for (lVar40 = 0; lVar40 != 0x2000; lVar40 = lVar40 + 0x80) {
                  raw_quasi_adaptive_huffman_data_model::init
                            ((raw_quasi_adaptive_huffman_data_model *)((long)p + lVar40 + 0x25a0),
                             (EVP_PKEY_CTX *)0x0);
                }
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x45a0),
                           (EVP_PKEY_CTX *)0x0);
                prVar32 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4620);
                lVar40 = 2;
                while (bVar8 = lVar40 != 0, lVar40 = lVar40 + -1, bVar8) {
                  raw_quasi_adaptive_huffman_data_model::init(prVar32,(EVP_PKEY_CTX *)0x0);
                  raw_quasi_adaptive_huffman_data_model::init
                            ((raw_quasi_adaptive_huffman_data_model *)&prVar32[3].m_codes,
                             (EVP_PKEY_CTX *)0x0);
                  prVar32 = (raw_quasi_adaptive_huffman_data_model *)&prVar32[1].m_pDecode_tables;
                }
                uVar37 = iVar44 - 2;
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4820),
                           (EVP_PKEY_CTX *)0x0);
                goto LAB_00119673;
              }
              goto switchD_00115eb3_caseD_338;
            }
            uStack_88 = *(uint **)((long)p + 0x550);
            lVar40 = **(long **)((long)p + 0x558);
            *(uint **)((long)p + 0x490) = uStack_88;
            *(uint **)((long)p + 0x498) = uStack_88;
            *(long *)((long)p + 0x4a8) = lVar40;
            *(byte **)((long)p + 0x4a0) = (byte *)(lVar40 + (long)uStack_88);
            *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
            pvVar29 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
            *(void **)((long)p + 0x4f50) = pvVar29;
            uVar26 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
            *(ulong *)((long)p + 0x4f58) = uVar26;
            if (uVar26 == 0) {
              uVar14 = *(uint *)((long)p + 0x4f70);
              uVar26 = (ulong)*(uint *)((long)p + 0x4f80);
              pbVar24 = *(byte **)((long)p + 0x4f88);
              iStack_ac = *(int *)((long)p + 0x4f2c);
              iStack_a0 = *(int *)((long)p + 0x4f30);
              iStack_a8 = *(int *)((long)p + 0x4f34);
              iStack_a4 = *(int *)((long)p + 0x4f38);
              uStack_70._4_4_ = *(uint *)((long)p + 0x4f3c);
              uVar11 = *(uint *)((long)p + 0x510);
              uStack_90._4_4_ = *(uint *)((long)p + 0x514);
              uStack_60 = *(ulong *)((long)p + 0x4c8);
              uVar37 = *(uint *)((long)p + 0x4d0);
              uVar28 = 0;
              uStack_90._0_4_ = *(uint *)((long)p + 0x4f48);
              uVar43 = *(uint *)((long)p + 0x4f44);
              goto LAB_0011b468;
            }
LAB_001170e0:
            uVar27 = **(ulong **)((long)p + 0x568);
            if (uVar26 < **(ulong **)((long)p + 0x568)) {
              uVar27 = uVar26;
            }
            *(ulong *)((long)p + 0x4f60) = uVar27;
            if (*(int *)((long)p + 0x594) == 0) {
              memcpy(*(void **)((long)p + 0x560),pvVar29,uVar27);
            }
            else {
              for (uVar26 = 0; sVar41 = uVar27 - uVar26, uVar26 <= uVar27 && sVar41 != 0;
                  uVar26 = uVar26 + sVar41) {
                if (0x1fff < sVar41) {
                  sVar41 = 0x2000;
                }
                memcpy((void *)(*(long *)((long)p + 0x560) + uVar26),
                       (void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41);
                uVar12 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41,
                                 *(uint *)((long)p + 0x548));
                *(uint *)((long)p + 0x548) = uVar12;
                uVar27 = *(ulong *)((long)p + 0x4f60);
              }
            }
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
            *(undefined4 *)p = 0x2df;
          }
        }
        goto LAB_001198ea;
      }
      goto LAB_0011993f;
    }
    goto LAB_00119780;
  }
  return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
LAB_001110cc:
  if (7 < iVar44) goto code_r0x001110d6;
  if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
    uVar26 = 0;
    if (*(char *)((long)p + 0x4b0) == '\0') {
      *(uint *)((long)p + 0x510) = uVar22;
      *(uint *)((long)p + 0x514) = uStack_7c;
      *(ulong *)((long)p + 0x4c8) = uVar28;
      *(int *)((long)p + 0x4d0) = iVar44;
      *(uint **)((long)p + 0x498) = puStack_78;
      *(undefined4 *)((long)p + 0x4f2c) = uVar33;
      *(int *)((long)p + 0x4f30) = iStack_98;
      *(uint *)((long)p + 0x4f34) = uStack_9c;
      *(int *)((long)p + 0x4f38) = iStack_94;
      *(undefined4 *)((long)p + 0x4f3c) = uVar39;
      *(undefined4 *)((long)p + 0x4f44) = uVar31;
      *(undefined4 *)((long)p + 0x4f48) = uVar35;
      *(int *)((long)p + 0x4f18) = (int)uStack_58;
      puVar20 = *(uint **)((long)p + 0x490);
      plVar19 = *(long **)((long)p + 0x558);
      puVar16 = *(ulong **)((long)p + 0x568);
      goto LAB_00112b39;
    }
  }
  else {
LAB_001110b1:
    uVar26 = (ulong)(byte)*puStack_78;
    puStack_78 = (uint *)((long)puStack_78 + 1);
  }
LAB_001110b7:
  cVar9 = (char)iVar44;
  iVar44 = iVar44 + 8;
  uVar28 = uVar28 | uVar26 << (0x38U - cVar9 & 0x3f);
  goto LAB_001110cc;
code_r0x001110d6:
  uVar26 = uVar28 << 8;
  uVar22 = (uint)(uVar28 >> 0x28) & 0xff0000 | uVar22;
  for (iVar44 = iVar44 + -8; iVar44 < 8; iVar44 = iVar44 + 8) {
    if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
      uVar28 = 0;
      if (*(char *)((long)p + 0x4b0) == '\0') {
        *(uint *)((long)p + 0x510) = uVar22;
        *(uint *)((long)p + 0x514) = uStack_7c;
        *(ulong *)((long)p + 0x4c8) = uVar26;
        *(int *)((long)p + 0x4d0) = iVar44;
        *(uint **)((long)p + 0x498) = puStack_78;
        *(undefined4 *)((long)p + 0x4f2c) = uVar33;
        *(int *)((long)p + 0x4f30) = iStack_98;
        *(uint *)((long)p + 0x4f34) = uStack_9c;
        *(int *)((long)p + 0x4f38) = iStack_94;
        *(undefined4 *)((long)p + 0x4f3c) = uVar39;
        *(undefined4 *)((long)p + 0x4f44) = uVar31;
        *(undefined4 *)((long)p + 0x4f48) = uVar35;
        *(int *)((long)p + 0x4f18) = (int)uStack_58;
        puVar20 = *(uint **)((long)p + 0x490);
        plVar19 = *(long **)((long)p + 0x558);
        puVar16 = *(ulong **)((long)p + 0x568);
        goto LAB_00112aee;
      }
    }
    else {
LAB_00110f0c:
      uVar28 = (ulong)(byte)*puStack_78;
      puStack_78 = (uint *)((long)puStack_78 + 1);
    }
LAB_00110f12:
    uVar26 = uVar26 | uVar28 << (0x38U - (char)iVar44 & 0x3f);
  }
  uVar28 = uVar26 << 8;
  uVar22 = (ushort)(uVar26 >> 0x30) & 0xff00 | uVar22;
  for (iVar44 = iVar44 + -8; iVar44 < 8; iVar44 = iVar44 + 8) {
    if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
      uVar26 = 0;
      if (*(char *)((long)p + 0x4b0) == '\0') {
        *(uint *)((long)p + 0x510) = uVar22;
        *(uint *)((long)p + 0x514) = uStack_7c;
        *(ulong *)((long)p + 0x4c8) = uVar28;
        *(int *)((long)p + 0x4d0) = iVar44;
        *(uint **)((long)p + 0x498) = puStack_78;
        *(undefined4 *)((long)p + 0x4f2c) = uVar33;
        *(int *)((long)p + 0x4f30) = iStack_98;
        *(uint *)((long)p + 0x4f34) = uStack_9c;
        *(int *)((long)p + 0x4f38) = iStack_94;
        *(undefined4 *)((long)p + 0x4f3c) = uVar39;
        *(undefined4 *)((long)p + 0x4f44) = uVar31;
        *(undefined4 *)((long)p + 0x4f48) = uVar35;
        *(int *)((long)p + 0x4f18) = (int)uStack_58;
        plVar19 = *(long **)((long)p + 0x558);
        puVar16 = *(ulong **)((long)p + 0x568);
        puVar20 = *(uint **)((long)p + 0x490);
        goto LAB_00112b07;
      }
    }
    else {
LAB_00113c49:
      uVar26 = (ulong)(byte)*puStack_78;
      puStack_78 = (uint *)((long)puStack_78 + 1);
    }
LAB_00113c53:
    uVar28 = uVar28 | uVar26 << (0x38U - (char)iVar44 & 0x3f);
  }
  uVar26 = uVar28 << 8;
  uVar43 = iVar44 - 8;
  uVar22 = uVar22 | (byte)(uVar28 >> 0x38);
  *(int *)((long)p + 0x4f40) = (int)uStack_58;
  uVar37 = 0;
LAB_00113c2c:
  uStack_88._4_4_ = 0;
  iStack_94 = 1;
  iStack_98 = 1;
  uStack_9c = 1;
  iVar42 = 1;
  uVar11 = 0;
  uVar14 = uVar22;
LAB_00114439:
  do {
    while( true ) {
      puVar18 = (ushort *)((long)p + (ulong)(uVar11 * 0x40 + (uVar37 >> 2)) * 2 + 0x48a0);
      for (; uStack_7c < 0x1000000; uStack_7c = uStack_7c << 8) {
        *(ushort **)((long)p + 0x528) = puVar18;
        uVar28 = uVar26;
        for (; (int)uVar43 < 8; uVar43 = uVar43 + 8) {
          if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(uint *)((long)p + 0x510) = uVar14;
              *(uint *)((long)p + 0x514) = uStack_7c;
              *(ulong *)((long)p + 0x4c8) = uVar28;
              *(uint *)((long)p + 0x4d0) = uVar43;
              *(uint **)((long)p + 0x498) = puStack_78;
              *(int *)((long)p + 0x4f2c) = iVar42;
              *(int *)((long)p + 0x4f30) = iStack_98;
              *(uint *)((long)p + 0x4f34) = uStack_9c;
              *(int *)((long)p + 0x4f38) = iStack_94;
              *(uint *)((long)p + 0x4f3c) = uVar11;
              *(uint *)((long)p + 0x4f44) = uVar37;
              *(uint *)((long)p + 0x4f48) = uStack_88._4_4_;
              *(int *)((long)p + 0x4f18) = (int)uStack_58;
              plVar19 = *(long **)((long)p + 0x558);
              puVar16 = *(ulong **)((long)p + 0x568);
              puVar20 = *(uint **)((long)p + 0x490);
              goto LAB_00112d8d;
            }
LAB_00113b12:
            uVar26 = 0;
          }
          else {
LAB_00112360:
            uVar26 = (ulong)(byte)*puStack_78;
            puStack_78 = (uint *)((long)puStack_78 + 1);
          }
          uVar28 = uVar28 | uVar26 << (0x38U - (char)uVar43 & 0x3f);
        }
        uVar26 = uVar28 << 8;
        uVar43 = uVar43 - 8;
        puVar18 = *(ushort **)((long)p + 0x528);
        uVar14 = uVar14 << 8 | (uint)(byte)(uVar28 >> 0x38);
      }
      uVar4 = *puVar18;
      uVar36 = (uStack_7c >> 0xb) * (uint)uVar4;
      uVar22 = uVar14 - uVar36;
      if (uVar36 <= uVar14) break;
      *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
      if (uVar27 <= (uStack_58 & 0xffffffff)) {
        *(uint *)((long)p + 0x510) = uVar14;
        *(uint *)((long)p + 0x514) = uVar36;
        *(ulong *)((long)p + 0x4c8) = uVar26;
        *(uint *)((long)p + 0x4d0) = uVar43;
        *(uint **)((long)p + 0x498) = puStack_78;
        **(long **)((long)p + 0x558) = (long)puStack_78 - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        goto LAB_00114769;
      }
      if (uVar11 < 7) {
        uVar22 = uStack_88._4_4_ >> 2 & 0x3ffffff8 | uVar37 >> 5;
        prVar32 = (raw_quasi_adaptive_huffman_data_model *)((long)p + (ulong)uVar22 * 0x80 + 0x5a0);
        pdVar25 = *(decoder_tables **)((long)p + (ulong)uVar22 * 0x80 + 0x5d0);
        if ((int)uVar43 < 0x18) {
          puVar20 = *(uint **)((long)p + 0x4a0);
          uVar22 = uStack_88._4_4_;
          uStack_88._4_4_ = uVar37;
          if (puStack_78 + 1 < puVar20) {
            uVar22 = *puStack_78;
            uVar43 = uVar43 + 0x20;
            uVar26 = uVar26 | (ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 |
                                      (uVar22 & 0xff00) << 8 | uVar22 << 0x18) <<
                              (-(char)uVar43 & 0x3fU);
            puStack_78 = puStack_78 + 1;
          }
          else {
            for (; uVar37 = uStack_88._4_4_, (int)uVar43 < 0x18; uVar43 = uVar43 + 8) {
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
                *(uint *)((long)p + 0x510) = uVar14;
                *(uint *)((long)p + 0x514) = uVar36;
                *(ulong *)((long)p + 0x4c8) = uVar26;
                *(uint *)((long)p + 0x4d0) = uVar43;
                *(uint **)((long)p + 0x498) = puStack_78;
                *(int *)((long)p + 0x4f2c) = iVar42;
                *(int *)((long)p + 0x4f30) = iStack_98;
                *(uint *)((long)p + 0x4f34) = uStack_9c;
                *(int *)((long)p + 0x4f38) = iStack_94;
                *(uint *)((long)p + 0x4f3c) = uVar11;
                *(uint *)((long)p + 0x4f44) = uStack_88._4_4_;
                *(uint *)((long)p + 0x4f48) = uVar22;
                *(int *)((long)p + 0x4f18) = (int)uStack_58;
                plVar19 = *(long **)((long)p + 0x558);
                puVar16 = *(ulong **)((long)p + 0x568);
                puVar30 = *(uint **)((long)p + 0x490);
                goto LAB_00114a49;
              }
LAB_0011492c:
              uVar28 = 0;
              if (puStack_78 < puVar20) {
                uVar28 = (ulong)(byte)*puStack_78;
                puStack_78 = (uint *)((long)puStack_78 + 1);
              }
              uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar43 & 0x3f);
            }
          }
        }
        uStack_88._4_4_ = uVar37;
        uVar22 = (uint)(ushort)(uVar26 >> 0x30);
        if (uVar22 < pdVar25->m_table_max_code) {
          uVar37 = pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff;
          uVar22 = pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
        }
        else {
          iVar44 = pdVar25->m_decode_start_code_size - 0x41;
          do {
            iVar23 = iVar44;
            iVar44 = iVar23 + 1;
          } while (pdVar25->m_max_codes[iVar23 + 0x40U] <= uVar22);
          uVar37 = (int)(uVar26 >> (-(char)(iVar23 + 1) & 0x3fU)) +
                   pdVar25->m_val_ptrs[iVar23 + 0x40U];
          uVar22 = 0;
          if (uVar37 < prVar32->m_total_syms) {
            uVar22 = uVar37;
          }
          uVar37 = (uint)pdVar25->m_sorted_symbol_order[(int)uVar22];
          uVar22 = iVar23 + 0x41;
        }
        uVar26 = uVar26 << ((byte)uVar22 & 0x3f);
        puVar2 = (prVar32->m_sym_freq).m_p + uVar37;
        *puVar2 = *puVar2 + 1;
        uVar43 = uVar43 - uVar22;
        puVar1 = &prVar32->m_symbols_until_update;
        *puVar1 = *puVar1 - 1;
        uStack_7c = uVar36;
        if (*puVar1 == 0) {
          raw_quasi_adaptive_huffman_data_model::update(prVar32);
        }
      }
      else {
        uVar13 = (int)uStack_58 - iVar42;
        uVar22 = (uint)pbVar6[uVar13];
        uVar13 = (pbVar6[uVar13 - 1] >> 2 & 0x38 | (uint)(pbVar6[uVar13] >> 5)) << 7;
        prVar32 = (raw_quasi_adaptive_huffman_data_model *)((long)p + (ulong)uVar13 + 0x25a0);
        pdVar25 = *(decoder_tables **)((long)p + (ulong)uVar13 + 0x25d0);
        if ((int)uVar43 < 0x18) {
          puVar20 = *(uint **)((long)p + 0x4a0);
          uVar13 = uStack_88._4_4_;
          uStack_88._4_4_ = uVar37;
          if (puStack_78 + 1 < puVar20) {
            uVar13 = *puStack_78;
            uVar43 = uVar43 + 0x20;
            uVar26 = uVar26 | (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 |
                                      (uVar13 & 0xff00) << 8 | uVar13 << 0x18) <<
                              (-(char)uVar43 & 0x3fU);
            puStack_78 = puStack_78 + 1;
          }
          else {
            for (; uVar37 = uStack_88._4_4_, (int)uVar43 < 0x18; uVar43 = uVar43 + 8) {
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
                *(uint *)((long)p + 0x510) = uVar14;
                *(uint *)((long)p + 0x514) = uVar36;
                *(ulong *)((long)p + 0x4c8) = uVar26;
                *(uint *)((long)p + 0x4d0) = uVar43;
                *(uint **)((long)p + 0x498) = puStack_78;
                *(uint *)((long)p + 0x4f6c) = uVar22;
                *(int *)((long)p + 0x4f2c) = iVar42;
                *(int *)((long)p + 0x4f30) = iStack_98;
                *(uint *)((long)p + 0x4f34) = uStack_9c;
                *(int *)((long)p + 0x4f38) = iStack_94;
                *(uint *)((long)p + 0x4f3c) = uVar11;
                *(uint *)((long)p + 0x4f44) = uStack_88._4_4_;
                *(uint *)((long)p + 0x4f48) = uVar13;
                *(int *)((long)p + 0x4f18) = (int)uStack_58;
                plVar19 = *(long **)((long)p + 0x558);
                puVar16 = *(ulong **)((long)p + 0x568);
                puVar30 = *(uint **)((long)p + 0x490);
                goto LAB_00114c55;
              }
LAB_00114b09:
              uVar28 = 0;
              if (puStack_78 < puVar20) {
                uVar28 = (ulong)(byte)*puStack_78;
                puStack_78 = (uint *)((long)puStack_78 + 1);
              }
              uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar43 & 0x3f);
            }
          }
        }
        uStack_88._4_4_ = uVar37;
        uVar37 = (uint)(ushort)(uVar26 >> 0x30);
        if (uVar37 < pdVar25->m_table_max_code) {
          uVar37 = pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff;
          uVar13 = pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
        }
        else {
          iVar44 = pdVar25->m_decode_start_code_size - 0x41;
          do {
            iVar23 = iVar44;
            iVar44 = iVar23 + 1;
          } while (pdVar25->m_max_codes[iVar23 + 0x40U] <= uVar37);
          uVar13 = (int)(uVar26 >> (-(char)(iVar23 + 1) & 0x3fU)) +
                   pdVar25->m_val_ptrs[iVar23 + 0x40U];
          uVar37 = 0;
          if (uVar13 < prVar32->m_total_syms) {
            uVar37 = uVar13;
          }
          uVar37 = (uint)pdVar25->m_sorted_symbol_order[(int)uVar37];
          uVar13 = iVar23 + 0x41;
        }
        uVar26 = uVar26 << ((byte)uVar13 & 0x3f);
        puVar2 = (prVar32->m_sym_freq).m_p + uVar37;
        *puVar2 = *puVar2 + 1;
        uVar43 = uVar43 - uVar13;
        puVar1 = &prVar32->m_symbols_until_update;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          raw_quasi_adaptive_huffman_data_model::update(prVar32);
        }
        uVar37 = uVar37 ^ uVar22;
        uStack_7c = uVar36;
      }
      pbVar6[uStack_58 & 0xffffffff] = (byte)uVar37;
      uVar11 = (uint)(byte)s_literal_next_state[uVar11];
      uStack_58 = (ulong)((int)uStack_58 + 1);
    }
    *puVar18 = uVar4 - (uVar4 >> 5);
    puVar18 = (ushort *)((long)p + (ulong)uVar11 * 2 + 0x4ea0);
    uStack_88._0_4_ = 1;
    for (uVar36 = uStack_7c - uVar36; uVar36 < 0x1000000; uVar36 = uVar36 << 8) {
      *(ushort **)((long)p + 0x528) = puVar18;
      uVar28 = uVar26;
      for (; (int)uVar43 < 8; uVar43 = uVar43 + 8) {
        if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
          uVar26 = 0;
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar22;
            *(uint *)((long)p + 0x514) = uVar36;
            *(ulong *)((long)p + 0x4c8) = uVar28;
            *(uint *)((long)p + 0x4d0) = uVar43;
            *(uint **)((long)p + 0x498) = puStack_78;
            *(uint *)((long)p + 0x4f70) = (uint)uStack_88;
            *(int *)((long)p + 0x4f2c) = iVar42;
            *(int *)((long)p + 0x4f30) = iStack_98;
            *(uint *)((long)p + 0x4f34) = uStack_9c;
            *(int *)((long)p + 0x4f38) = iStack_94;
            *(uint *)((long)p + 0x4f3c) = uVar11;
            *(uint *)((long)p + 0x4f44) = uVar37;
            *(uint *)((long)p + 0x4f48) = uStack_88._4_4_;
            *(int *)((long)p + 0x4f18) = (int)uStack_58;
            puVar20 = *(uint **)((long)p + 0x490);
            plVar19 = *(long **)((long)p + 0x558);
            puVar16 = *(ulong **)((long)p + 0x568);
            goto LAB_00112bf7;
          }
        }
        else {
LAB_0011152e:
          uVar26 = (ulong)(byte)*puStack_78;
          puStack_78 = (uint *)((long)puStack_78 + 1);
        }
LAB_00111534:
        uVar28 = uVar28 | uVar26 << (0x38U - (char)uVar43 & 0x3f);
      }
      uVar26 = uVar28 << 8;
      uVar43 = uVar43 - 8;
      puVar18 = *(ushort **)((long)p + 0x528);
      uVar22 = uVar22 << 8 | (uint)(byte)(uVar28 >> 0x38);
    }
    uVar4 = *puVar18;
    uStack_7c = (uVar36 >> 0xb) * (uint)uVar4;
    uVar13 = uVar22 - uStack_7c;
    if (uVar22 < uStack_7c) {
      *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
      prVar32 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x45a0);
      pdVar25 = *(decoder_tables **)((long)p + 0x45d0);
      if ((int)uVar43 < 0x18) {
        puVar20 = *(uint **)((long)p + 0x4a0);
        uStack_80 = uStack_88._4_4_;
        if (puStack_78 + 1 < puVar20) {
          uVar14 = *puStack_78;
          uVar43 = uVar43 + 0x20;
          uVar26 = uVar26 | (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                    (uVar14 & 0xff00) << 8 | uVar14 << 0x18) <<
                            (-(char)uVar43 & 0x3fU);
          puStack_78 = puStack_78 + 1;
        }
        else {
          for (; (int)uVar43 < 0x18; uVar43 = uVar43 + 8) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
              *(uint *)((long)p + 0x510) = uVar22;
              *(uint *)((long)p + 0x514) = uStack_7c;
              *(ulong *)((long)p + 0x4c8) = uVar26;
              *(uint *)((long)p + 0x4d0) = uVar43;
              *(uint **)((long)p + 0x498) = puStack_78;
              *(uint *)((long)p + 0x4f70) = (uint)uStack_88;
              *(int *)((long)p + 0x4f2c) = iVar42;
              *(int *)((long)p + 0x4f30) = iStack_98;
              *(uint *)((long)p + 0x4f34) = uStack_9c;
              *(int *)((long)p + 0x4f38) = iStack_94;
              *(uint *)((long)p + 0x4f3c) = uVar11;
              *(uint *)((long)p + 0x4f44) = uVar37;
              *(uint *)((long)p + 0x4f48) = uStack_80;
              *(int *)((long)p + 0x4f18) = (int)uStack_58;
              puVar30 = *(uint **)((long)p + 0x490);
              plVar19 = *(long **)((long)p + 0x558);
              puVar16 = *(ulong **)((long)p + 0x568);
              goto LAB_0011537e;
            }
LAB_00115220:
            uVar28 = 0;
            if (puStack_78 < puVar20) {
              uVar28 = (ulong)(byte)*puStack_78;
              puStack_78 = (uint *)((long)puStack_78 + 1);
            }
            uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar43 & 0x3f);
          }
        }
      }
      uStack_80 = 0;
      uVar14 = (uint)(ushort)(uVar26 >> 0x30);
      if (uVar14 < pdVar25->m_table_max_code) {
        uVar36 = pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff;
        uVar14 = pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar44 = pdVar25->m_decode_start_code_size - 0x41;
        do {
          iVar23 = iVar44;
          iVar44 = iVar23 + 1;
        } while (pdVar25->m_max_codes[iVar23 + 0x40U] <= uVar14);
        uVar36 = (int)(uVar26 >> (-(char)(iVar23 + 1) & 0x3fU)) +
                 pdVar25->m_val_ptrs[iVar23 + 0x40U];
        uVar14 = 0;
        if (uVar36 < prVar32->m_total_syms) {
          uVar14 = uVar36;
        }
        uVar36 = (uint)pdVar25->m_sorted_symbol_order[(int)uVar14];
        uVar14 = iVar23 + 0x41;
      }
      uVar26 = uVar26 << ((byte)uVar14 & 0x3f);
      puVar2 = (prVar32->m_sym_freq).m_p + uVar36;
      *puVar2 = *puVar2 + 1;
      uVar43 = uVar43 - uVar14;
      puVar1 = &prVar32->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        raw_quasi_adaptive_huffman_data_model::update(prVar32);
      }
      if (uVar36 < 2) break;
      uStack_88._0_4_ = (uVar36 - 2 & 7) + 2;
      uVar14 = (uVar36 - 2 >> 3) + 1;
      uStack_88._4_4_ = uVar37;
      if ((uint)uStack_88 == 9) {
        prVar32 = (raw_quasi_adaptive_huffman_data_model *)
                  ((long)p + (ulong)(6 < uVar11) * 0x80 + 0x4720);
        pdVar25 = *(decoder_tables **)((long)p + (ulong)(6 < uVar11) * 0x80 + 0x4750);
        iVar44 = 9;
        if ((int)uVar43 < 0x18) {
          puVar20 = *(uint **)((long)p + 0x4a0);
          iVar23 = 9;
          if (puStack_78 + 1 < puVar20) {
            uVar37 = *puStack_78;
            uVar43 = uVar43 + 0x20;
            uVar26 = uVar26 | (ulong)(uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 |
                                      (uVar37 & 0xff00) << 8 | uVar37 << 0x18) <<
                              (-(char)uVar43 & 0x3fU);
            puStack_78 = puStack_78 + 1;
          }
          else {
            for (; iVar44 = iVar23, (int)uVar43 < 0x18; uVar43 = uVar43 + 8) {
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
                *(uint *)((long)p + 0x510) = uVar22;
                *(uint *)((long)p + 0x514) = uStack_7c;
                *(ulong *)((long)p + 0x4c8) = uVar26;
                *(uint *)((long)p + 0x4d0) = uVar43;
                *(uint **)((long)p + 0x498) = puStack_78;
                *(int *)((long)p + 0x4f70) = iVar44;
                *(uint *)((long)p + 0x4f74) = uVar14;
                *(int *)((long)p + 0x4f2c) = iVar42;
                *(int *)((long)p + 0x4f30) = iStack_98;
                *(uint *)((long)p + 0x4f34) = uStack_9c;
                *(int *)((long)p + 0x4f38) = iStack_94;
                *(uint *)((long)p + 0x4f3c) = uVar11;
                *(uint *)((long)p + 0x4f44) = uStack_88._4_4_;
                *(uint *)((long)p + 0x4f48) = uStack_80;
                *(int *)((long)p + 0x4f18) = (int)uStack_58;
                puVar30 = *(uint **)((long)p + 0x490);
                plVar19 = *(long **)((long)p + 0x558);
                puVar16 = *(ulong **)((long)p + 0x568);
                goto LAB_00115772;
              }
LAB_001154db:
              uVar28 = 0;
              if (puStack_78 < puVar20) {
                uVar28 = (ulong)(byte)*puStack_78;
                puStack_78 = (uint *)((long)puStack_78 + 1);
              }
              uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar43 & 0x3f);
              iVar23 = iVar44;
            }
          }
        }
        uVar37 = (uint)(ushort)(uVar26 >> 0x30);
        if (uVar37 < pdVar25->m_table_max_code) {
          uStack_88._0_4_ =
               pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff;
          uVar37 = pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
        }
        else {
          iVar23 = pdVar25->m_decode_start_code_size - 0x41;
          do {
            iVar15 = iVar23;
            iVar23 = iVar15 + 1;
          } while (pdVar25->m_max_codes[iVar15 + 0x40U] <= uVar37);
          uVar36 = (int)(uVar26 >> (-(char)(iVar15 + 1) & 0x3fU)) +
                   pdVar25->m_val_ptrs[iVar15 + 0x40U];
          uVar37 = 0;
          if (uVar36 < prVar32->m_total_syms) {
            uVar37 = uVar36;
          }
          uStack_88._0_4_ = (uint)pdVar25->m_sorted_symbol_order[(int)uVar37];
          uVar37 = iVar15 + 0x41;
        }
        uVar26 = uVar26 << ((byte)uVar37 & 0x3f);
        puVar2 = (prVar32->m_sym_freq).m_p + (uint)uStack_88;
        *puVar2 = *puVar2 + 1;
        uVar43 = uVar43 - uVar37;
        puVar1 = &prVar32->m_symbols_until_update;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          raw_quasi_adaptive_huffman_data_model::update(prVar32);
        }
        uStack_88._0_4_ = (uint)uStack_88 + iVar44;
      }
      bVar21 = *(byte *)((long)p + (ulong)uVar14 + 0x410);
      uVar37 = (uint)bVar21;
      if (bVar21 < 3) {
        for (; (int)uVar43 < (int)uVar37; uVar43 = uVar43 + 8) {
          if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
            uVar28 = 0;
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(uint *)((long)p + 0x510) = uVar22;
              *(uint *)((long)p + 0x514) = uStack_7c;
              *(ulong *)((long)p + 0x4c8) = uVar26;
              *(uint *)((long)p + 0x4d0) = uVar43;
              *(uint **)((long)p + 0x498) = puStack_78;
              *(uint *)((long)p + 0x4f70) = (uint)uStack_88;
              *(uint *)((long)p + 0x4f74) = uVar14;
              *(uint *)((long)p + 0x4f7c) = uVar37;
              *(int *)((long)p + 0x4f2c) = iVar42;
              *(int *)((long)p + 0x4f30) = iStack_98;
              *(uint *)((long)p + 0x4f34) = uStack_9c;
              *(int *)((long)p + 0x4f38) = iStack_94;
              *(uint *)((long)p + 0x4f3c) = uVar11;
              *(uint *)((long)p + 0x4f44) = uStack_88._4_4_;
              *(uint *)((long)p + 0x4f48) = uStack_80;
              *(int *)((long)p + 0x4f18) = (int)uStack_58;
              puVar20 = *(uint **)((long)p + 0x490);
              plVar19 = *(long **)((long)p + 0x558);
              puVar16 = *(ulong **)((long)p + 0x568);
              goto LAB_00112d19;
            }
          }
          else {
LAB_00111c82:
            uVar28 = (ulong)(byte)*puStack_78;
            puStack_78 = (uint *)((long)puStack_78 + 1);
          }
LAB_00111c88:
          uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar43 & 0x3f);
        }
        iVar44 = (int)(uVar26 >> (-(byte)uVar37 & 0x3f));
        if (uVar37 == 0) {
          iVar44 = 0;
        }
        uVar26 = uVar26 << ((byte)uVar37 & 0x3f);
        uVar43 = uVar43 - uVar37;
      }
      else {
        iVar44 = 0;
        uVar36 = uVar43;
        if (4 < bVar21) {
          while( true ) {
            iVar23 = uVar37 - 4;
            uVar36 = uVar43 - iVar23;
            if (iVar23 <= (int)uVar43) break;
            if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
              uVar28 = 0;
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(uint *)((long)p + 0x510) = uVar22;
                *(uint *)((long)p + 0x514) = uStack_7c;
                *(ulong *)((long)p + 0x4c8) = uVar26;
                *(uint *)((long)p + 0x4d0) = uVar43;
                *(uint **)((long)p + 0x498) = puStack_78;
                *(uint *)((long)p + 0x4f70) = (uint)uStack_88;
                *(uint *)((long)p + 0x4f74) = uVar14;
                *(uint *)((long)p + 0x4f7c) = uVar37;
                *(int *)((long)p + 0x4f2c) = iVar42;
                *(int *)((long)p + 0x4f30) = iStack_98;
                *(uint *)((long)p + 0x4f34) = uStack_9c;
                *(int *)((long)p + 0x4f38) = iStack_94;
                *(uint *)((long)p + 0x4f3c) = uVar11;
                *(uint *)((long)p + 0x4f44) = uStack_88._4_4_;
                *(uint *)((long)p + 0x4f48) = uStack_80;
                *(int *)((long)p + 0x4f18) = (int)uStack_58;
                puVar20 = *(uint **)((long)p + 0x490);
                plVar19 = *(long **)((long)p + 0x558);
                puVar16 = *(ulong **)((long)p + 0x568);
                goto LAB_00112c4a;
              }
            }
            else {
LAB_00111970:
              uVar28 = (ulong)(byte)*puStack_78;
              puStack_78 = (uint *)((long)puStack_78 + 1);
            }
LAB_0011197a:
            cVar9 = (char)uVar43;
            uVar43 = uVar43 + 8;
            uVar26 = uVar26 | uVar28 << (0x38U - cVar9 & 0x3f);
          }
          iVar44 = (int)(uVar26 >> (0x44U - (char)uVar37 & 0x3f)) << 4;
          if (iVar23 == 0) {
            iVar44 = 0;
          }
          uVar26 = uVar26 << ((byte)iVar23 & 0x3f);
        }
        prVar32 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4820);
        pdVar25 = *(decoder_tables **)((long)p + 0x4850);
        if ((int)uVar36 < 0x18) {
          puVar20 = *(uint **)((long)p + 0x4a0);
          if (puStack_78 + 1 < puVar20) {
            uVar37 = *puStack_78;
            uVar36 = uVar36 + 0x20;
            uVar26 = uVar26 | (ulong)(uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 |
                                      (uVar37 & 0xff00) << 8 | uVar37 << 0x18) <<
                              (-(char)uVar36 & 0x3fU);
            puStack_78 = puStack_78 + 1;
          }
          else {
            for (; (int)uVar36 < 0x18; uVar36 = uVar36 + 8) {
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
                *(uint *)((long)p + 0x510) = uVar22;
                *(uint *)((long)p + 0x514) = uStack_7c;
                *(ulong *)((long)p + 0x4c8) = uVar26;
                *(uint *)((long)p + 0x4d0) = uVar36;
                *(uint **)((long)p + 0x498) = puStack_78;
                *(uint *)((long)p + 0x4f70) = (uint)uStack_88;
                *(uint *)((long)p + 0x4f74) = uVar14;
                *(int *)((long)p + 0x4f78) = iVar44;
                *(int *)((long)p + 0x4f2c) = iVar42;
                *(int *)((long)p + 0x4f30) = iStack_98;
                *(uint *)((long)p + 0x4f34) = uStack_9c;
                *(int *)((long)p + 0x4f38) = iStack_94;
                *(uint *)((long)p + 0x4f3c) = uVar11;
                *(uint *)((long)p + 0x4f44) = uStack_88._4_4_;
                *(uint *)((long)p + 0x4f48) = uStack_80;
                *(int *)((long)p + 0x4f18) = (int)uStack_58;
                plVar19 = *(long **)((long)p + 0x558);
                puVar16 = *(ulong **)((long)p + 0x568);
                puVar30 = *(uint **)((long)p + 0x490);
                goto LAB_00115c28;
              }
LAB_00115b4f:
              uVar28 = 0;
              if (puStack_78 < puVar20) {
                uVar28 = (ulong)(byte)*puStack_78;
                puStack_78 = (uint *)((long)puStack_78 + 1);
              }
              uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar36 & 0x3f);
            }
          }
        }
        uVar37 = (uint)(ushort)(uVar26 >> 0x30);
        if (uVar37 < pdVar25->m_table_max_code) {
          uVar43 = pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff;
          uVar37 = pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
        }
        else {
          iVar23 = pdVar25->m_decode_start_code_size - 0x41;
          do {
            iVar15 = iVar23;
            iVar23 = iVar15 + 1;
          } while (pdVar25->m_max_codes[iVar15 + 0x40U] <= uVar37);
          uVar43 = (int)(uVar26 >> (-(char)(iVar15 + 1) & 0x3fU)) +
                   pdVar25->m_val_ptrs[iVar15 + 0x40U];
          uVar37 = 0;
          if (uVar43 < prVar32->m_total_syms) {
            uVar37 = uVar43;
          }
          uVar43 = (uint)pdVar25->m_sorted_symbol_order[(int)uVar37];
          uVar37 = iVar15 + 0x41;
        }
        uVar26 = uVar26 << ((byte)uVar37 & 0x3f);
        puVar2 = (prVar32->m_sym_freq).m_p + uVar43;
        *puVar2 = *puVar2 + 1;
        puVar1 = &prVar32->m_symbols_until_update;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          raw_quasi_adaptive_huffman_data_model::update(prVar32);
        }
        iVar44 = uVar43 + iVar44;
        uVar43 = uVar36 - uVar37;
      }
      iStack_94 = uStack_9c;
      uVar11 = (uint)(6 < uVar11) * 3 + 7;
      uStack_9c = iStack_98;
      iVar23 = iVar42;
      iVar42 = iVar44 + *(int *)((long)p + (ulong)uVar14 * 4 + 0x10);
    }
    else {
      *puVar18 = uVar4 - (uVar4 >> 5);
      puVar18 = (ushort *)((long)p + (ulong)uVar11 * 2 + 0x4eb8);
      uStack_70 = puStack_78;
      uVar14 = uStack_88._4_4_;
      uStack_88._4_4_ = uVar37;
      for (uVar36 = uVar36 - uStack_7c; uVar36 < 0x1000000; uVar36 = uVar36 << 8) {
        *(ushort **)((long)p + 0x528) = puVar18;
        uVar28 = uVar26;
        for (; (int)uVar43 < 8; uVar43 = uVar43 + 8) {
          if (uStack_70 == *(uint **)((long)p + 0x4a0)) {
            uVar26 = 0;
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(uint *)((long)p + 0x510) = uVar13;
              *(uint *)((long)p + 0x514) = uVar36;
              *(ulong *)((long)p + 0x4c8) = uVar28;
              *(uint *)((long)p + 0x4d0) = uVar43;
              *(uint **)((long)p + 0x498) = uStack_70;
              *(uint *)((long)p + 0x4f70) = (uint)uStack_88;
              *(int *)((long)p + 0x4f2c) = iVar42;
              *(int *)((long)p + 0x4f30) = iStack_98;
              *(uint *)((long)p + 0x4f34) = uStack_9c;
              *(int *)((long)p + 0x4f38) = iStack_94;
              *(uint *)((long)p + 0x4f3c) = uVar11;
              *(uint *)((long)p + 0x4f44) = uStack_88._4_4_;
              *(uint *)((long)p + 0x4f48) = uVar14;
              *(int *)((long)p + 0x4f18) = (int)uStack_58;
              puVar20 = *(uint **)((long)p + 0x490);
              plVar19 = *(long **)((long)p + 0x558);
              puVar16 = *(ulong **)((long)p + 0x568);
              goto LAB_00112d74;
            }
          }
          else {
LAB_00112254:
            uVar26 = (ulong)(byte)*uStack_70;
            uStack_70 = (uint *)((long)uStack_70 + 1);
          }
LAB_0011225a:
          uVar28 = uVar28 | uVar26 << (0x38U - (char)uVar43 & 0x3f);
        }
        uVar26 = uVar28 << 8;
        uVar43 = uVar43 - 8;
        puVar18 = *(ushort **)((long)p + 0x528);
        uVar13 = uVar13 << 8 | (uint)(byte)(uVar28 >> 0x38);
      }
      uVar4 = *puVar18;
      uStack_7c = (uVar36 >> 0xb) * (uint)uVar4;
      uVar37 = uVar13 - uStack_7c;
      if (uVar13 < uStack_7c) {
        *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
        prVar32 = (raw_quasi_adaptive_huffman_data_model *)
                  ((long)p + (ulong)(6 < uVar11) * 0x80 + 0x4620);
        pdVar25 = *(decoder_tables **)((long)p + (ulong)(6 < uVar11) * 0x80 + 18000);
        if ((int)uVar43 < 0x18) {
          puVar20 = *(uint **)((long)p + 0x4a0);
          if (uStack_70 + 1 < puVar20) {
            uVar22 = *uStack_70;
            uVar43 = uVar43 + 0x20;
            uVar26 = uVar26 | (ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 |
                                      (uVar22 & 0xff00) << 8 | uVar22 << 0x18) <<
                              (-(char)uVar43 & 0x3fU);
            uStack_70 = uStack_70 + 1;
          }
          else {
            for (; (int)uVar43 < 0x18; uVar43 = uVar43 + 8) {
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
                *(uint *)((long)p + 0x510) = uVar13;
                *(uint *)((long)p + 0x514) = uStack_7c;
                *(ulong *)((long)p + 0x4c8) = uVar26;
                *(uint *)((long)p + 0x4d0) = uVar43;
                *(uint **)((long)p + 0x498) = uStack_70;
                *(uint *)((long)p + 0x4f70) = (uint)uStack_88;
                *(int *)((long)p + 0x4f2c) = iVar42;
                *(int *)((long)p + 0x4f30) = iStack_98;
                *(uint *)((long)p + 0x4f34) = uStack_9c;
                *(int *)((long)p + 0x4f38) = iStack_94;
                *(uint *)((long)p + 0x4f3c) = uVar11;
                *(uint *)((long)p + 0x4f44) = uStack_88._4_4_;
                *(uint *)((long)p + 0x4f48) = uVar14;
                *(int *)((long)p + 0x4f18) = (int)uStack_58;
                plVar19 = *(long **)((long)p + 0x558);
                puVar16 = *(ulong **)((long)p + 0x568);
                puVar30 = *(uint **)((long)p + 0x490);
                goto LAB_0011514a;
              }
LAB_00114f06:
              uVar28 = 0;
              if (uStack_70 < puVar20) {
                uVar28 = (ulong)(byte)*uStack_70;
                uStack_70 = (uint *)((long)uStack_70 + 1);
              }
              uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar43 & 0x3f);
            }
          }
        }
        uVar22 = (uint)(ushort)(uVar26 >> 0x30);
        if (uVar22 < pdVar25->m_table_max_code) {
          uStack_88._0_4_ =
               pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff;
          uVar37 = pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
        }
        else {
          iVar44 = pdVar25->m_decode_start_code_size - 0x41;
          do {
            iVar23 = iVar44;
            iVar44 = iVar23 + 1;
          } while (pdVar25->m_max_codes[iVar23 + 0x40U] <= uVar22);
          uVar37 = (int)(uVar26 >> (-(char)(iVar23 + 1) & 0x3fU)) +
                   pdVar25->m_val_ptrs[iVar23 + 0x40U];
          uVar22 = 0;
          if (uVar37 < prVar32->m_total_syms) {
            uVar22 = uVar37;
          }
          uVar37 = iVar23 + 0x41;
          uStack_88._0_4_ = (uint)pdVar25->m_sorted_symbol_order[(int)uVar22];
        }
        uVar26 = uVar26 << ((byte)uVar37 & 0x3f);
        puVar2 = (prVar32->m_sym_freq).m_p + (uint)uStack_88;
        *puVar2 = *puVar2 + 1;
        uVar43 = uVar43 - uVar37;
        puVar1 = &prVar32->m_symbols_until_update;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          raw_quasi_adaptive_huffman_data_model::update(prVar32);
        }
        uStack_88._0_4_ = (uint)uStack_88 + 2;
        puVar18 = (ushort *)((long)p + (ulong)uVar11 * 2 + 0x4ee8);
        for (; uStack_7c < 0x1000000; uStack_7c = uStack_7c << 8) {
          *(ushort **)((long)p + 0x528) = puVar18;
          uVar28 = uVar26;
          for (; (int)uVar43 < 8; uVar43 = uVar43 + 8) {
            if (uStack_70 == *(uint **)((long)p + 0x4a0)) {
              uVar26 = 0;
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(uint *)((long)p + 0x510) = uVar13;
                *(uint *)((long)p + 0x514) = uStack_7c;
                *(ulong *)((long)p + 0x4c8) = uVar28;
                *(uint *)((long)p + 0x4d0) = uVar43;
                *(uint **)((long)p + 0x498) = uStack_70;
                *(uint *)((long)p + 0x4f70) = (uint)uStack_88;
                *(int *)((long)p + 0x4f2c) = iVar42;
                *(int *)((long)p + 0x4f30) = iStack_98;
                *(uint *)((long)p + 0x4f34) = uStack_9c;
                *(int *)((long)p + 0x4f38) = iStack_94;
                *(uint *)((long)p + 0x4f3c) = uVar11;
                *(uint *)((long)p + 0x4f44) = uStack_88._4_4_;
                *(uint *)((long)p + 0x4f48) = uVar14;
                *(int *)((long)p + 0x4f18) = (int)uStack_58;
                puVar20 = *(uint **)((long)p + 0x490);
                plVar19 = *(long **)((long)p + 0x558);
                puVar16 = *(ulong **)((long)p + 0x568);
                goto LAB_00112d3a;
              }
            }
            else {
LAB_00111e7f:
              uVar26 = (ulong)(byte)*uStack_70;
              uStack_70 = (uint *)((long)uStack_70 + 1);
            }
LAB_00111e85:
            uVar28 = uVar28 | uVar26 << (0x38U - (char)uVar43 & 0x3f);
          }
          uVar26 = uVar28 << 8;
          uVar43 = uVar43 - 8;
          puVar18 = *(ushort **)((long)p + 0x528);
          uVar13 = uVar13 << 8 | (uint)(byte)(uVar28 >> 0x38);
        }
        uVar4 = *puVar18;
        uVar37 = (uStack_7c >> 0xb) * (uint)uVar4;
        uVar22 = uVar13 - uVar37;
        puStack_78 = uStack_70;
        if (uVar13 < uVar37) {
          *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
          puVar18 = (ushort *)((long)p + (ulong)uVar11 * 2 + 0x4f00);
          for (; uVar37 < 0x1000000; uVar37 = uVar37 << 8) {
            *(ushort **)((long)p + 0x528) = puVar18;
            uVar28 = uVar26;
            for (; (int)uVar43 < 8; uVar43 = uVar43 + 8) {
              if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
                uVar26 = 0;
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(uint *)((long)p + 0x510) = uVar13;
                  *(uint *)((long)p + 0x514) = uVar37;
                  *(ulong *)((long)p + 0x4c8) = uVar28;
                  *(uint *)((long)p + 0x4d0) = uVar43;
                  *(uint **)((long)p + 0x498) = puStack_78;
                  *(uint *)((long)p + 0x4f70) = (uint)uStack_88;
                  *(int *)((long)p + 0x4f2c) = iVar42;
                  *(int *)((long)p + 0x4f30) = iStack_98;
                  *(uint *)((long)p + 0x4f34) = uStack_9c;
                  *(int *)((long)p + 0x4f38) = iStack_94;
                  *(uint *)((long)p + 0x4f3c) = uVar11;
                  *(uint *)((long)p + 0x4f44) = uStack_88._4_4_;
                  *(uint *)((long)p + 0x4f48) = uVar14;
                  *(int *)((long)p + 0x4f18) = (int)uStack_58;
                  plVar19 = *(long **)((long)p + 0x558);
                  puVar16 = *(ulong **)((long)p + 0x568);
                  puVar20 = *(uint **)((long)p + 0x490);
                  goto LAB_00112c18;
                }
              }
              else {
LAB_0011172f:
                uVar26 = (ulong)(byte)*puStack_78;
                puStack_78 = (uint *)((long)puStack_78 + 1);
              }
LAB_00111736:
              uVar28 = uVar28 | uVar26 << (0x38U - (char)uVar43 & 0x3f);
            }
            uVar26 = uVar28 << 8;
            uVar43 = uVar43 - 8;
            puVar18 = *(ushort **)((long)p + 0x528);
            uVar13 = uVar13 << 8 | (uint)(byte)(uVar28 >> 0x38);
          }
          uVar4 = *puVar18;
          uStack_7c = (uVar37 >> 0xb) * (uint)uVar4;
          uVar22 = uVar13 - uStack_7c;
          if (uVar13 < uStack_7c) {
            *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
            iStack_98 = iStack_94;
            uVar22 = uVar13;
            iStack_94 = uStack_9c;
          }
          else {
            *puVar18 = uVar4 - (uVar4 >> 5);
            uStack_7c = uVar37 - uStack_7c;
            iStack_98 = uStack_9c;
          }
          uStack_9c = 0;
        }
        else {
          *puVar18 = uVar4 - (uVar4 >> 5);
          uStack_7c = uStack_7c - uVar37;
        }
        uVar11 = (uint)(6 < uVar11) * 3 + 8;
        iVar23 = iVar42;
        iVar42 = iStack_98;
      }
      else {
        *puVar18 = uVar4 - (uVar4 >> 5);
        puVar18 = (ushort *)((long)p + (ulong)uVar11 * 2 + 0x4ed0);
        for (uVar36 = uVar36 - uStack_7c; uVar36 < 0x1000000; uVar36 = uVar36 << 8) {
          *(ushort **)((long)p + 0x528) = puVar18;
          uVar28 = uVar26;
          for (; (int)uVar43 < 8; uVar43 = uVar43 + 8) {
            if (uStack_70 == *(uint **)((long)p + 0x4a0)) {
              uVar26 = 0;
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(uint *)((long)p + 0x510) = uVar37;
                *(uint *)((long)p + 0x514) = uVar36;
                *(ulong *)((long)p + 0x4c8) = uVar28;
                *(uint *)((long)p + 0x4d0) = uVar43;
                *(uint **)((long)p + 0x498) = uStack_70;
                *(uint *)((long)p + 0x4f70) = (uint)uStack_88;
                *(int *)((long)p + 0x4f2c) = iVar42;
                *(int *)((long)p + 0x4f30) = iStack_98;
                *(uint *)((long)p + 0x4f34) = uStack_9c;
                *(int *)((long)p + 0x4f38) = iStack_94;
                *(uint *)((long)p + 0x4f3c) = uVar11;
                *(uint *)((long)p + 0x4f44) = uStack_88._4_4_;
                *(uint *)((long)p + 0x4f48) = uVar14;
                *(int *)((long)p + 0x4f18) = (int)uStack_58;
                plVar19 = *(long **)((long)p + 0x558);
                puVar16 = *(ulong **)((long)p + 0x568);
                puVar20 = *(uint **)((long)p + 0x490);
                goto LAB_00112c31;
              }
            }
            else {
LAB_00111843:
              uVar26 = (ulong)(byte)*uStack_70;
              uStack_70 = (uint *)((long)uStack_70 + 1);
            }
LAB_00111849:
            uVar28 = uVar28 | uVar26 << (0x38U - (char)uVar43 & 0x3f);
          }
          uVar26 = uVar28 << 8;
          uVar43 = uVar43 - 8;
          puVar18 = *(ushort **)((long)p + 0x528);
          uVar37 = uVar37 << 8 | (uint)(byte)(uVar28 >> 0x38);
        }
        uVar4 = *puVar18;
        uStack_7c = (uVar36 >> 0xb) * (uint)uVar4;
        uVar22 = uVar37 - uStack_7c;
        if (uVar37 < uStack_7c) {
          *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
          prVar32 = (raw_quasi_adaptive_huffman_data_model *)
                    ((long)p + (ulong)(6 < uVar11) * 0x80 + 0x4620);
          pdVar25 = *(decoder_tables **)((long)p + (ulong)(6 < uVar11) * 0x80 + 18000);
          uVar22 = uVar37;
          if ((int)uVar43 < 0x18) {
            puVar20 = *(uint **)((long)p + 0x4a0);
            if (uStack_70 + 1 < puVar20) {
              uVar37 = *uStack_70;
              uVar43 = uVar43 + 0x20;
              uVar26 = uVar26 | (ulong)(uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 |
                                        (uVar37 & 0xff00) << 8 | uVar37 << 0x18) <<
                                (-(char)uVar43 & 0x3fU);
              uStack_70 = uStack_70 + 1;
            }
            else {
              for (; uVar22 = uVar37, (int)uVar43 < 0x18; uVar43 = uVar43 + 8) {
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
                  *(uint *)((long)p + 0x510) = uVar37;
                  *(uint *)((long)p + 0x514) = uStack_7c;
                  *(ulong *)((long)p + 0x4c8) = uVar26;
                  *(uint *)((long)p + 0x4d0) = uVar43;
                  *(uint **)((long)p + 0x498) = uStack_70;
                  *(uint *)((long)p + 0x4f70) = (uint)uStack_88;
                  *(int *)((long)p + 0x4f2c) = iVar42;
                  *(int *)((long)p + 0x4f30) = iStack_98;
                  *(uint *)((long)p + 0x4f34) = uStack_9c;
                  *(int *)((long)p + 0x4f38) = iStack_94;
                  *(uint *)((long)p + 0x4f3c) = uVar11;
                  *(uint *)((long)p + 0x4f44) = uStack_88._4_4_;
                  *(uint *)((long)p + 0x4f48) = uVar14;
                  *(int *)((long)p + 0x4f18) = (int)uStack_58;
                  plVar19 = *(long **)((long)p + 0x558);
                  puVar16 = *(ulong **)((long)p + 0x568);
                  puVar30 = *(uint **)((long)p + 0x490);
                  goto LAB_00114e58;
                }
LAB_00114d0e:
                uVar28 = 0;
                if (uStack_70 < puVar20) {
                  uVar28 = (ulong)(byte)*uStack_70;
                  uStack_70 = (uint *)((long)uStack_70 + 1);
                }
                uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar43 & 0x3f);
              }
            }
          }
          uVar37 = (uint)(ushort)(uVar26 >> 0x30);
          if (uVar37 < pdVar25->m_table_max_code) {
            uStack_88._0_4_ =
                 pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff;
            uVar37 = pdVar25->m_lookup[uVar26 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
          }
          else {
            iVar44 = pdVar25->m_decode_start_code_size - 0x41;
            do {
              iVar23 = iVar44;
              iVar44 = iVar23 + 1;
            } while (pdVar25->m_max_codes[iVar23 + 0x40U] <= uVar37);
            uVar14 = (int)(uVar26 >> (-(char)(iVar23 + 1) & 0x3fU)) +
                     pdVar25->m_val_ptrs[iVar23 + 0x40U];
            uVar37 = 0;
            if (uVar14 < prVar32->m_total_syms) {
              uVar37 = uVar14;
            }
            uStack_88._0_4_ = (uint)pdVar25->m_sorted_symbol_order[(int)uVar37];
            uVar37 = iVar23 + 0x41;
          }
          uVar26 = uVar26 << ((byte)uVar37 & 0x3f);
          puVar2 = (prVar32->m_sym_freq).m_p + (uint)uStack_88;
          *puVar2 = *puVar2 + 1;
          uVar43 = uVar43 - uVar37;
          puVar1 = &prVar32->m_symbols_until_update;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            raw_quasi_adaptive_huffman_data_model::update(prVar32);
          }
          uStack_88._0_4_ = (uint)uStack_88 + 2;
          uVar11 = (uint)(6 < uVar11) * 3 + 8;
          puStack_78 = uStack_70;
          iVar23 = iStack_98;
        }
        else {
          *puVar18 = uVar4 - (uVar4 >> 5);
          uStack_7c = uVar36 - uStack_7c;
          uVar11 = (6 < uVar11) + 9 + (uint)(6 < uVar11);
          puStack_78 = uStack_70;
          iVar23 = iStack_98;
        }
      }
    }
    iStack_98 = iVar23;
    iVar44 = (int)uStack_58;
    uVar28 = uStack_58 & 0xffffffff;
    if ((uVar28 < (ulong)(long)iVar42) ||
       (uStack_58 = (ulong)(iVar44 + (uint)uStack_88), uVar27 < uStack_58)) {
      *(uint *)((long)p + 0x510) = uVar22;
      *(uint *)((long)p + 0x514) = uStack_7c;
      *(ulong *)((long)p + 0x4c8) = uVar26;
      *(uint *)((long)p + 0x4d0) = uVar43;
      *(uint **)((long)p + 0x498) = puStack_78;
      **(long **)((long)p + 0x558) = (long)puStack_78 - *(long *)((long)p + 0x490);
      **(undefined8 **)((long)p + 0x568) = 0;
      goto LAB_001157c7;
    }
    pbVar38 = pbVar6 + (uint)(iVar44 - iVar42);
    pbVar24 = pbVar6 + uVar28;
    if (iVar42 == 1) {
      bVar21 = *pbVar38;
      uVar14 = (uint)bVar21;
      uVar37 = (uint)uStack_88;
      if ((uint)uStack_88 < 8) {
        for (; 0 < (int)uVar37; uVar37 = uVar37 - 1) {
          *pbVar24 = bVar21;
          pbVar24 = pbVar24 + 1;
        }
        if ((uint)uStack_88 == 1) {
          uVar14 = uStack_88._4_4_;
        }
      }
      else {
        memset(pbVar24,uVar14,(ulong)(uint)uStack_88);
      }
    }
    else if ((uint)uStack_88 == 1) {
      bVar21 = *pbVar38;
      *pbVar24 = bVar21;
      uVar14 = uStack_88._4_4_;
    }
    else {
      uStack_88._0_4_ = (uint)uStack_88 - 2;
      if (((uint)uStack_88 < 8) || (iVar42 < (int)(uint)uStack_88)) {
        for (; 0 < (int)(uint)uStack_88; uStack_88._0_4_ = (uint)uStack_88 - 1) {
          bVar21 = *pbVar38;
          pbVar38 = pbVar38 + 1;
          *pbVar24 = bVar21;
          pbVar24 = pbVar24 + 1;
        }
      }
      else {
        uVar28 = (ulong)(uint)uStack_88;
        memcpy(pbVar24,pbVar38,uVar28);
        pbVar24 = pbVar24 + uVar28;
        pbVar38 = pbVar38 + uVar28;
      }
      bVar3 = *pbVar38;
      *pbVar24 = bVar3;
      bVar21 = pbVar38[1];
      pbVar24[1] = bVar21;
      uVar14 = (uint)bVar3;
    }
    uStack_88._4_4_ = uVar14;
    uVar37 = (uint)bVar21;
    uVar14 = uVar22;
  } while( true );
  if (uVar36 == 0) goto LAB_001154a6;
  goto LAB_00113c2c;
LAB_0011947f:
  uVar11 = *(uint *)((long)p + 0x510);
  uStack_90._4_4_ = *(uint *)((long)p + 0x514);
  uStack_60 = *(ulong *)((long)p + 0x4c8);
  uVar37 = *(uint *)((long)p + 0x4d0);
  goto LAB_001196cd;
LAB_00116632:
  if (7 < iVar44) goto code_r0x0011663b;
  if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
    if (*(char *)((long)p + 0x4b0) == '\0') {
      *(uint *)((long)p + 0x510) = uVar11;
      *(uint *)((long)p + 0x514) = uStack_90._4_4_;
      *(ulong *)((long)p + 0x4c8) = uVar26;
      *(int *)((long)p + 0x4d0) = iVar44;
      *(uint **)((long)p + 0x498) = uStack_88;
      *(undefined4 *)((long)p + 0x4f2c) = uVar33;
      *(int *)((long)p + 0x4f30) = iStack_a0;
      *(int *)((long)p + 0x4f34) = iStack_a8;
      *(int *)((long)p + 0x4f38) = iStack_a4;
      *(undefined4 *)((long)p + 0x4f3c) = uVar39;
      *(uint *)((long)p + 0x4f44) = uStack_9c;
      *(undefined4 *)((long)p + 0x4f48) = uVar31;
      *(int *)((long)p + 0x4f18) = (int)puStack_78;
      plVar19 = *(long **)((long)p + 0x558);
      puVar20 = *(uint **)((long)p + 0x490);
      goto LAB_00118119;
    }
LAB_00119014:
    uVar28 = 0;
  }
  else {
LAB_0011660c:
    uVar28 = (ulong)(byte)*uStack_88;
    uStack_88 = (uint *)((long)uStack_88 + 1);
  }
  cVar9 = (char)iVar44;
  iVar44 = iVar44 + 8;
  uVar26 = uVar26 | uVar28 << (0x38U - cVar9 & 0x3f);
  goto LAB_00116632;
code_r0x0011663b:
  uVar28 = uVar26 << 8;
  uVar11 = (uint)(uVar26 >> 0x28) & 0xff0000 | uVar11;
  for (iVar44 = iVar44 + -8; iVar44 < 8; iVar44 = iVar44 + 8) {
    if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
      if (*(char *)((long)p + 0x4b0) == '\0') {
        *(uint *)((long)p + 0x510) = uVar11;
        *(uint *)((long)p + 0x514) = uStack_90._4_4_;
        *(ulong *)((long)p + 0x4c8) = uVar28;
        *(int *)((long)p + 0x4d0) = iVar44;
        *(uint **)((long)p + 0x498) = uStack_88;
        *(undefined4 *)((long)p + 0x4f2c) = uVar33;
        *(int *)((long)p + 0x4f30) = iStack_a0;
        *(int *)((long)p + 0x4f34) = iStack_a8;
        *(int *)((long)p + 0x4f38) = iStack_a4;
        *(undefined4 *)((long)p + 0x4f3c) = uVar39;
        *(uint *)((long)p + 0x4f44) = uStack_9c;
        *(undefined4 *)((long)p + 0x4f48) = uVar31;
        *(int *)((long)p + 0x4f18) = (int)puStack_78;
        plVar19 = *(long **)((long)p + 0x558);
        puVar20 = *(uint **)((long)p + 0x490);
        goto LAB_001180b9;
      }
LAB_00119000:
      uVar26 = 0;
    }
    else {
LAB_00116431:
      uVar26 = (ulong)(byte)*uStack_88;
      uStack_88 = (uint *)((long)uStack_88 + 1);
    }
    uVar28 = uVar28 | uVar26 << (0x38U - (char)iVar44 & 0x3f);
  }
  uVar26 = uVar28 << 8;
  uVar11 = (ushort)(uVar28 >> 0x30) & 0xff00 | uVar11;
  for (iVar44 = iVar44 + -8; iVar44 < 8; iVar44 = iVar44 + 8) {
    if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
      uVar28 = 0;
      if (*(char *)((long)p + 0x4b0) == '\0') {
        *(uint *)((long)p + 0x510) = uVar11;
        *(uint *)((long)p + 0x514) = uStack_90._4_4_;
        *(ulong *)((long)p + 0x4c8) = uVar26;
        *(int *)((long)p + 0x4d0) = iVar44;
        *(uint **)((long)p + 0x498) = uStack_88;
        *(undefined4 *)((long)p + 0x4f2c) = uVar33;
        *(int *)((long)p + 0x4f30) = iStack_a0;
        *(int *)((long)p + 0x4f34) = iStack_a8;
        *(int *)((long)p + 0x4f38) = iStack_a4;
        *(undefined4 *)((long)p + 0x4f3c) = uVar39;
        *(uint *)((long)p + 0x4f44) = uStack_9c;
        *(undefined4 *)((long)p + 0x4f48) = uVar31;
        *(int *)((long)p + 0x4f18) = (int)puStack_78;
        plVar19 = *(long **)((long)p + 0x558);
        puVar20 = *(uint **)((long)p + 0x490);
        goto LAB_001180d9;
      }
    }
    else {
LAB_00116524:
      uVar28 = (ulong)(byte)*uStack_88;
      uStack_88 = (uint *)((long)uStack_88 + 1);
    }
LAB_0011652a:
    uVar26 = uVar26 | uVar28 << (0x38U - (char)iVar44 & 0x3f);
  }
  uStack_60 = uVar26 << 8;
  uVar37 = iVar44 - 8;
  uVar11 = uVar11 | (byte)(uVar26 >> 0x38);
  *(int *)((long)p + 0x4f40) = (int)puStack_78;
  uStack_90._0_4_ = 0;
  uStack_9c = 0;
  uStack_70._4_4_ = 0;
  iStack_a8 = 1;
  iStack_a0 = 1;
  iStack_a4 = 1;
  iStack_ac = 1;
LAB_00119c93:
  do {
    puVar18 = (ushort *)((long)p + (ulong)(uStack_70._4_4_ * 0x40 + (uStack_9c >> 2)) * 2 + 0x48a0);
    for (; uStack_90._4_4_ < 0x1000000; uStack_90._4_4_ = uStack_90._4_4_ << 8) {
      *(ushort **)((long)p + 0x528) = puVar18;
      uVar26 = uStack_60;
      for (; (int)uVar37 < 8; uVar37 = uVar37 + 8) {
        if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar11;
            *(uint *)((long)p + 0x514) = uStack_90._4_4_;
            *(ulong *)((long)p + 0x4c8) = uVar26;
            *(uint *)((long)p + 0x4d0) = uVar37;
            *(uint **)((long)p + 0x498) = uStack_88;
            *(int *)((long)p + 0x4f2c) = iStack_ac;
            *(int *)((long)p + 0x4f30) = iStack_a0;
            *(int *)((long)p + 0x4f34) = iStack_a8;
            *(int *)((long)p + 0x4f38) = iStack_a4;
            *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
            *(uint *)((long)p + 0x4f44) = uStack_9c;
            *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
            *(int *)((long)p + 0x4f18) = (int)puStack_78;
            plVar19 = *(long **)((long)p + 0x558);
            puVar20 = *(uint **)((long)p + 0x490);
            goto LAB_001182a5;
          }
LAB_001190d4:
          uVar28 = 0;
        }
        else {
LAB_00117958:
          uVar28 = (ulong)(byte)*uStack_88;
          uStack_88 = (uint *)((long)uStack_88 + 1);
        }
        uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar37 & 0x3f);
      }
      uStack_60 = uVar26 << 8;
      uVar37 = uVar37 - 8;
      puVar18 = *(ushort **)((long)p + 0x528);
      uVar11 = uVar11 << 8 | (uint)(byte)(uVar26 >> 0x38);
    }
    uVar4 = *puVar18;
    uVar43 = (uStack_90._4_4_ >> 0xb) * (uint)uVar4;
    if (uVar43 <= uVar11) {
      *puVar18 = uVar4 - (uVar4 >> 5);
      puVar18 = (ushort *)((long)p + (ulong)uStack_70._4_4_ * 2 + 0x4ea0);
      uVar14 = 1;
      uVar11 = uVar11 - uVar43;
      for (uVar36 = uStack_90._4_4_ - uVar43; uVar36 < 0x1000000; uVar36 = uVar36 << 8) {
        *(ushort **)((long)p + 0x528) = puVar18;
        uVar26 = uStack_60;
        for (; (int)uVar37 < 8; uVar37 = uVar37 + 8) {
          if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
            uVar28 = 0;
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(uint *)((long)p + 0x510) = uVar11;
              *(uint *)((long)p + 0x514) = uVar36;
              *(ulong *)((long)p + 0x4c8) = uVar26;
              *(uint *)((long)p + 0x4d0) = uVar37;
              *(uint **)((long)p + 0x498) = uStack_88;
              *(uint *)((long)p + 0x4f70) = uVar14;
              *(int *)((long)p + 0x4f2c) = iStack_ac;
              *(int *)((long)p + 0x4f30) = iStack_a0;
              *(int *)((long)p + 0x4f34) = iStack_a8;
              *(int *)((long)p + 0x4f38) = iStack_a4;
              *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
              *(uint *)((long)p + 0x4f44) = uStack_9c;
              *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
              *(int *)((long)p + 0x4f18) = (int)puStack_78;
              plVar19 = *(long **)((long)p + 0x558);
              puVar20 = *(uint **)((long)p + 0x490);
              goto LAB_00118151;
            }
          }
          else {
LAB_00116adf:
            uVar28 = (ulong)(byte)*uStack_88;
            uStack_88 = (uint *)((long)uStack_88 + 1);
          }
LAB_00116ae8:
          uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar37 & 0x3f);
        }
        uStack_60 = uVar26 << 8;
        uVar37 = uVar37 - 8;
        puVar18 = *(ushort **)((long)p + 0x528);
        uVar11 = uVar11 << 8 | (uint)(byte)(uVar26 >> 0x38);
      }
      uVar4 = *puVar18;
      uStack_90._4_4_ = (uVar36 >> 0xb) * (uint)uVar4;
      uVar43 = uVar11 - uStack_90._4_4_;
      if (uVar11 < uStack_90._4_4_) {
        *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
        prVar32 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x45a0);
        pdVar25 = *(decoder_tables **)((long)p + 0x45d0);
        if ((int)uVar37 < 0x18) {
          puVar20 = *(uint **)((long)p + 0x4a0);
          if (uStack_88 + 1 < puVar20) {
            uVar43 = *uStack_88;
            uVar37 = uVar37 + 0x20;
            uStack_60 = uStack_60 |
                        (ulong)(uVar43 >> 0x18 | (uVar43 & 0xff0000) >> 8 | (uVar43 & 0xff00) << 8 |
                               uVar43 << 0x18) << (-(char)uVar37 & 0x3fU);
            uStack_88 = uStack_88 + 1;
          }
          else {
            for (; (int)uVar37 < 0x18; uVar37 = uVar37 + 8) {
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
                *(uint *)((long)p + 0x510) = uVar11;
                *(uint *)((long)p + 0x514) = uStack_90._4_4_;
                *(ulong *)((long)p + 0x4c8) = uStack_60;
                *(uint *)((long)p + 0x4d0) = uVar37;
                *(uint **)((long)p + 0x498) = uStack_88;
                *(uint *)((long)p + 0x4f70) = uVar14;
                *(int *)((long)p + 0x4f2c) = iStack_ac;
                *(int *)((long)p + 0x4f30) = iStack_a0;
                *(int *)((long)p + 0x4f34) = iStack_a8;
                *(int *)((long)p + 0x4f38) = iStack_a4;
                *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                *(uint *)((long)p + 0x4f44) = uStack_9c;
                *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                *(int *)((long)p + 0x4f18) = (int)puStack_78;
                puVar30 = *(uint **)((long)p + 0x490);
                plVar19 = *(long **)((long)p + 0x558);
                goto LAB_0011ab67;
              }
LAB_0011aa0f:
              uVar26 = 0;
              if (uStack_88 < puVar20) {
                uVar26 = (ulong)(byte)*uStack_88;
                uStack_88 = (uint *)((long)uStack_88 + 1);
              }
              uStack_60 = uStack_60 | uVar26 << (0x38U - (char)uVar37 & 0x3f);
            }
          }
        }
        uVar43 = (uint)(ushort)(uStack_60 >> 0x30);
        if (uVar43 < pdVar25->m_table_max_code) {
          uVar43 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff;
          uVar14 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
        }
        else {
          iVar44 = pdVar25->m_decode_start_code_size - 0x41;
          do {
            iVar42 = iVar44;
            iVar44 = iVar42 + 1;
          } while (pdVar25->m_max_codes[iVar42 + 0x40U] <= uVar43);
          uVar14 = (int)(uStack_60 >> (-(char)(iVar42 + 1) & 0x3fU)) +
                   pdVar25->m_val_ptrs[iVar42 + 0x40U];
          uVar43 = 0;
          if (uVar14 < prVar32->m_total_syms) {
            uVar43 = uVar14;
          }
          uVar14 = iVar42 + 0x41;
          uVar43 = (uint)pdVar25->m_sorted_symbol_order[(int)uVar43];
        }
        uStack_60 = uStack_60 << ((byte)uVar14 & 0x3f);
        puVar2 = (prVar32->m_sym_freq).m_p + uVar43;
        *puVar2 = *puVar2 + 1;
        uVar37 = uVar37 - uVar14;
        puVar1 = &prVar32->m_symbols_until_update;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          raw_quasi_adaptive_huffman_data_model::update(prVar32);
        }
        if (uVar43 < 2) {
          if (uVar43 == 0) {
            if ((uVar37 & 7) == 0) goto LAB_001196cd;
            goto LAB_00117045;
          }
          iStack_a8 = 1;
          iStack_ac = 1;
          uStack_70._4_4_ = 0;
          iStack_a4 = iStack_a8;
          iStack_a0 = iStack_a8;
          goto LAB_00119c93;
        }
        uVar14 = (uVar43 - 2 & 7) + 2;
        uVar43 = (uVar43 - 2 >> 3) + 1;
        if (uVar14 == 9) {
          prVar32 = (raw_quasi_adaptive_huffman_data_model *)
                    ((long)p + (ulong)(6 < uStack_70._4_4_) * 0x80 + 0x4720);
          pdVar25 = *(decoder_tables **)((long)p + (ulong)(6 < uStack_70._4_4_) * 0x80 + 0x4750);
          iVar44 = 9;
          if ((int)uVar37 < 0x18) {
            puVar20 = *(uint **)((long)p + 0x4a0);
            iVar42 = 9;
            if (uStack_88 + 1 < puVar20) {
              uVar14 = *uStack_88;
              uVar37 = uVar37 + 0x20;
              uStack_60 = uStack_60 |
                          (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8
                                 | uVar14 << 0x18) << (-(char)uVar37 & 0x3fU);
              uStack_88 = uStack_88 + 1;
            }
            else {
              for (; iVar44 = iVar42, (int)uVar37 < 0x18; uVar37 = uVar37 + 8) {
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
                  *(uint *)((long)p + 0x510) = uVar11;
                  *(uint *)((long)p + 0x514) = uStack_90._4_4_;
                  *(ulong *)((long)p + 0x4c8) = uStack_60;
                  *(uint *)((long)p + 0x4d0) = uVar37;
                  *(uint **)((long)p + 0x498) = uStack_88;
                  *(int *)((long)p + 0x4f70) = iVar44;
                  *(uint *)((long)p + 0x4f74) = uVar43;
                  *(int *)((long)p + 0x4f2c) = iStack_ac;
                  *(int *)((long)p + 0x4f30) = iStack_a0;
                  *(int *)((long)p + 0x4f34) = iStack_a8;
                  *(int *)((long)p + 0x4f38) = iStack_a4;
                  *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                  *(uint *)((long)p + 0x4f44) = uStack_9c;
                  *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                  *(int *)((long)p + 0x4f18) = (int)puStack_78;
                  puVar30 = *(uint **)((long)p + 0x490);
                  plVar19 = *(long **)((long)p + 0x558);
                  goto LAB_0011af90;
                }
LAB_0011aced:
                uVar26 = 0;
                if (uStack_88 < puVar20) {
                  uVar26 = (ulong)(byte)*uStack_88;
                  uStack_88 = (uint *)((long)uStack_88 + 1);
                }
                uStack_60 = uStack_60 | uVar26 << (0x38U - (char)uVar37 & 0x3f);
                iVar42 = iVar44;
              }
            }
          }
          uVar14 = (uint)(ushort)(uStack_60 >> 0x30);
          if (uVar14 < pdVar25->m_table_max_code) {
            uVar14 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff
            ;
            uVar36 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
          }
          else {
            iVar42 = pdVar25->m_decode_start_code_size - 0x41;
            do {
              iVar23 = iVar42;
              iVar42 = iVar23 + 1;
            } while (pdVar25->m_max_codes[iVar23 + 0x40U] <= uVar14);
            uVar36 = (int)(uStack_60 >> (-(char)(iVar23 + 1) & 0x3fU)) +
                     pdVar25->m_val_ptrs[iVar23 + 0x40U];
            uVar14 = 0;
            if (uVar36 < prVar32->m_total_syms) {
              uVar14 = uVar36;
            }
            uVar14 = (uint)pdVar25->m_sorted_symbol_order[(int)uVar14];
            uVar36 = iVar23 + 0x41;
          }
          uStack_60 = uStack_60 << ((byte)uVar36 & 0x3f);
          puVar2 = (prVar32->m_sym_freq).m_p + uVar14;
          *puVar2 = *puVar2 + 1;
          uVar37 = uVar37 - uVar36;
          puVar1 = &prVar32->m_symbols_until_update;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            raw_quasi_adaptive_huffman_data_model::update(prVar32);
          }
          uVar14 = uVar14 + iVar44;
        }
        bVar21 = *(byte *)((long)p + (ulong)uVar43 + 0x410);
        uVar36 = (uint)bVar21;
        uVar13 = uVar37;
        if (uVar36 < 3) {
          for (; uVar37 = uVar13 - uVar36, (int)uVar13 < (int)uVar36; uVar13 = uVar13 + 8) {
            if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
              uVar26 = 0;
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(uint *)((long)p + 0x510) = uVar11;
                *(uint *)((long)p + 0x514) = uStack_90._4_4_;
                *(ulong *)((long)p + 0x4c8) = uStack_60;
                *(uint *)((long)p + 0x4d0) = uVar13;
                *(uint **)((long)p + 0x498) = uStack_88;
                *(uint *)((long)p + 0x4f70) = uVar14;
                *(uint *)((long)p + 0x4f74) = uVar43;
                *(uint *)((long)p + 0x4f7c) = uVar36;
                *(int *)((long)p + 0x4f2c) = iStack_ac;
                *(int *)((long)p + 0x4f30) = iStack_a0;
                *(int *)((long)p + 0x4f34) = iStack_a8;
                *(int *)((long)p + 0x4f38) = iStack_a4;
                *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                *(uint *)((long)p + 0x4f44) = uStack_9c;
                *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                *(int *)((long)p + 0x4f18) = (int)puStack_78;
                puVar20 = *(uint **)((long)p + 0x490);
                plVar19 = *(long **)((long)p + 0x558);
                goto LAB_00118209;
              }
            }
            else {
LAB_0011725c:
              uVar26 = (ulong)(byte)*uStack_88;
              uStack_88 = (uint *)((long)uStack_88 + 1);
            }
LAB_0011726a:
            uStack_60 = uStack_60 | uVar26 << (0x38U - (char)uVar13 & 0x3f);
          }
          iVar44 = (int)(uStack_60 >> (-(byte)uVar36 & 0x3f));
          if (uVar36 == 0) {
            iVar44 = 0;
          }
          uStack_60 = uStack_60 << ((byte)uVar36 & 0x3f);
        }
        else {
          iVar44 = 0;
          puVar30 = uStack_88;
          if (4 < bVar21) {
            while( true ) {
              iVar42 = uVar36 - 4;
              uVar13 = uVar37 - iVar42;
              if (iVar42 <= (int)uVar37) break;
              if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
                uVar26 = 0;
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(uint *)((long)p + 0x510) = uVar11;
                  *(uint *)((long)p + 0x514) = uStack_90._4_4_;
                  *(ulong *)((long)p + 0x4c8) = uStack_60;
                  *(uint *)((long)p + 0x4d0) = uVar37;
                  *(uint **)((long)p + 0x498) = uStack_88;
                  *(uint *)((long)p + 0x4f70) = uVar14;
                  *(uint *)((long)p + 0x4f74) = uVar43;
                  *(uint *)((long)p + 0x4f7c) = uVar36;
                  *(int *)((long)p + 0x4f2c) = iStack_ac;
                  *(int *)((long)p + 0x4f30) = iStack_a0;
                  *(int *)((long)p + 0x4f34) = iStack_a8;
                  *(int *)((long)p + 0x4f38) = iStack_a4;
                  *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                  *(uint *)((long)p + 0x4f44) = uStack_9c;
                  *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                  *(int *)((long)p + 0x4f18) = (int)puStack_78;
                  puVar20 = *(uint **)((long)p + 0x490);
                  plVar19 = *(long **)((long)p + 0x558);
                  goto LAB_001181bc;
                }
              }
              else {
LAB_00116f43:
                uVar26 = (ulong)(byte)*uStack_88;
                uStack_88 = (uint *)((long)uStack_88 + 1);
              }
LAB_00116f4d:
              cVar9 = (char)uVar37;
              uVar37 = uVar37 + 8;
              uStack_60 = uStack_60 | uVar26 << (0x38U - cVar9 & 0x3f);
            }
            iVar44 = (int)(uStack_60 >> (0x44U - (char)uVar36 & 0x3f)) << 4;
            if (iVar42 == 0) {
              iVar44 = 0;
            }
            uStack_60 = uStack_60 << ((byte)iVar42 & 0x3f);
            puVar30 = uStack_88;
          }
          prVar32 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4820);
          pdVar25 = *(decoder_tables **)((long)p + 0x4850);
          if ((int)uVar13 < 0x18) {
            uStack_88 = *(uint **)((long)p + 0x4a0);
            if (puVar30 + 1 < uStack_88) {
              uVar37 = *puVar30;
              uVar13 = uVar13 + 0x20;
              uStack_60 = uStack_60 |
                          (ulong)(uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8
                                 | uVar37 << 0x18) << (-(char)uVar13 & 0x3fU);
              puVar30 = puVar30 + 1;
            }
            else {
              for (; (int)uVar13 < 0x18; uVar13 = uVar13 + 8) {
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
                  *(uint *)((long)p + 0x510) = uVar11;
                  *(uint *)((long)p + 0x514) = uStack_90._4_4_;
                  *(ulong *)((long)p + 0x4c8) = uStack_60;
                  *(uint *)((long)p + 0x4d0) = uVar13;
                  *(uint **)((long)p + 0x498) = puVar30;
                  *(uint *)((long)p + 0x4f70) = uVar14;
                  *(uint *)((long)p + 0x4f74) = uVar43;
                  *(int *)((long)p + 0x4f78) = iVar44;
                  *(int *)((long)p + 0x4f2c) = iStack_ac;
                  *(int *)((long)p + 0x4f30) = iStack_a0;
                  *(int *)((long)p + 0x4f34) = iStack_a8;
                  *(int *)((long)p + 0x4f38) = iStack_a4;
                  *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                  *(uint *)((long)p + 0x4f44) = uStack_9c;
                  *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                  *(int *)((long)p + 0x4f18) = (int)puStack_78;
                  puVar20 = *(uint **)((long)p + 0x490);
                  plVar19 = *(long **)((long)p + 0x558);
                  goto LAB_0011b412;
                }
LAB_0011b320:
                uVar26 = 0;
                if (puVar30 < uStack_88) {
                  uVar26 = (ulong)(byte)*puVar30;
                  puVar30 = (uint *)((long)puVar30 + 1);
                }
                uStack_60 = uStack_60 | uVar26 << (0x38U - (char)uVar13 & 0x3f);
              }
            }
          }
          uStack_88 = puVar30;
          uVar37 = (uint)(ushort)(uStack_60 >> 0x30);
          if (uVar37 < pdVar25->m_table_max_code) {
            uVar36 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff
            ;
            uVar37 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
          }
          else {
            iVar42 = pdVar25->m_decode_start_code_size - 0x41;
            do {
              iVar23 = iVar42;
              iVar42 = iVar23 + 1;
            } while (pdVar25->m_max_codes[iVar23 + 0x40U] <= uVar37);
            uVar36 = (int)(uStack_60 >> (-(char)(iVar23 + 1) & 0x3fU)) +
                     pdVar25->m_val_ptrs[iVar23 + 0x40U];
            uVar37 = 0;
            if (uVar36 < prVar32->m_total_syms) {
              uVar37 = uVar36;
            }
            uVar36 = (uint)pdVar25->m_sorted_symbol_order[(int)uVar37];
            uVar37 = iVar23 + 0x41;
          }
          uStack_60 = uStack_60 << ((byte)uVar37 & 0x3f);
          puVar2 = (prVar32->m_sym_freq).m_p + uVar36;
          *puVar2 = *puVar2 + 1;
          uVar37 = uVar13 - uVar37;
          puVar1 = &prVar32->m_symbols_until_update;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            raw_quasi_adaptive_huffman_data_model::update(prVar32);
          }
          iVar44 = uVar36 + iVar44;
        }
        iVar44 = iVar44 + *(int *)((long)p + (ulong)uVar43 * 4 + 0x10);
        uStack_70._4_4_ = (uint)(6 < uStack_70._4_4_) * 3 + 7;
        iStack_a4 = iStack_a8;
        iStack_a8 = iStack_a0;
        iStack_a0 = iStack_ac;
      }
      else {
        *puVar18 = uVar4 - (uVar4 >> 5);
        puVar18 = (ushort *)((long)p + (ulong)uStack_70._4_4_ * 2 + 0x4eb8);
        uVar11 = (uint)uStack_90;
        for (uVar36 = uVar36 - uStack_90._4_4_; uVar36 < 0x1000000; uVar36 = uVar36 << 8) {
          *(ushort **)((long)p + 0x528) = puVar18;
          uVar26 = uStack_60;
          for (; (int)uVar37 < 8; uVar37 = uVar37 + 8) {
            if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
              uVar28 = 0;
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(uint *)((long)p + 0x510) = uVar43;
                *(uint *)((long)p + 0x514) = uVar36;
                *(ulong *)((long)p + 0x4c8) = uVar26;
                *(uint *)((long)p + 0x4d0) = uVar37;
                *(uint **)((long)p + 0x498) = uStack_88;
                *(uint *)((long)p + 0x4f70) = uVar14;
                *(int *)((long)p + 0x4f2c) = iStack_ac;
                *(int *)((long)p + 0x4f30) = iStack_a0;
                *(int *)((long)p + 0x4f34) = iStack_a8;
                *(int *)((long)p + 0x4f38) = iStack_a4;
                *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                *(uint *)((long)p + 0x4f44) = uStack_9c;
                *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                *(int *)((long)p + 0x4f18) = (int)puStack_78;
                plVar19 = *(long **)((long)p + 0x558);
                puVar20 = *(uint **)((long)p + 0x490);
                goto LAB_00118282;
              }
            }
            else {
LAB_0011783f:
              uVar28 = (ulong)(byte)*uStack_88;
              uStack_88 = (uint *)((long)uStack_88 + 1);
            }
LAB_00117848:
            uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar37 & 0x3f);
          }
          uStack_60 = uVar26 << 8;
          uVar37 = uVar37 - 8;
          puVar18 = *(ushort **)((long)p + 0x528);
          uVar43 = uVar43 << 8 | (uint)(byte)(uVar26 >> 0x38);
        }
        uVar4 = *puVar18;
        uStack_90._4_4_ = (uVar36 >> 0xb) * (uint)uVar4;
        uVar13 = uVar43 - uStack_90._4_4_;
        if (uVar43 < uStack_90._4_4_) {
          *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
          prVar32 = (raw_quasi_adaptive_huffman_data_model *)
                    ((long)p + (ulong)(6 < uStack_70._4_4_) * 0x80 + 0x4620);
          pdVar25 = *(decoder_tables **)((long)p + (ulong)(6 < uStack_70._4_4_) * 0x80 + 18000);
          if ((int)uVar37 < 0x18) {
            puVar20 = *(uint **)((long)p + 0x4a0);
            if (uStack_88 + 1 < puVar20) {
              uVar14 = *uStack_88;
              uVar37 = uVar37 + 0x20;
              uStack_60 = uStack_60 |
                          (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8
                                 | uVar14 << 0x18) << (-(char)uVar37 & 0x3fU);
              uStack_88 = uStack_88 + 1;
            }
            else {
              for (; (int)uVar37 < 0x18; uVar37 = uVar37 + 8) {
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
                  *(uint *)((long)p + 0x510) = uVar43;
                  *(uint *)((long)p + 0x514) = uStack_90._4_4_;
                  *(ulong *)((long)p + 0x4c8) = uStack_60;
                  *(uint *)((long)p + 0x4d0) = uVar37;
                  *(uint **)((long)p + 0x498) = uStack_88;
                  *(uint *)((long)p + 0x4f70) = uVar14;
                  *(int *)((long)p + 0x4f2c) = iStack_ac;
                  *(int *)((long)p + 0x4f30) = iStack_a0;
                  *(int *)((long)p + 0x4f34) = iStack_a8;
                  *(int *)((long)p + 0x4f38) = iStack_a4;
                  *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                  *(uint *)((long)p + 0x4f44) = uStack_9c;
                  *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                  *(int *)((long)p + 0x4f18) = (int)puStack_78;
                  puVar30 = *(uint **)((long)p + 0x490);
                  plVar19 = *(long **)((long)p + 0x558);
                  goto LAB_0011a933;
                }
LAB_0011a6e1:
                uVar26 = 0;
                if (uStack_88 < puVar20) {
                  uVar26 = (ulong)(byte)*uStack_88;
                  uStack_88 = (uint *)((long)uStack_88 + 1);
                }
                uStack_60 = uStack_60 | uVar26 << (0x38U - (char)uVar37 & 0x3f);
              }
            }
          }
          uVar14 = (uint)(ushort)(uStack_60 >> 0x30);
          if (uVar14 < pdVar25->m_table_max_code) {
            uVar14 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff
            ;
            uVar36 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
          }
          else {
            iVar44 = pdVar25->m_decode_start_code_size - 0x41;
            do {
              iVar42 = iVar44;
              iVar44 = iVar42 + 1;
            } while (pdVar25->m_max_codes[iVar42 + 0x40U] <= uVar14);
            uVar36 = (int)(uStack_60 >> (-(char)(iVar42 + 1) & 0x3fU)) +
                     pdVar25->m_val_ptrs[iVar42 + 0x40U];
            uVar14 = 0;
            if (uVar36 < prVar32->m_total_syms) {
              uVar14 = uVar36;
            }
            uVar14 = (uint)pdVar25->m_sorted_symbol_order[(int)uVar14];
            uVar36 = iVar42 + 0x41;
          }
          uStack_60 = uStack_60 << ((byte)uVar36 & 0x3f);
          puVar2 = (prVar32->m_sym_freq).m_p + uVar14;
          *puVar2 = *puVar2 + 1;
          uVar37 = uVar37 - uVar36;
          puVar1 = &prVar32->m_symbols_until_update;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            raw_quasi_adaptive_huffman_data_model::update(prVar32);
            uStack_90._0_4_ = uVar11;
          }
          uVar14 = uVar14 + 2;
          puVar18 = (ushort *)((long)p + (ulong)uStack_70._4_4_ * 2 + 0x4ee8);
          for (; uStack_90._4_4_ < 0x1000000; uStack_90._4_4_ = uStack_90._4_4_ << 8) {
            *(ushort **)((long)p + 0x528) = puVar18;
            uVar26 = uStack_60;
            for (; (int)uVar37 < 8; uVar37 = uVar37 + 8) {
              if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
                uVar28 = 0;
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(uint *)((long)p + 0x510) = uVar43;
                  *(uint *)((long)p + 0x514) = uStack_90._4_4_;
                  *(ulong *)((long)p + 0x4c8) = uVar26;
                  *(uint *)((long)p + 0x4d0) = uVar37;
                  *(uint **)((long)p + 0x498) = uStack_88;
                  *(uint *)((long)p + 0x4f70) = uVar14;
                  *(int *)((long)p + 0x4f2c) = iStack_ac;
                  *(int *)((long)p + 0x4f30) = iStack_a0;
                  *(int *)((long)p + 0x4f34) = iStack_a8;
                  *(int *)((long)p + 0x4f38) = iStack_a4;
                  *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                  *(uint *)((long)p + 0x4f44) = uStack_9c;
                  *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                  *(int *)((long)p + 0x4f18) = (int)puStack_78;
                  puVar20 = *(uint **)((long)p + 0x490);
                  plVar19 = *(long **)((long)p + 0x558);
                  goto LAB_00118234;
                }
              }
              else {
LAB_00117464:
                uVar28 = (ulong)(byte)*uStack_88;
                uStack_88 = (uint *)((long)uStack_88 + 1);
              }
LAB_0011746a:
              uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar37 & 0x3f);
            }
            uStack_60 = uVar26 << 8;
            uVar37 = uVar37 - 8;
            puVar18 = *(ushort **)((long)p + 0x528);
            uVar43 = uVar43 << 8 | (uint)(byte)(uVar26 >> 0x38);
          }
          uVar4 = *puVar18;
          uVar36 = (uStack_90._4_4_ >> 0xb) * (uint)uVar4;
          uVar11 = uVar43 - uVar36;
          if (uVar43 < uVar36) {
            *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
            puVar18 = (ushort *)((long)p + (ulong)uStack_70._4_4_ * 2 + 0x4f00);
            iVar42 = iStack_a8;
            for (; uVar36 < 0x1000000; uVar36 = uVar36 << 8) {
              *(ushort **)((long)p + 0x528) = puVar18;
              for (; (int)uVar37 < 8; uVar37 = uVar37 + 8) {
                if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
                  uVar26 = 0;
                  if (*(char *)((long)p + 0x4b0) == '\0') {
                    *(uint *)((long)p + 0x510) = uVar43;
                    *(uint *)((long)p + 0x514) = uVar36;
                    *(ulong *)((long)p + 0x4c8) = uStack_60;
                    *(uint *)((long)p + 0x4d0) = uVar37;
                    *(uint **)((long)p + 0x498) = uStack_88;
                    *(uint *)((long)p + 0x4f70) = uVar14;
                    *(int *)((long)p + 0x4f2c) = iStack_ac;
                    *(int *)((long)p + 0x4f30) = iStack_a0;
                    *(int *)((long)p + 0x4f34) = iVar42;
                    *(int *)((long)p + 0x4f38) = iStack_a4;
                    *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                    *(uint *)((long)p + 0x4f44) = uStack_9c;
                    *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                    *(int *)((long)p + 0x4f18) = (int)puStack_78;
                    puVar20 = *(uint **)((long)p + 0x490);
                    plVar19 = *(long **)((long)p + 0x558);
                    goto LAB_0011817c;
                  }
                }
                else {
LAB_00116ceb:
                  uVar26 = (ulong)(byte)*uStack_88;
                  uStack_88 = (uint *)((long)uStack_88 + 1);
                }
LAB_00116cf5:
                uStack_60 = uStack_60 | uVar26 << (0x38U - (char)uVar37 & 0x3f);
              }
              uVar37 = uVar37 - 8;
              puVar18 = *(ushort **)((long)p + 0x528);
              uVar43 = uVar43 << 8 | (uint)(byte)(uStack_60 >> 0x38);
              uStack_60 = uStack_60 << 8;
            }
            uVar4 = *puVar18;
            uStack_90._4_4_ = (uVar36 >> 0xb) * (uint)uVar4;
            uVar11 = uVar43 - uStack_90._4_4_;
            if (uVar43 < uStack_90._4_4_) {
              *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
              iStack_a8 = iStack_a0;
              iVar44 = iStack_a4;
              iStack_a4 = iVar42;
              uVar11 = uVar43;
            }
            else {
              *puVar18 = uVar4 - (uVar4 >> 5);
              uStack_90._4_4_ = uVar36 - uStack_90._4_4_;
              iStack_a8 = iStack_a0;
              iVar44 = iVar42;
            }
          }
          else {
            *puVar18 = uVar4 - (uVar4 >> 5);
            uStack_90._4_4_ = uStack_90._4_4_ - uVar36;
            iVar44 = iStack_a0;
          }
          uStack_70._4_4_ = (uint)(6 < uStack_70._4_4_) * 3 + 8;
          iStack_a0 = iStack_ac;
        }
        else {
          *puVar18 = uVar4 - (uVar4 >> 5);
          puVar18 = (ushort *)((long)p + (ulong)uStack_70._4_4_ * 2 + 0x4ed0);
          iVar44 = iStack_ac;
          for (uVar36 = uVar36 - uStack_90._4_4_; uVar36 < 0x1000000; uVar36 = uVar36 << 8) {
            *(ushort **)((long)p + 0x528) = puVar18;
            uVar26 = uStack_60;
            for (; (int)uVar37 < 8; uVar37 = uVar37 + 8) {
              if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
                uVar28 = 0;
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(uint *)((long)p + 0x510) = uVar13;
                  *(uint *)((long)p + 0x514) = uVar36;
                  *(ulong *)((long)p + 0x4c8) = uVar26;
                  *(uint *)((long)p + 0x4d0) = uVar37;
                  *(uint **)((long)p + 0x498) = uStack_88;
                  *(uint *)((long)p + 0x4f70) = uVar14;
                  *(int *)((long)p + 0x4f2c) = iVar44;
                  *(int *)((long)p + 0x4f30) = iStack_a0;
                  *(int *)((long)p + 0x4f34) = iStack_a8;
                  *(int *)((long)p + 0x4f38) = iStack_a4;
                  *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                  *(uint *)((long)p + 0x4f44) = uStack_9c;
                  *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                  *(int *)((long)p + 0x4f18) = (int)puStack_78;
                  plVar19 = *(long **)((long)p + 0x558);
                  puVar20 = *(uint **)((long)p + 0x490);
                  goto LAB_0011819c;
                }
              }
              else {
LAB_00116e19:
                uVar28 = (ulong)(byte)*uStack_88;
                uStack_88 = (uint *)((long)uStack_88 + 1);
              }
LAB_00116e1f:
              uVar26 = uVar26 | uVar28 << (0x38U - (char)uVar37 & 0x3f);
            }
            uStack_60 = uVar26 << 8;
            uVar37 = uVar37 - 8;
            puVar18 = *(ushort **)((long)p + 0x528);
            uVar13 = uVar13 << 8 | (uint)(byte)(uVar26 >> 0x38);
          }
          uVar4 = *puVar18;
          uStack_90._4_4_ = (uVar36 >> 0xb) * (uint)uVar4;
          uVar11 = uVar13 - uStack_90._4_4_;
          if (uVar13 < uStack_90._4_4_) {
            *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
            prVar32 = (raw_quasi_adaptive_huffman_data_model *)
                      ((long)p + (ulong)(6 < uStack_70._4_4_) * 0x80 + 0x4620);
            pdVar25 = *(decoder_tables **)((long)p + (ulong)(6 < uStack_70._4_4_) * 0x80 + 18000);
            if ((int)uVar37 < 0x18) {
              puVar20 = *(uint **)((long)p + 0x4a0);
              if (uStack_88 + 1 < puVar20) {
                uVar11 = *uStack_88;
                uVar37 = uVar37 + 0x20;
                uStack_60 = uStack_60 |
                            (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 |
                                    (uVar11 & 0xff00) << 8 | uVar11 << 0x18) <<
                            (-(char)uVar37 & 0x3fU);
                uStack_88 = uStack_88 + 1;
              }
              else {
                for (; (int)uVar37 < 0x18; uVar37 = uVar37 + 8) {
                  if (*(char *)((long)p + 0x4b0) == '\0') {
                    *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
                    *(uint *)((long)p + 0x510) = uVar13;
                    *(uint *)((long)p + 0x514) = uStack_90._4_4_;
                    *(ulong *)((long)p + 0x4c8) = uStack_60;
                    *(uint *)((long)p + 0x4d0) = uVar37;
                    *(uint **)((long)p + 0x498) = uStack_88;
                    *(uint *)((long)p + 0x4f70) = uVar14;
                    *(int *)((long)p + 0x4f2c) = iVar44;
                    *(int *)((long)p + 0x4f30) = iStack_a0;
                    *(int *)((long)p + 0x4f34) = iStack_a8;
                    *(int *)((long)p + 0x4f38) = iStack_a4;
                    *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
                    *(uint *)((long)p + 0x4f44) = uStack_9c;
                    *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
                    *(int *)((long)p + 0x4f18) = (int)puStack_78;
                    plVar19 = *(long **)((long)p + 0x558);
                    puVar30 = *(uint **)((long)p + 0x490);
                    goto LAB_0011a6ab;
                  }
LAB_0011a5e9:
                  uVar26 = 0;
                  if (uStack_88 < puVar20) {
                    uVar26 = (ulong)(byte)*uStack_88;
                    uStack_88 = (uint *)((long)uStack_88 + 1);
                  }
                  uStack_60 = uStack_60 | uVar26 << (0x38U - (char)uVar37 & 0x3f);
                }
              }
            }
            uVar11 = (uint)(ushort)(uStack_60 >> 0x30);
            if (uVar11 < pdVar25->m_table_max_code) {
              uVar14 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] &
                       0xffff;
              uVar11 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >>
                       0x10;
            }
            else {
              iVar42 = pdVar25->m_decode_start_code_size - 0x41;
              do {
                iVar23 = iVar42;
                iVar42 = iVar23 + 1;
              } while (pdVar25->m_max_codes[iVar23 + 0x40U] <= uVar11);
              uVar43 = (int)(uStack_60 >> (-(char)(iVar23 + 1) & 0x3fU)) +
                       pdVar25->m_val_ptrs[iVar23 + 0x40U];
              uVar11 = 0;
              if (uVar43 < prVar32->m_total_syms) {
                uVar11 = uVar43;
              }
              uVar14 = (uint)pdVar25->m_sorted_symbol_order[(int)uVar11];
              uVar11 = iVar23 + 0x41;
            }
            uStack_60 = uStack_60 << ((byte)uVar11 & 0x3f);
            puVar2 = (prVar32->m_sym_freq).m_p + uVar14;
            *puVar2 = *puVar2 + 1;
            uVar37 = uVar37 - uVar11;
            puVar1 = &prVar32->m_symbols_until_update;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) {
              raw_quasi_adaptive_huffman_data_model::update(prVar32);
            }
            uVar14 = uVar14 + 2;
            uStack_70._4_4_ = (uint)(6 < uStack_70._4_4_) * 3 + 8;
            uVar11 = uVar13;
          }
          else {
            *puVar18 = uVar4 - (uVar4 >> 5);
            uStack_90._4_4_ = uVar36 - uStack_90._4_4_;
            uStack_70._4_4_ = (6 < uStack_70._4_4_) + 9 + (uint)(6 < uStack_70._4_4_);
          }
        }
      }
      uVar13 = (uint)puStack_78;
      uVar36 = uVar13 - iVar44 & uVar22;
      uVar26 = (ulong)uVar36;
      uVar43 = uVar13;
      if (uVar13 < uVar36) {
        uVar43 = uVar36;
      }
      pbVar24 = pbVar6 + uVar26;
      iStack_ac = iVar44;
      if (uVar22 < uVar43 + uVar14) {
        for (; uVar14 != 0; uVar14 = uVar14 - 1) {
          bVar21 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          uVar36 = (int)puStack_78 + 1;
          uVar28 = (ulong)uVar36;
          pbVar6[(long)puStack_78] = bVar21;
          if (pbVar24 == pbVar6 + uVar27) {
            pbVar24 = pbVar6;
          }
          uStack_90._0_4_ = uStack_9c;
          uVar43 = (uint)bVar21;
          if (uVar22 < uVar36) {
            *(uint *)((long)p + 0x510) = uVar11;
            *(uint *)((long)p + 0x514) = uStack_90._4_4_;
            *(ulong *)((long)p + 0x4c8) = uStack_60;
            *(uint *)((long)p + 0x4d0) = uVar37;
            *(uint **)((long)p + 0x498) = uStack_88;
            *(uint *)((long)p + 0x4f70) = uVar14;
            *(int *)((long)p + 0x4f80) = (int)uVar26;
            *(byte **)((long)p + 0x4f88) = pbVar24;
            *(int *)((long)p + 0x4f2c) = iStack_ac;
            *(int *)((long)p + 0x4f30) = iStack_a0;
            *(int *)((long)p + 0x4f34) = iStack_a8;
            *(int *)((long)p + 0x4f38) = iStack_a4;
            *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
            *(uint *)((long)p + 0x4f44) = (uint)bVar21;
            *(uint *)((long)p + 0x4f48) = uStack_9c;
            *(uint *)((long)p + 0x4f18) = uVar36;
            pvVar29 = *(void **)((long)p + 0x540);
            *(void **)((long)p + 0x4f50) = pvVar29;
            *(ulong *)((long)p + 0x4f58) = uVar27;
            uVar26 = uVar27;
            goto LAB_001170e0;
          }
LAB_0011b468:
          uStack_9c = uVar43;
          puStack_78 = (uint *)uVar28;
        }
      }
      else {
        pbVar38 = pbVar6 + (long)puStack_78;
        if (iVar44 == 1) {
          bVar21 = *pbVar24;
          uStack_90._0_4_ = (uint)bVar21;
          uVar43 = uVar14;
          if (uVar14 < 8) {
            for (; 0 < (int)uVar43; uVar43 = uVar43 - 1) {
              *pbVar38 = bVar21;
              pbVar38 = pbVar38 + 1;
            }
            if (uVar14 == 1) {
              uStack_90._0_4_ = uStack_9c;
            }
          }
          else {
            memset(pbVar38,(uint)uStack_90,(ulong)uVar14);
          }
        }
        else if (uVar14 == 1) {
          bVar21 = *pbVar24;
          *pbVar38 = bVar21;
          uStack_90._0_4_ = uStack_9c;
        }
        else {
          uVar43 = uVar14 - 2;
          if ((uVar43 < 8) || (iVar44 < (int)uVar43)) {
            for (; 0 < (int)uVar43; uVar43 = uVar43 - 1) {
              bVar21 = *pbVar24;
              pbVar24 = pbVar24 + 1;
              *pbVar38 = bVar21;
              pbVar38 = pbVar38 + 1;
            }
          }
          else {
            uVar26 = (ulong)uVar43;
            memcpy(pbVar38,pbVar24,uVar26);
            pbVar38 = pbVar38 + uVar26;
            pbVar24 = pbVar24 + uVar26;
          }
          bVar3 = *pbVar24;
          *pbVar38 = bVar3;
          bVar21 = pbVar24[1];
          pbVar38[1] = bVar21;
          uStack_90._0_4_ = (uint)bVar3;
        }
        uStack_9c = (uint)bVar21;
        puStack_78 = (uint *)(ulong)(uVar13 + uVar14);
      }
      goto LAB_00119c93;
    }
    *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
    uStack_90._4_4_ = uVar43;
    if (uStack_70._4_4_ < 7) {
      uVar14 = (uint)uStack_90 >> 2 & 0xfffffff8 | uStack_9c >> 5;
      prVar32 = (raw_quasi_adaptive_huffman_data_model *)((long)p + (ulong)uVar14 * 0x80 + 0x5a0);
      pdVar25 = *(decoder_tables **)((long)p + (ulong)uVar14 * 0x80 + 0x5d0);
      if ((int)uVar37 < 0x18) {
        puVar20 = *(uint **)((long)p + 0x4a0);
        if (uStack_88 + 1 < puVar20) {
          uVar43 = *uStack_88;
          uVar37 = uVar37 + 0x20;
          uStack_60 = uStack_60 |
                      (ulong)(uVar43 >> 0x18 | (uVar43 & 0xff0000) >> 8 | (uVar43 & 0xff00) << 8 |
                             uVar43 << 0x18) << (-(char)uVar37 & 0x3fU);
          uStack_88 = uStack_88 + 1;
        }
        else {
          for (; uStack_90._4_4_ = uVar43, (int)uVar37 < 0x18; uVar37 = uVar37 + 8) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
              *(uint *)((long)p + 0x510) = uVar11;
              *(uint *)((long)p + 0x514) = uVar43;
              *(ulong *)((long)p + 0x4c8) = uStack_60;
              *(uint *)((long)p + 0x4d0) = uVar37;
              *(uint **)((long)p + 0x498) = uStack_88;
              *(int *)((long)p + 0x4f2c) = iStack_ac;
              *(int *)((long)p + 0x4f30) = iStack_a0;
              *(int *)((long)p + 0x4f34) = iStack_a8;
              *(int *)((long)p + 0x4f38) = iStack_a4;
              *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
              *(uint *)((long)p + 0x4f44) = uStack_9c;
              *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
              *(int *)((long)p + 0x4f18) = (int)puStack_78;
              puVar30 = *(uint **)((long)p + 0x490);
              plVar19 = *(long **)((long)p + 0x558);
              goto LAB_0011a2e4;
            }
LAB_0011a1c0:
            uVar26 = 0;
            if (uStack_88 < puVar20) {
              uVar26 = (ulong)(byte)*uStack_88;
              uStack_88 = (uint *)((long)uStack_88 + 1);
            }
            uStack_60 = uStack_60 | uVar26 << (0x38U - (char)uVar37 & 0x3f);
          }
        }
      }
      uVar43 = (uint)(ushort)(uStack_60 >> 0x30);
      if (uVar43 < pdVar25->m_table_max_code) {
        uVar43 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff;
        uVar14 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar44 = pdVar25->m_decode_start_code_size - 0x41;
        do {
          iVar42 = iVar44;
          iVar44 = iVar42 + 1;
        } while (pdVar25->m_max_codes[iVar42 + 0x40U] <= uVar43);
        uVar14 = (int)(uStack_60 >> (-(char)(iVar42 + 1) & 0x3fU)) +
                 pdVar25->m_val_ptrs[iVar42 + 0x40U];
        uVar43 = 0;
        if (uVar14 < prVar32->m_total_syms) {
          uVar43 = uVar14;
        }
        uVar43 = (uint)pdVar25->m_sorted_symbol_order[(int)uVar43];
        uVar14 = iVar42 + 0x41;
      }
      uStack_60 = uStack_60 << ((byte)uVar14 & 0x3f);
      puVar2 = (prVar32->m_sym_freq).m_p + uVar43;
      *puVar2 = *puVar2 + 1;
      uVar37 = uVar37 - uVar14;
      puVar1 = &prVar32->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      uStack_90._0_4_ = uStack_9c;
      if (*puVar1 == 0) {
        raw_quasi_adaptive_huffman_data_model::update(prVar32);
      }
    }
    else {
      uVar36 = (int)puStack_78 - iStack_ac;
      uVar14 = (uint)pbVar6[uVar36 & uVar22];
      uVar36 = (pbVar6[uVar36 - 1 & uVar22] >> 2 & 0x38 | (uint)(pbVar6[uVar36 & uVar22] >> 5)) << 7
      ;
      prVar32 = (raw_quasi_adaptive_huffman_data_model *)((long)p + (ulong)uVar36 + 0x25a0);
      pdVar25 = *(decoder_tables **)((long)p + (ulong)uVar36 + 0x25d0);
      uStack_9c = uStack_9c;
      if ((int)uVar37 < 0x18) {
        puVar20 = *(uint **)((long)p + 0x4a0);
        if (uStack_88 + 1 < puVar20) {
          uVar43 = *uStack_88;
          uVar37 = uVar37 + 0x20;
          uStack_60 = uStack_60 |
                      (ulong)(uVar43 >> 0x18 | (uVar43 & 0xff0000) >> 8 | (uVar43 & 0xff00) << 8 |
                             uVar43 << 0x18) << (-(char)uVar37 & 0x3fU);
          uStack_88 = uStack_88 + 1;
          uStack_9c = uStack_9c;
        }
        else {
          for (; uStack_90._4_4_ = uVar43, (int)uVar37 < 0x18; uVar37 = uVar37 + 8) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar32;
              *(uint *)((long)p + 0x510) = uVar11;
              *(uint *)((long)p + 0x514) = uVar43;
              *(ulong *)((long)p + 0x4c8) = uStack_60;
              *(uint *)((long)p + 0x4d0) = uVar37;
              *(uint **)((long)p + 0x498) = uStack_88;
              *(uint *)((long)p + 0x4f6c) = uVar14;
              *(int *)((long)p + 0x4f2c) = iStack_ac;
              *(int *)((long)p + 0x4f30) = iStack_a0;
              *(int *)((long)p + 0x4f34) = iStack_a8;
              *(int *)((long)p + 0x4f38) = iStack_a4;
              *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
              *(uint *)((long)p + 0x4f44) = uStack_9c;
              *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
              *(int *)((long)p + 0x4f18) = (int)puStack_78;
              puVar30 = *(uint **)((long)p + 0x490);
              plVar19 = *(long **)((long)p + 0x558);
              goto LAB_0011a4ad;
            }
LAB_0011a365:
            uVar26 = 0;
            if (uStack_88 < puVar20) {
              uVar26 = (ulong)(byte)*uStack_88;
              uStack_88 = (uint *)((long)uStack_88 + 1);
            }
            uStack_60 = uStack_60 | uVar26 << (0x38U - (char)uVar37 & 0x3f);
          }
        }
      }
      uStack_90._0_4_ = uStack_9c;
      uVar43 = (uint)(ushort)(uStack_60 >> 0x30);
      if (uVar43 < pdVar25->m_table_max_code) {
        uVar36 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] & 0xffff;
        uVar43 = pdVar25->m_lookup[uStack_60 >> (-(char)pdVar25->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar44 = pdVar25->m_decode_start_code_size - 0x41;
        do {
          iVar42 = iVar44;
          iVar44 = iVar42 + 1;
        } while (pdVar25->m_max_codes[iVar42 + 0x40U] <= uVar43);
        uVar36 = (int)(uStack_60 >> (-(char)(iVar42 + 1) & 0x3fU)) +
                 pdVar25->m_val_ptrs[iVar42 + 0x40U];
        uVar43 = 0;
        if (uVar36 < prVar32->m_total_syms) {
          uVar43 = uVar36;
        }
        uVar36 = (uint)pdVar25->m_sorted_symbol_order[(int)uVar43];
        uVar43 = iVar42 + 0x41;
      }
      uStack_60 = uStack_60 << ((byte)uVar43 & 0x3f);
      puVar2 = (prVar32->m_sym_freq).m_p + uVar36;
      *puVar2 = *puVar2 + 1;
      uVar37 = uVar37 - uVar43;
      puVar1 = &prVar32->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        raw_quasi_adaptive_huffman_data_model::update(prVar32);
      }
      uVar43 = uVar36 ^ uVar14;
    }
    uStack_9c = uVar43;
    pbVar6[(long)puStack_78] = (byte)uStack_9c;
    uStack_70._4_4_ = (uint)(byte)s_literal_next_state[uStack_70._4_4_];
    uVar43 = (int)puStack_78 + 1;
    puStack_78 = (uint *)(ulong)uVar43;
  } while (uVar43 <= uVar22);
  *(uint *)((long)p + 0x510) = uVar11;
  *(uint *)((long)p + 0x514) = uStack_90._4_4_;
  *(ulong *)((long)p + 0x4c8) = uStack_60;
  *(uint *)((long)p + 0x4d0) = uVar37;
  *(uint **)((long)p + 0x498) = uStack_88;
  *(int *)((long)p + 0x4f2c) = iStack_ac;
  *(int *)((long)p + 0x4f30) = iStack_a0;
  *(int *)((long)p + 0x4f34) = iStack_a8;
  *(int *)((long)p + 0x4f38) = iStack_a4;
  *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
  *(uint *)((long)p + 0x4f44) = uStack_9c;
  *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
  *(uint *)((long)p + 0x4f18) = uVar43;
  pvVar29 = *(void **)((long)p + 0x540);
  *(void **)((long)p + 0x4f50) = pvVar29;
  *(ulong *)((long)p + 0x4f58) = uVar27;
  uVar26 = uVar27;
LAB_00117afa:
  uVar27 = **(ulong **)((long)p + 0x568);
  if (uVar26 < **(ulong **)((long)p + 0x568)) {
    uVar27 = uVar26;
  }
  *(ulong *)((long)p + 0x4f60) = uVar27;
  if (*(int *)((long)p + 0x594) == 0) {
    memcpy(*(void **)((long)p + 0x560),pvVar29,uVar27);
  }
  else {
    for (uVar26 = 0; sVar41 = uVar27 - uVar26, uVar26 <= uVar27 && sVar41 != 0;
        uVar26 = uVar26 + sVar41) {
      if (0x1fff < sVar41) {
        sVar41 = 0x2000;
      }
      memcpy((void *)(*(long *)((long)p + 0x560) + uVar26),
             (void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41);
      uVar12 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41,
                       *(uint *)((long)p + 0x548));
      *(uint *)((long)p + 0x548) = uVar12;
      uVar27 = *(ulong *)((long)p + 0x4f60);
    }
  }
  **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
  **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
  *(undefined4 *)p = 0x21c;
  goto LAB_001198ea;
LAB_00117045:
  if (-1 < (int)uVar37) goto code_r0x0011704d;
  if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
    uVar27 = 0;
    if (*(char *)((long)p + 0x4b0) == '\0') {
      *(uint *)((long)p + 0x510) = uVar11;
      *(uint *)((long)p + 0x514) = uStack_90._4_4_;
      *(ulong *)((long)p + 0x4c8) = uStack_60;
      *(uint *)((long)p + 0x4d0) = uVar37;
      *(uint **)((long)p + 0x498) = uStack_88;
      *(int *)((long)p + 0x4f2c) = iStack_ac;
      *(int *)((long)p + 0x4f30) = iStack_a0;
      *(int *)((long)p + 0x4f34) = iStack_a8;
      *(int *)((long)p + 0x4f38) = iStack_a4;
      *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
      *(uint *)((long)p + 0x4f44) = uStack_9c;
      *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
      *(int *)((long)p + 0x4f18) = (int)puStack_78;
      plVar19 = *(long **)((long)p + 0x558);
      puVar20 = *(uint **)((long)p + 0x490);
      goto LAB_001181e6;
    }
  }
  else {
LAB_0011702d:
    uVar27 = (ulong)(byte)*uStack_88;
    uStack_88 = (uint *)((long)uStack_88 + 1);
  }
LAB_00117033:
  cVar9 = (char)uVar37;
  uVar37 = uVar37 + 8;
  uStack_60 = uStack_60 | uVar27 << (0x38U - cVar9 & 0x3f);
  goto LAB_00117045;
LAB_001154a6:
  if ((uVar43 & 7) != 0) {
    for (; (int)uVar43 < 0; uVar43 = uVar43 + 8) {
      if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
        uVar27 = 0;
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar22;
          *(uint *)((long)p + 0x514) = uStack_7c;
          *(ulong *)((long)p + 0x4c8) = uVar26;
          *(uint *)((long)p + 0x4d0) = uVar43;
          *(uint **)((long)p + 0x498) = puStack_78;
          *(int *)((long)p + 0x4f2c) = iVar42;
          *(int *)((long)p + 0x4f30) = iStack_98;
          *(uint *)((long)p + 0x4f34) = uStack_9c;
          *(int *)((long)p + 0x4f38) = iStack_94;
          *(uint *)((long)p + 0x4f3c) = uVar11;
          *(uint *)((long)p + 0x4f44) = uVar37;
          *(uint *)((long)p + 0x4f48) = uStack_80;
          *(int *)((long)p + 0x4f18) = (int)uStack_58;
          puVar20 = *(uint **)((long)p + 0x490);
          plVar19 = *(long **)((long)p + 0x558);
          puVar16 = *(ulong **)((long)p + 0x568);
          goto LAB_00112c63;
        }
      }
      else {
LAB_00111a50:
        uVar27 = (ulong)(byte)*puStack_78;
        puStack_78 = (uint *)((long)puStack_78 + 1);
      }
LAB_00111a5a:
      uVar26 = uVar26 | uVar27 << (0x38U - (char)uVar43 & 0x3f);
    }
    uVar26 = uVar26 << ((byte)uVar43 & 7);
    uVar43 = uVar43 & 0x7ffffff8;
  }
LAB_00113fba:
  *(int *)((long)p + 0x4f28) = *(int *)((long)p + 0x4f28) + 1;
  iVar44 = *(int *)((long)p + 0x598);
  if (iVar44 == 0) {
LAB_00113f67:
    do {
      if (1 < (int)uVar43) {
        *(uint *)((long)p + 0x4f4c) = (uint)(uVar26 >> 0x3e);
        lVar10 = (*(code *)(&DAT_0011f9b4 + *(int *)(&DAT_0011f9b4 + (uVar26 >> 0x3e) * 4)))();
        return lVar10;
      }
      if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
        uVar27 = 0;
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar22;
          *(uint *)((long)p + 0x514) = uStack_7c;
          *(ulong *)((long)p + 0x4c8) = uVar26;
          *(uint *)((long)p + 0x4d0) = uVar43;
          *(uint **)((long)p + 0x498) = puStack_78;
          *(int *)((long)p + 0x4f2c) = iVar42;
          *(int *)((long)p + 0x4f30) = iStack_98;
          *(uint *)((long)p + 0x4f34) = uStack_9c;
          *(int *)((long)p + 0x4f38) = iStack_94;
          *(uint *)((long)p + 0x4f3c) = uVar11;
          *(uint *)((long)p + 0x4f44) = uVar37;
          *(uint *)((long)p + 0x4f48) = uStack_80;
          *(int *)((long)p + 0x4f18) = (int)uStack_58;
          puVar20 = *(uint **)((long)p + 0x490);
          plVar19 = *(long **)((long)p + 0x558);
          puVar16 = *(ulong **)((long)p + 0x568);
          goto LAB_00112da6;
        }
      }
      else {
LAB_00112469:
        uVar27 = (ulong)(byte)*puStack_78;
        puStack_78 = (uint *)((long)puStack_78 + 1);
      }
LAB_00112473:
      cVar9 = (char)uVar43;
      uVar43 = uVar43 + 8;
      uVar26 = uVar26 | uVar27 << (0x38U - cVar9 & 0x3f);
    } while( true );
  }
LAB_00113fcf:
  if (iVar44 == 2) {
    if ((uVar43 & 7) != 0) {
      for (; (int)uVar43 < 0; uVar43 = uVar43 + 8) {
        if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
          uVar27 = 0;
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar22;
            *(uint *)((long)p + 0x514) = uStack_7c;
            *(ulong *)((long)p + 0x4c8) = uVar26;
            *(uint *)((long)p + 0x4d0) = uVar43;
            *(uint **)((long)p + 0x498) = puStack_78;
            *(int *)((long)p + 0x4f2c) = iVar42;
            *(int *)((long)p + 0x4f30) = iStack_98;
            *(uint *)((long)p + 0x4f34) = uStack_9c;
            *(int *)((long)p + 0x4f38) = iStack_94;
            *(uint *)((long)p + 0x4f3c) = uVar11;
            *(uint *)((long)p + 0x4f44) = uVar37;
            *(uint *)((long)p + 0x4f48) = uStack_80;
            *(int *)((long)p + 0x4f18) = (int)uStack_58;
            plVar19 = *(long **)((long)p + 0x558);
            puVar16 = *(ulong **)((long)p + 0x568);
            puVar20 = *(uint **)((long)p + 0x490);
            goto LAB_00112a16;
          }
        }
        else {
LAB_00110c63:
          uVar27 = (ulong)(byte)*puStack_78;
          puStack_78 = (uint *)((long)puStack_78 + 1);
        }
LAB_00110c6d:
        uVar26 = uVar26 | uVar27 << (0x38U - (char)uVar43 & 0x3f);
      }
      uVar26 = uVar26 << ((byte)uVar43 & 7);
      uVar43 = uVar43 & 0x7ffffff8;
    }
    for (; (int)uVar43 < 0x10; uVar43 = uVar43 + 8) {
      if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
        uVar27 = 0;
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar22;
          *(uint *)((long)p + 0x514) = uStack_7c;
          *(ulong *)((long)p + 0x4c8) = uVar26;
          *(uint *)((long)p + 0x4d0) = uVar43;
          *(uint **)((long)p + 0x498) = puStack_78;
          *(int *)((long)p + 0x4f2c) = iVar42;
          *(int *)((long)p + 0x4f30) = iStack_98;
          *(uint *)((long)p + 0x4f34) = uStack_9c;
          *(int *)((long)p + 0x4f38) = iStack_94;
          *(uint *)((long)p + 0x4f3c) = uVar11;
          *(uint *)((long)p + 0x4f44) = uVar37;
          *(uint *)((long)p + 0x4f48) = uStack_80;
          *(int *)((long)p + 0x4f18) = (int)uStack_58;
          plVar19 = *(long **)((long)p + 0x558);
          puVar16 = *(ulong **)((long)p + 0x568);
          puVar20 = *(uint **)((long)p + 0x490);
          goto LAB_00112a2f;
        }
      }
      else {
LAB_00110d46:
        uVar27 = (ulong)(byte)*puStack_78;
        puStack_78 = (uint *)((long)puStack_78 + 1);
      }
LAB_00110d50:
      uVar26 = uVar26 | uVar27 << (0x38U - (char)uVar43 & 0x3f);
    }
    *(uint *)((long)p + 0x4f68) = (uint)(ushort)(uVar26 >> 0x30);
    uVar27 = uVar26 << 0x10;
    for (iVar44 = uVar43 - 0x10; iVar44 < 0x10; iVar44 = iVar44 + 8) {
      if (puStack_78 == *(uint **)((long)p + 0x4a0)) {
        uVar26 = 0;
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar22;
          *(uint *)((long)p + 0x514) = uStack_7c;
          *(ulong *)((long)p + 0x4c8) = uVar27;
          *(int *)((long)p + 0x4d0) = iVar44;
          *(uint **)((long)p + 0x498) = puStack_78;
          *(int *)((long)p + 0x4f2c) = iVar42;
          *(int *)((long)p + 0x4f30) = iStack_98;
          *(uint *)((long)p + 0x4f34) = uStack_9c;
          *(int *)((long)p + 0x4f38) = iStack_94;
          *(uint *)((long)p + 0x4f3c) = uVar11;
          *(uint *)((long)p + 0x4f44) = uVar37;
          *(uint *)((long)p + 0x4f48) = uStack_80;
          *(int *)((long)p + 0x4f18) = (int)uStack_58;
          plVar19 = *(long **)((long)p + 0x558);
          puVar16 = *(ulong **)((long)p + 0x568);
          puVar20 = *(uint **)((long)p + 0x490);
          goto LAB_00112ad5;
        }
      }
      else {
LAB_00110e29:
        uVar26 = (ulong)(byte)*puStack_78;
        puStack_78 = (uint *)((long)puStack_78 + 1);
      }
LAB_00110e33:
      uVar27 = uVar27 | uVar26 << (0x38U - (char)iVar44 & 0x3f);
    }
    uVar26 = uVar27 << 0x10;
    uVar43 = iVar44 - 0x10;
    uVar11 = *(int *)((long)p + 0x4f68) << 0x10 | (uint)(ushort)(uVar27 >> 0x30);
    *(uint *)((long)p + 0x4f68) = uVar11;
    if (*(int *)((long)p + 0x594) == 0) {
      lVar40 = 0x548;
    }
    else {
      uVar12 = adler32(pbVar6,uStack_58 & 0xffffffff,1);
      *(uint *)((long)p + 0x548) = uVar12;
      if (*(uint *)((long)p + 0x4f68) == uVar12) goto LAB_001140ad;
      uVar11 = 7;
      lVar40 = 0x598;
    }
    *(uint *)((long)p + lVar40) = uVar11;
  }
LAB_001140ad:
  *(uint *)((long)p + 0x510) = uVar22;
  *(uint *)((long)p + 0x514) = uStack_7c;
  *(ulong *)((long)p + 0x4c8) = uVar26;
  *(uint *)((long)p + 0x4d0) = uVar43;
  *(uint **)((long)p + 0x498) = puStack_78;
  uVar17 = symbol_codec::stop_decoding((symbol_codec *)((long)p + 0x490));
  **(uint64 **)((long)p + 0x558) = uVar17;
  **(ulong **)((long)p + 0x568) = uStack_58 & 0xffffffff;
LAB_001140f5:
  *(undefined4 *)p = 0x35c;
switchD_001109bd_caseD_338:
  return *(lzham_decompress_status_t *)((long)p + 0x598);
code_r0x0011704d:
  uStack_60 = uStack_60 << ((byte)uVar37 & 7);
  uVar37 = uVar37 & 0x7ffffff8;
LAB_001196cd:
  *(int *)((long)p + 0x4f28) = *(int *)((long)p + 0x4f28) + 1;
  iVar44 = *(int *)((long)p + 0x598);
  if (iVar44 == 0) {
LAB_00119673:
    do {
      if (1 < (int)uVar37) {
        *(uint *)((long)p + 0x4f4c) = (uint)(uStack_60 >> 0x3e);
        lVar10 = (*(code *)(&DAT_0011f9fc + *(int *)(&DAT_0011f9fc + (uStack_60 >> 0x3e) * 4)))
                           (pbVar6,puStack_78,&DAT_0011f9fc,
                            &DAT_0011f9fc + *(int *)(&DAT_0011f9fc + (uStack_60 >> 0x3e) * 4),
                            uStack_90._4_4_,uStack_60 << 2);
        return lVar10;
      }
      if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
        uVar27 = 0;
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar11;
          *(uint *)((long)p + 0x514) = uStack_90._4_4_;
          *(ulong *)((long)p + 0x4c8) = uStack_60;
          *(uint *)((long)p + 0x4d0) = uVar37;
          *(uint **)((long)p + 0x498) = uStack_88;
          *(int *)((long)p + 0x4f2c) = iStack_ac;
          *(int *)((long)p + 0x4f30) = iStack_a0;
          *(int *)((long)p + 0x4f34) = iStack_a8;
          *(int *)((long)p + 0x4f38) = iStack_a4;
          *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
          *(uint *)((long)p + 0x4f44) = uStack_9c;
          *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
          *(int *)((long)p + 0x4f18) = (int)puStack_78;
          puVar20 = *(uint **)((long)p + 0x490);
          plVar19 = *(long **)((long)p + 0x558);
          goto LAB_001182c8;
        }
      }
      else {
LAB_00117a6e:
        uVar27 = (ulong)(byte)*uStack_88;
        uStack_88 = (uint *)((long)uStack_88 + 1);
      }
LAB_00117a74:
      cVar9 = (char)uVar37;
      uVar37 = uVar37 + 8;
      uStack_60 = uStack_60 | uVar27 << (0x38U - cVar9 & 0x3f);
    } while( true );
  }
  if ((int)puStack_78 == 0) {
    uVar33 = 0;
LAB_0011981a:
    if (iVar44 == 2) {
      if ((uVar37 & 7) != 0) {
        for (; (int)uVar37 < 0; uVar37 = uVar37 + 8) {
          if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
            uVar27 = 0;
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(uint *)((long)p + 0x510) = uVar11;
              *(uint *)((long)p + 0x514) = uStack_90._4_4_;
              *(ulong *)((long)p + 0x4c8) = uStack_60;
              *(uint *)((long)p + 0x4d0) = uVar37;
              *(uint **)((long)p + 0x498) = uStack_88;
              *(int *)((long)p + 0x4f2c) = iStack_ac;
              *(int *)((long)p + 0x4f30) = iStack_a0;
              *(int *)((long)p + 0x4f34) = iStack_a8;
              *(int *)((long)p + 0x4f38) = iStack_a4;
              *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
              *(uint *)((long)p + 0x4f44) = uStack_9c;
              *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
              *(undefined4 *)((long)p + 0x4f18) = uVar33;
              plVar19 = *(long **)((long)p + 0x558);
              puVar20 = *(uint **)((long)p + 0x490);
              goto LAB_00118050;
            }
          }
          else {
LAB_00116174:
            uVar27 = (ulong)(byte)*uStack_88;
            uStack_88 = (uint *)((long)uStack_88 + 1);
          }
LAB_0011617a:
          uStack_60 = uStack_60 | uVar27 << (0x38U - (char)uVar37 & 0x3f);
        }
        uStack_60 = uStack_60 << ((byte)uVar37 & 7);
        uVar37 = uVar37 & 0x7ffffff8;
      }
      for (; (int)uVar37 < 0x10; uVar37 = uVar37 + 8) {
        if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
          uVar27 = 0;
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar11;
            *(uint *)((long)p + 0x514) = uStack_90._4_4_;
            *(ulong *)((long)p + 0x4c8) = uStack_60;
            *(uint *)((long)p + 0x4d0) = uVar37;
            *(uint **)((long)p + 0x498) = uStack_88;
            *(int *)((long)p + 0x4f2c) = iStack_ac;
            *(int *)((long)p + 0x4f30) = iStack_a0;
            *(int *)((long)p + 0x4f34) = iStack_a8;
            *(int *)((long)p + 0x4f38) = iStack_a4;
            *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
            *(uint *)((long)p + 0x4f44) = uStack_9c;
            *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
            *(undefined4 *)((long)p + 0x4f18) = uVar33;
            plVar19 = *(long **)((long)p + 0x558);
            puVar20 = *(uint **)((long)p + 0x490);
            goto LAB_00118073;
          }
        }
        else {
LAB_0011625c:
          uVar27 = (ulong)(byte)*uStack_88;
          uStack_88 = (uint *)((long)uStack_88 + 1);
        }
LAB_00116262:
        uStack_60 = uStack_60 | uVar27 << (0x38U - (char)uVar37 & 0x3f);
      }
      *(uint *)((long)p + 0x4f68) = (uint)(ushort)(uStack_60 >> 0x30);
      uVar27 = uStack_60 << 0x10;
      for (iVar44 = uVar37 - 0x10; iVar44 < 0x10; iVar44 = iVar44 + 8) {
        if (uStack_88 == *(uint **)((long)p + 0x4a0)) {
          uVar26 = 0;
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar11;
            *(uint *)((long)p + 0x514) = uStack_90._4_4_;
            *(ulong *)((long)p + 0x4c8) = uVar27;
            *(int *)((long)p + 0x4d0) = iVar44;
            *(uint **)((long)p + 0x498) = uStack_88;
            *(int *)((long)p + 0x4f2c) = iStack_ac;
            *(int *)((long)p + 0x4f30) = iStack_a0;
            *(int *)((long)p + 0x4f34) = iStack_a8;
            *(int *)((long)p + 0x4f38) = iStack_a4;
            *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
            *(uint *)((long)p + 0x4f44) = uStack_9c;
            *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
            *(undefined4 *)((long)p + 0x4f18) = uVar33;
            plVar19 = *(long **)((long)p + 0x558);
            puVar20 = *(uint **)((long)p + 0x490);
            goto LAB_00118096;
          }
        }
        else {
LAB_00116344:
          uVar26 = (ulong)(byte)*uStack_88;
          uStack_88 = (uint *)((long)uStack_88 + 1);
        }
LAB_0011634a:
        uVar27 = uVar27 | uVar26 << (0x38U - (char)iVar44 & 0x3f);
      }
      uStack_60 = uVar27 << 0x10;
      uVar37 = iVar44 - 0x10;
      uVar22 = *(int *)((long)p + 0x4f68) << 0x10 | (uint)(ushort)(uVar27 >> 0x30);
      *(uint *)((long)p + 0x4f68) = uVar22;
      if (*(int *)((long)p + 0x594) == 0) {
        *(uint *)((long)p + 0x548) = uVar22;
      }
      else if (uVar22 != *(uint *)((long)p + 0x548)) {
        *(undefined4 *)((long)p + 0x598) = 7;
      }
    }
    *(uint *)((long)p + 0x510) = uVar11;
    *(uint *)((long)p + 0x514) = uStack_90._4_4_;
    *(ulong *)((long)p + 0x4c8) = uStack_60;
    *(uint *)((long)p + 0x4d0) = uVar37;
    *(uint **)((long)p + 0x498) = uStack_88;
    uVar17 = symbol_codec::stop_decoding((symbol_codec *)((long)p + 0x490));
    **(uint64 **)((long)p + 0x558) = uVar17;
    **(undefined8 **)((long)p + 0x568) = 0;
LAB_0011993f:
    *(undefined4 *)p = 0x35c;
switchD_00115eb3_caseD_338:
    lVar10 = *(lzham_decompress_status_t *)((long)p + 0x598);
  }
  else {
    *(uint *)((long)p + 0x510) = uVar11;
    *(uint *)((long)p + 0x514) = uStack_90._4_4_;
    *(ulong *)((long)p + 0x4c8) = uStack_60;
    *(uint *)((long)p + 0x4d0) = uVar37;
    *(uint **)((long)p + 0x498) = uStack_88;
    *(int *)((long)p + 0x4f2c) = iStack_ac;
    *(int *)((long)p + 0x4f30) = iStack_a0;
    *(int *)((long)p + 0x4f34) = iStack_a8;
    *(int *)((long)p + 0x4f38) = iStack_a4;
    *(uint *)((long)p + 0x4f3c) = uStack_70._4_4_;
    *(uint *)((long)p + 0x4f44) = uStack_9c;
    *(uint *)((long)p + 0x4f48) = (uint)uStack_90;
    *(int *)((long)p + 0x4f18) = (int)puStack_78;
    pvVar29 = *(void **)((long)p + 0x540);
    *(void **)((long)p + 0x4f50) = pvVar29;
    *(uint **)((long)p + 0x4f58) = puStack_78;
LAB_00119780:
    uVar27 = **(ulong **)((long)p + 0x568);
    if (puStack_78 < **(ulong **)((long)p + 0x568)) {
      uVar27 = (ulong)puStack_78;
    }
    *(ulong *)((long)p + 0x4f60) = uVar27;
    if (*(int *)((long)p + 0x594) == 0) {
      memcpy(*(void **)((long)p + 0x560),pvVar29,uVar27);
    }
    else {
      for (uVar26 = 0; sVar41 = uVar27 - uVar26, uVar26 <= uVar27 && sVar41 != 0;
          uVar26 = uVar26 + sVar41) {
        if (0x1fff < sVar41) {
          sVar41 = 0x2000;
        }
        memcpy((void *)(*(long *)((long)p + 0x560) + uVar26),
               (void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41);
        uVar12 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar26),sVar41,
                         *(uint *)((long)p + 0x548));
        *(uint *)((long)p + 0x548) = uVar12;
        uVar27 = *(ulong *)((long)p + 0x4f60);
      }
    }
    **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
    **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
    *(undefined4 *)p = 0x337;
LAB_001198ea:
    lVar10 = LZHAM_DECOMP_STATUS_NOT_FINISHED;
  }
  return lVar10;
}

Assistant:

lzham_decompress_status_t lzham_lib_decompress(
      lzham_decompress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size,
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_bool no_more_input_bytes_flag)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pIn_buf_size) && (!pIn_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pOut_buf_size) && (!pOut_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      pState->m_pIn_buf = pIn_buf;
      pState->m_pIn_buf_size = pIn_buf_size;
      pState->m_pOut_buf = pOut_buf;
      pState->m_pOut_buf_size = pOut_buf_size;
      pState->m_no_more_input_bytes_flag = (no_more_input_bytes_flag != 0);

      if (pState->m_params.m_output_unbuffered)
      {
         if (!pState->m_pOrig_out_buf)
         {
            pState->m_pOrig_out_buf = pOut_buf;
            pState->m_orig_out_buf_size = *pOut_buf_size;
         }
         else
         {
            if ((pState->m_pOrig_out_buf != pOut_buf) || (pState->m_orig_out_buf_size != *pOut_buf_size))
            {
               return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
            }
         }
      }

      lzham_decompress_status_t status;
      if (pState->m_params.m_output_unbuffered)
         status = pState->decompress<true>();
      else
         status = pState->decompress<false>();

      //void *q = alloca(4096);
      //memset(q, 0xFE, 4096);

      return status;
   }